

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

void embree::avx::CurveNiMBIntersector1<8>::
     intersect_t<embree::avx::RibbonCurve1Intersector1<embree::BSplineCurveT,8>,embree::avx::Intersect1EpilogMU<8,true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  undefined1 (*pauVar7) [32];
  undefined1 (*pauVar8) [28];
  undefined8 uVar9;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  Primitive PVar19;
  Geometry *pGVar20;
  __int_type_conflict _Var21;
  RTCFilterFunctionN p_Var22;
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [28];
  undefined1 auVar134 [28];
  undefined1 auVar135 [28];
  undefined1 auVar136 [28];
  undefined1 auVar137 [24];
  uint uVar138;
  uint uVar139;
  ulong uVar140;
  uint uVar141;
  long lVar142;
  ulong uVar143;
  RayHit *pRVar144;
  long lVar145;
  uint uVar146;
  undefined1 auVar147 [8];
  long lVar148;
  undefined4 uVar149;
  undefined8 unaff_R13;
  long lVar150;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  float fVar151;
  float fVar169;
  float fVar170;
  float fVar174;
  float fVar175;
  float fVar176;
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  float fVar172;
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  float fVar171;
  float fVar173;
  float fVar177;
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar180 [16];
  float fVar178;
  float fVar194;
  float fVar196;
  float fVar200;
  float fVar201;
  float fVar202;
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar181 [16];
  float fVar179;
  undefined1 auVar184 [32];
  float fVar195;
  float fVar197;
  float fVar198;
  float fVar203;
  undefined1 auVar185 [32];
  float fVar199;
  undefined1 auVar186 [32];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  float fVar204;
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar207 [16];
  float fVar206;
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  float fVar205;
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  float fVar223;
  float fVar225;
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar228 [16];
  undefined1 auVar218 [32];
  float fVar226;
  undefined1 auVar219 [32];
  float fVar224;
  float fVar227;
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  float fVar229;
  float fVar242;
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  float fVar238;
  float fVar240;
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  float fVar239;
  float fVar241;
  float fVar243;
  undefined1 auVar235 [32];
  float fVar244;
  undefined1 auVar236 [32];
  undefined1 auVar237 [64];
  float fVar245;
  float fVar255;
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  float fVar252;
  float fVar253;
  float fVar257;
  float fVar259;
  float fVar261;
  undefined1 auVar248 [32];
  float fVar263;
  undefined1 auVar249 [32];
  float fVar254;
  float fVar256;
  float fVar258;
  float fVar260;
  float fVar262;
  undefined1 auVar250 [32];
  float fVar264;
  undefined1 auVar251 [32];
  float fVar265;
  float fVar274;
  float fVar276;
  float fVar277;
  undefined1 auVar267 [16];
  float fVar266;
  undefined1 auVar269 [16];
  float fVar275;
  float fVar278;
  float fVar279;
  float fVar280;
  undefined1 auVar270 [32];
  undefined1 auVar271 [32];
  undefined1 auVar272 [32];
  undefined1 auVar273 [64];
  float fVar281;
  float fVar282;
  float fVar288;
  float fVar290;
  undefined1 auVar283 [16];
  float fVar292;
  undefined1 auVar284 [16];
  float fVar294;
  float fVar295;
  float fVar296;
  undefined1 auVar285 [32];
  float fVar289;
  float fVar291;
  float fVar293;
  float fVar297;
  undefined1 auVar286 [32];
  float fVar298;
  undefined1 auVar287 [32];
  undefined1 auVar299 [32];
  undefined1 auVar300 [32];
  undefined1 auVar301 [32];
  undefined1 auVar302 [32];
  float fVar306;
  undefined1 auVar303 [32];
  undefined1 auVar304 [32];
  undefined1 auVar305 [64];
  float fVar307;
  float fVar308;
  float fVar319;
  float fVar321;
  float fVar323;
  float fVar325;
  float fVar326;
  float fVar327;
  undefined1 auVar310 [32];
  undefined1 auVar311 [32];
  undefined1 auVar312 [32];
  undefined1 auVar313 [32];
  float fVar320;
  undefined1 auVar314 [32];
  undefined1 auVar315 [32];
  float fVar322;
  undefined1 auVar316 [32];
  float fVar324;
  undefined1 auVar317 [32];
  undefined1 auVar318 [64];
  undefined1 auVar328 [32];
  undefined1 auVar329 [32];
  undefined1 auVar330 [32];
  undefined1 auVar331 [32];
  float fVar336;
  undefined1 auVar332 [32];
  undefined1 auVar333 [32];
  undefined1 auVar334 [32];
  undefined1 auVar335 [64];
  float fVar347;
  undefined1 auVar348 [12];
  float fVar349;
  undefined1 auVar337 [32];
  undefined1 auVar338 [32];
  undefined1 auVar339 [32];
  undefined1 auVar340 [32];
  undefined1 auVar341 [32];
  undefined1 auVar342 [32];
  undefined1 auVar343 [32];
  undefined1 auVar344 [32];
  undefined1 auVar345 [32];
  float fVar350;
  undefined1 auVar346 [32];
  float fVar351;
  float fVar357;
  float fVar358;
  undefined1 auVar352 [32];
  undefined1 auVar353 [32];
  undefined1 auVar354 [32];
  undefined1 auVar355 [32];
  undefined1 auVar356 [32];
  undefined1 auVar359 [16];
  undefined1 auVar360 [32];
  undefined1 auVar361 [32];
  undefined1 auVar362 [32];
  undefined1 auVar363 [32];
  undefined1 auVar364 [32];
  undefined1 auVar365 [32];
  undefined1 auVar366 [32];
  undefined1 auVar367 [32];
  undefined1 auVar368 [32];
  undefined1 auVar369 [32];
  undefined1 auVar370 [64];
  undefined1 auVar371 [16];
  undefined1 auVar372 [32];
  undefined1 auVar373 [32];
  undefined1 auVar374 [32];
  undefined1 auVar375 [32];
  undefined1 auVar376 [32];
  undefined1 auVar377 [32];
  float fVar378;
  float fVar382;
  float fVar384;
  float fVar386;
  undefined1 auVar379 [32];
  float fVar383;
  float fVar385;
  float fVar387;
  undefined1 auVar380 [32];
  undefined1 auVar381 [32];
  float fVar388;
  float fVar389;
  float fVar393;
  float fVar394;
  float fVar395;
  float fVar396;
  undefined1 auVar391 [32];
  undefined1 auVar392 [32];
  RTCFilterFunctionNArguments args;
  vbool<8> valid;
  RibbonHit<embree::BSplineCurveT<embree::Vec3fx>,_8> bhit;
  int local_7a4;
  RayHit *local_7a0;
  ulong local_798;
  uint local_78c;
  ulong local_788;
  undefined1 local_780 [8];
  undefined1 auStack_778 [24];
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  undefined1 local_740 [8];
  float fStack_738;
  float fStack_734;
  float fStack_730;
  float fStack_72c;
  float fStack_728;
  undefined1 local_720 [8];
  undefined8 uStack_718;
  undefined1 local_710 [8];
  undefined8 uStack_708;
  Primitive *local_700;
  Precalculations *local_6f8;
  RTCFilterFunctionNArguments local_6f0;
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined1 local_680 [8];
  undefined8 uStack_678;
  undefined1 local_670 [8];
  undefined8 uStack_668;
  undefined1 local_660 [32];
  undefined1 local_640 [8];
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  undefined8 local_5d0;
  undefined4 local_5c8;
  float local_5c4;
  undefined4 local_5c0;
  undefined4 local_5bc;
  undefined4 local_5b8;
  uint local_5b4;
  uint local_5b0;
  undefined1 local_5a0 [32];
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [8];
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [32];
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  float local_4c0;
  float fStack_4bc;
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  float fStack_4a4;
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  float fStack_464;
  undefined1 local_460 [2] [32];
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  float fStack_404;
  undefined1 local_400 [32];
  float local_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [8];
  float fStack_398;
  float fStack_394;
  undefined1 auStack_390 [8];
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [32];
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [8];
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  undefined1 local_320 [8];
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined1 local_300 [32];
  undefined1 local_2e0 [8];
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined1 local_2c0 [8];
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  undefined1 local_2a0 [8];
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [32];
  float local_220;
  float fStack_21c;
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined1 local_200 [32];
  uint local_1e0;
  uint local_1dc;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  float local_160 [4];
  float fStack_150;
  float fStack_14c;
  float fStack_148;
  float fStack_144;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined1 local_120 [32];
  undefined1 local_100 [8];
  float fStack_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float fStack_e8;
  undefined1 local_e0 [8];
  float fStack_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float fStack_c8;
  undefined1 local_c0 [8];
  float fStack_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float fStack_a8;
  undefined1 local_a0 [8];
  float fStack_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float fStack_88;
  undefined1 local_80 [32];
  undefined1 auVar208 [16];
  undefined1 auVar268 [16];
  undefined1 auVar309 [16];
  undefined1 auVar390 [16];
  
  PVar19 = prim[1];
  uVar140 = (ulong)(byte)PVar19;
  auVar269 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar140 * 4 + 6)));
  auVar212 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar140 * 4 + 10)));
  auVar228 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar140 * 5 + 6)));
  auVar232 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar140 * 5 + 10)));
  local_6f8 = pre;
  auVar32 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar140 * 6 + 6)));
  lVar142 = uVar140 * 0x25;
  auVar33 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar140 * 6 + 10)));
  auVar34 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar140 * 0xf + 6)));
  auVar35 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar140 * 0xf + 10)));
  auVar36 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar19 * 0x10 + 6)));
  auVar37 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar19 * 0x10 + 10)));
  auVar38 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar140 * 0x11 + 6)));
  auVar39 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar140 * 0x11 + 10)));
  auVar40 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar140 * 0x1a + 6)));
  auVar41 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar140 * 0x1a + 10)));
  auVar42 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar140 * 0x1b + 6)));
  auVar43 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar140 * 0x1b + 10)));
  auVar352._16_16_ = auVar212;
  auVar352._0_16_ = auVar269;
  auVar216._16_16_ = auVar232;
  auVar216._0_16_ = auVar228;
  auVar269 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar140 * 0x1c + 6)));
  auVar212 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar140 * 0x1c + 10)));
  auVar299._16_16_ = auVar33;
  auVar299._0_16_ = auVar32;
  auVar228 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                        *(undefined1 (*) [16])(prim + lVar142 + 6));
  auVar360._16_16_ = auVar35;
  auVar360._0_16_ = auVar34;
  fVar245 = *(float *)(prim + lVar142 + 0x12);
  local_780._4_4_ = fVar245 * auVar228._4_4_;
  local_780._0_4_ = fVar245 * auVar228._0_4_;
  auStack_778._0_4_ = fVar245 * auVar228._8_4_;
  auStack_778._4_4_ = fVar245 * auVar228._12_4_;
  auVar283._0_4_ = fVar245 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar283._4_4_ = fVar245 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar283._8_4_ = fVar245 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar283._12_4_ = fVar245 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar216 = vcvtdq2ps_avx(auVar216);
  auVar24 = vcvtdq2ps_avx(auVar299);
  auVar310._16_16_ = auVar37;
  auVar310._0_16_ = auVar36;
  auVar25 = vcvtdq2ps_avx(auVar310);
  auVar311._16_16_ = auVar39;
  auVar311._0_16_ = auVar38;
  auVar26 = vcvtdq2ps_avx(auVar311);
  auVar328._16_16_ = auVar41;
  auVar328._0_16_ = auVar40;
  auVar372._16_16_ = auVar43;
  auVar372._0_16_ = auVar42;
  auVar248._16_16_ = auVar212;
  auVar248._0_16_ = auVar269;
  auVar269 = vshufps_avx(auVar283,auVar283,0x55);
  auVar212 = vshufps_avx(auVar283,auVar283,0xaa);
  fVar257 = auVar212._0_4_;
  fVar259 = auVar212._4_4_;
  fVar261 = auVar212._8_4_;
  fVar244 = auVar212._12_4_;
  fVar238 = auVar269._0_4_;
  fVar240 = auVar269._4_4_;
  fVar242 = auVar269._8_4_;
  fVar265 = auVar269._12_4_;
  auVar27 = vcvtdq2ps_avx(auVar352);
  auVar28 = vcvtdq2ps_avx(auVar360);
  auVar29 = vcvtdq2ps_avx(auVar328);
  auVar30 = vcvtdq2ps_avx(auVar372);
  auVar31 = vcvtdq2ps_avx(auVar248);
  auVar269 = vshufps_avx(auVar283,auVar283,0);
  fVar245 = auVar269._0_4_;
  fVar252 = auVar269._4_4_;
  fVar253 = auVar269._8_4_;
  fVar255 = auVar269._12_4_;
  auVar373._0_4_ = auVar27._0_4_ * fVar245 + fVar238 * auVar216._0_4_ + fVar257 * auVar24._0_4_;
  auVar373._4_4_ = auVar27._4_4_ * fVar252 + fVar240 * auVar216._4_4_ + fVar259 * auVar24._4_4_;
  auVar373._8_4_ = auVar27._8_4_ * fVar253 + fVar242 * auVar216._8_4_ + fVar261 * auVar24._8_4_;
  auVar373._12_4_ = auVar27._12_4_ * fVar255 + fVar265 * auVar216._12_4_ + fVar244 * auVar24._12_4_;
  auVar373._16_4_ = auVar27._16_4_ * fVar245 + fVar238 * auVar216._16_4_ + fVar257 * auVar24._16_4_;
  auVar373._20_4_ = auVar27._20_4_ * fVar252 + fVar240 * auVar216._20_4_ + fVar259 * auVar24._20_4_;
  auVar373._24_4_ = auVar27._24_4_ * fVar253 + fVar242 * auVar216._24_4_ + fVar261 * auVar24._24_4_;
  auVar373._28_4_ = auVar41._12_4_ + 0.0;
  auVar361._0_4_ = fVar245 * auVar28._0_4_ + fVar238 * auVar25._0_4_ + auVar26._0_4_ * fVar257;
  auVar361._4_4_ = fVar252 * auVar28._4_4_ + fVar240 * auVar25._4_4_ + auVar26._4_4_ * fVar259;
  auVar361._8_4_ = fVar253 * auVar28._8_4_ + fVar242 * auVar25._8_4_ + auVar26._8_4_ * fVar261;
  auVar361._12_4_ = fVar255 * auVar28._12_4_ + fVar265 * auVar25._12_4_ + auVar26._12_4_ * fVar244;
  auVar361._16_4_ = fVar245 * auVar28._16_4_ + fVar238 * auVar25._16_4_ + auVar26._16_4_ * fVar257;
  auVar361._20_4_ = fVar252 * auVar28._20_4_ + fVar240 * auVar25._20_4_ + auVar26._20_4_ * fVar259;
  auVar361._24_4_ = fVar253 * auVar28._24_4_ + fVar242 * auVar25._24_4_ + auVar26._24_4_ * fVar261;
  auVar361._28_4_ = 0;
  auVar285._0_4_ = fVar245 * auVar29._0_4_ + fVar238 * auVar30._0_4_ + fVar257 * auVar31._0_4_;
  auVar285._4_4_ = fVar252 * auVar29._4_4_ + fVar240 * auVar30._4_4_ + fVar259 * auVar31._4_4_;
  auVar285._8_4_ = fVar253 * auVar29._8_4_ + fVar242 * auVar30._8_4_ + fVar261 * auVar31._8_4_;
  auVar285._12_4_ = fVar255 * auVar29._12_4_ + fVar265 * auVar30._12_4_ + fVar244 * auVar31._12_4_;
  auVar285._16_4_ = fVar245 * auVar29._16_4_ + fVar238 * auVar30._16_4_ + fVar257 * auVar31._16_4_;
  auVar285._20_4_ = fVar252 * auVar29._20_4_ + fVar240 * auVar30._20_4_ + fVar259 * auVar31._20_4_;
  auVar285._24_4_ = fVar253 * auVar29._24_4_ + fVar242 * auVar30._24_4_ + fVar261 * auVar31._24_4_;
  auVar285._28_4_ = auVar41._12_4_ + fVar244 + 0.0;
  auVar269 = vshufps_avx(_local_780,_local_780,0x55);
  auVar212 = vshufps_avx(_local_780,_local_780,0xaa);
  fVar257 = auVar212._0_4_;
  fVar259 = auVar212._4_4_;
  fVar261 = auVar212._8_4_;
  fVar244 = auVar212._12_4_;
  fVar245 = auVar269._0_4_;
  fVar252 = auVar269._4_4_;
  fVar253 = auVar269._8_4_;
  fVar255 = auVar269._12_4_;
  auVar269._8_8_ = 0;
  auVar269._0_8_ = *(ulong *)(prim + uVar140 * 7 + 6);
  auVar269 = vpmovsxwd_avx(auVar269);
  auVar212._8_8_ = 0;
  auVar212._0_8_ = *(ulong *)(prim + uVar140 * 7 + 0xe);
  auVar212 = vpmovsxwd_avx(auVar212);
  auVar228._8_8_ = 0;
  auVar228._0_8_ = *(ulong *)(prim + uVar140 * 0xb + 6);
  auVar228 = vpmovsxwd_avx(auVar228);
  auVar232._8_8_ = 0;
  auVar232._0_8_ = *(ulong *)(prim + uVar140 * 0xb + 0xe);
  auVar232 = vpmovsxwd_avx(auVar232);
  auVar32 = vshufps_avx(_local_780,_local_780,0);
  fVar238 = auVar32._0_4_;
  fVar240 = auVar32._4_4_;
  fVar242 = auVar32._8_4_;
  fVar265 = auVar32._12_4_;
  auVar217._0_4_ = fVar238 * auVar27._0_4_ + auVar216._0_4_ * fVar245 + fVar257 * auVar24._0_4_;
  auVar217._4_4_ = fVar240 * auVar27._4_4_ + auVar216._4_4_ * fVar252 + fVar259 * auVar24._4_4_;
  auVar217._8_4_ = fVar242 * auVar27._8_4_ + auVar216._8_4_ * fVar253 + fVar261 * auVar24._8_4_;
  auVar217._12_4_ = fVar265 * auVar27._12_4_ + auVar216._12_4_ * fVar255 + fVar244 * auVar24._12_4_;
  auVar217._16_4_ = fVar238 * auVar27._16_4_ + auVar216._16_4_ * fVar245 + fVar257 * auVar24._16_4_;
  auVar217._20_4_ = fVar240 * auVar27._20_4_ + auVar216._20_4_ * fVar252 + fVar259 * auVar24._20_4_;
  auVar217._24_4_ = fVar242 * auVar27._24_4_ + auVar216._24_4_ * fVar253 + fVar261 * auVar24._24_4_;
  auVar217._28_4_ = fVar244 + auVar31._28_4_ + 0.0;
  auVar182._0_4_ = fVar238 * auVar28._0_4_ + fVar245 * auVar25._0_4_ + auVar26._0_4_ * fVar257;
  auVar182._4_4_ = fVar240 * auVar28._4_4_ + fVar252 * auVar25._4_4_ + auVar26._4_4_ * fVar259;
  auVar182._8_4_ = fVar242 * auVar28._8_4_ + fVar253 * auVar25._8_4_ + auVar26._8_4_ * fVar261;
  auVar182._12_4_ = fVar265 * auVar28._12_4_ + fVar255 * auVar25._12_4_ + auVar26._12_4_ * fVar244;
  auVar182._16_4_ = fVar238 * auVar28._16_4_ + fVar245 * auVar25._16_4_ + auVar26._16_4_ * fVar257;
  auVar182._20_4_ = fVar240 * auVar28._20_4_ + fVar252 * auVar25._20_4_ + auVar26._20_4_ * fVar259;
  auVar182._24_4_ = fVar242 * auVar28._24_4_ + fVar253 * auVar25._24_4_ + auVar26._24_4_ * fVar261;
  auVar182._28_4_ = fVar244 + auVar31._28_4_ + auVar24._28_4_;
  auVar154._0_4_ = fVar238 * auVar29._0_4_ + auVar30._0_4_ * fVar245 + fVar257 * auVar31._0_4_;
  auVar154._4_4_ = fVar240 * auVar29._4_4_ + auVar30._4_4_ * fVar252 + fVar259 * auVar31._4_4_;
  auVar154._8_4_ = fVar242 * auVar29._8_4_ + auVar30._8_4_ * fVar253 + fVar261 * auVar31._8_4_;
  auVar154._12_4_ = fVar265 * auVar29._12_4_ + auVar30._12_4_ * fVar255 + fVar244 * auVar31._12_4_;
  auVar154._16_4_ = fVar238 * auVar29._16_4_ + auVar30._16_4_ * fVar245 + fVar257 * auVar31._16_4_;
  auVar154._20_4_ = fVar240 * auVar29._20_4_ + auVar30._20_4_ * fVar252 + fVar259 * auVar31._20_4_;
  auVar154._24_4_ = fVar242 * auVar29._24_4_ + auVar30._24_4_ * fVar253 + fVar261 * auVar31._24_4_;
  auVar154._28_4_ = auVar29._28_4_ + fVar255 + fVar244;
  auVar337._8_4_ = 0x7fffffff;
  auVar337._0_8_ = 0x7fffffff7fffffff;
  auVar337._12_4_ = 0x7fffffff;
  auVar337._16_4_ = 0x7fffffff;
  auVar337._20_4_ = 0x7fffffff;
  auVar337._24_4_ = 0x7fffffff;
  auVar337._28_4_ = 0x7fffffff;
  auVar233._8_4_ = 0x219392ef;
  auVar233._0_8_ = 0x219392ef219392ef;
  auVar233._12_4_ = 0x219392ef;
  auVar233._16_4_ = 0x219392ef;
  auVar233._20_4_ = 0x219392ef;
  auVar233._24_4_ = 0x219392ef;
  auVar233._28_4_ = 0x219392ef;
  auVar216 = vandps_avx(auVar373,auVar337);
  auVar216 = vcmpps_avx(auVar216,auVar233,1);
  auVar24 = vblendvps_avx(auVar373,auVar233,auVar216);
  auVar216 = vandps_avx(auVar361,auVar337);
  auVar216 = vcmpps_avx(auVar216,auVar233,1);
  auVar25 = vblendvps_avx(auVar361,auVar233,auVar216);
  auVar216 = vandps_avx(auVar337,auVar285);
  auVar216 = vcmpps_avx(auVar216,auVar233,1);
  auVar216 = vblendvps_avx(auVar285,auVar233,auVar216);
  auVar26 = vrcpps_avx(auVar24);
  fVar245 = auVar26._0_4_;
  fVar252 = auVar26._4_4_;
  auVar27._4_4_ = auVar24._4_4_ * fVar252;
  auVar27._0_4_ = auVar24._0_4_ * fVar245;
  fVar253 = auVar26._8_4_;
  auVar27._8_4_ = auVar24._8_4_ * fVar253;
  fVar255 = auVar26._12_4_;
  auVar27._12_4_ = auVar24._12_4_ * fVar255;
  fVar257 = auVar26._16_4_;
  auVar27._16_4_ = auVar24._16_4_ * fVar257;
  fVar259 = auVar26._20_4_;
  auVar27._20_4_ = auVar24._20_4_ * fVar259;
  fVar261 = auVar26._24_4_;
  auVar27._24_4_ = auVar24._24_4_ * fVar261;
  auVar27._28_4_ = auVar24._28_4_;
  auVar338._8_4_ = 0x3f800000;
  auVar338._0_8_ = 0x3f8000003f800000;
  auVar338._12_4_ = 0x3f800000;
  auVar338._16_4_ = 0x3f800000;
  auVar338._20_4_ = 0x3f800000;
  auVar338._24_4_ = 0x3f800000;
  auVar338._28_4_ = 0x3f800000;
  auVar28 = vsubps_avx(auVar338,auVar27);
  fVar245 = fVar245 + fVar245 * auVar28._0_4_;
  fVar252 = fVar252 + fVar252 * auVar28._4_4_;
  fVar253 = fVar253 + fVar253 * auVar28._8_4_;
  fVar255 = fVar255 + fVar255 * auVar28._12_4_;
  fVar257 = fVar257 + fVar257 * auVar28._16_4_;
  fVar259 = fVar259 + fVar259 * auVar28._20_4_;
  fVar261 = fVar261 + fVar261 * auVar28._24_4_;
  auVar27 = vrcpps_avx(auVar25);
  fVar265 = auVar27._0_4_;
  fVar274 = auVar27._4_4_;
  auVar24._4_4_ = fVar274 * auVar25._4_4_;
  auVar24._0_4_ = fVar265 * auVar25._0_4_;
  fVar276 = auVar27._8_4_;
  auVar24._8_4_ = fVar276 * auVar25._8_4_;
  fVar277 = auVar27._12_4_;
  auVar24._12_4_ = fVar277 * auVar25._12_4_;
  fVar278 = auVar27._16_4_;
  auVar24._16_4_ = fVar278 * auVar25._16_4_;
  fVar279 = auVar27._20_4_;
  auVar24._20_4_ = fVar279 * auVar25._20_4_;
  fVar280 = auVar27._24_4_;
  auVar24._24_4_ = fVar280 * auVar25._24_4_;
  auVar24._28_4_ = auVar25._28_4_;
  auVar25 = vsubps_avx(auVar338,auVar24);
  fVar265 = fVar265 + fVar265 * auVar25._0_4_;
  fVar274 = fVar274 + fVar274 * auVar25._4_4_;
  fVar276 = fVar276 + fVar276 * auVar25._8_4_;
  fVar277 = fVar277 + fVar277 * auVar25._12_4_;
  fVar278 = fVar278 + fVar278 * auVar25._16_4_;
  fVar279 = fVar279 + fVar279 * auVar25._20_4_;
  fVar280 = fVar280 + fVar280 * auVar25._24_4_;
  auVar24 = vrcpps_avx(auVar216);
  fVar281 = auVar24._0_4_;
  fVar288 = auVar24._4_4_;
  auVar29._4_4_ = fVar288 * auVar216._4_4_;
  auVar29._0_4_ = fVar281 * auVar216._0_4_;
  fVar290 = auVar24._8_4_;
  auVar29._8_4_ = fVar290 * auVar216._8_4_;
  fVar292 = auVar24._12_4_;
  auVar29._12_4_ = fVar292 * auVar216._12_4_;
  fVar294 = auVar24._16_4_;
  auVar29._16_4_ = fVar294 * auVar216._16_4_;
  fVar295 = auVar24._20_4_;
  auVar29._20_4_ = fVar295 * auVar216._20_4_;
  fVar296 = auVar24._24_4_;
  auVar29._24_4_ = fVar296 * auVar216._24_4_;
  auVar29._28_4_ = auVar216._28_4_;
  auVar216 = vsubps_avx(auVar338,auVar29);
  fVar281 = fVar281 + fVar281 * auVar216._0_4_;
  fVar288 = fVar288 + fVar288 * auVar216._4_4_;
  fVar290 = fVar290 + fVar290 * auVar216._8_4_;
  fVar292 = fVar292 + fVar292 * auVar216._12_4_;
  fVar294 = fVar294 + fVar294 * auVar216._16_4_;
  fVar295 = fVar295 + fVar295 * auVar216._20_4_;
  fVar296 = fVar296 + fVar296 * auVar216._24_4_;
  auVar329._16_16_ = auVar212;
  auVar329._0_16_ = auVar269;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = *(ulong *)(prim + uVar140 * 9 + 6);
  auVar269 = vpmovsxwd_avx(auVar32);
  auVar33._8_8_ = 0;
  auVar33._0_8_ = *(ulong *)(prim + uVar140 * 9 + 0xe);
  auVar212 = vpmovsxwd_avx(auVar33);
  auVar34._8_8_ = 0;
  auVar34._0_8_ = *(ulong *)(prim + uVar140 * 0xd + 6);
  auVar32 = vpmovsxwd_avx(auVar34);
  auVar35._8_8_ = 0;
  auVar35._0_8_ = *(ulong *)(prim + uVar140 * 0xd + 0xe);
  auVar33 = vpmovsxwd_avx(auVar35);
  auVar34 = vpermilps_avx(ZEXT416((uint)(((ray->super_RayK<1>).dir.field_0.m128[3] -
                                         *(float *)(prim + lVar142 + 0x16)) *
                                        *(float *)(prim + lVar142 + 0x1a))),0);
  auVar216 = vcvtdq2ps_avx(auVar329);
  auVar300._16_16_ = auVar232;
  auVar300._0_16_ = auVar228;
  auVar24 = vcvtdq2ps_avx(auVar300);
  auVar24 = vsubps_avx(auVar24,auVar216);
  fVar244 = auVar34._0_4_;
  fVar238 = auVar34._4_4_;
  fVar240 = auVar34._8_4_;
  fVar242 = auVar34._12_4_;
  auVar301._0_4_ = auVar216._0_4_ + fVar244 * auVar24._0_4_;
  auVar301._4_4_ = auVar216._4_4_ + fVar238 * auVar24._4_4_;
  auVar301._8_4_ = auVar216._8_4_ + fVar240 * auVar24._8_4_;
  auVar301._12_4_ = auVar216._12_4_ + fVar242 * auVar24._12_4_;
  auVar301._16_4_ = auVar216._16_4_ + fVar244 * auVar24._16_4_;
  auVar301._20_4_ = auVar216._20_4_ + fVar238 * auVar24._20_4_;
  auVar301._24_4_ = auVar216._24_4_ + fVar240 * auVar24._24_4_;
  auVar301._28_4_ = auVar216._28_4_ + auVar24._28_4_;
  auVar36._8_8_ = 0;
  auVar36._0_8_ = *(ulong *)(prim + uVar140 * 0x12 + 6);
  auVar228 = vpmovsxwd_avx(auVar36);
  auVar37._8_8_ = 0;
  auVar37._0_8_ = *(ulong *)(prim + uVar140 * 0x12 + 0xe);
  auVar232 = vpmovsxwd_avx(auVar37);
  auVar312._16_16_ = auVar212;
  auVar312._0_16_ = auVar269;
  auVar339._16_16_ = auVar33;
  auVar339._0_16_ = auVar32;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = *(ulong *)(prim + uVar140 * 0x16 + 6);
  auVar269 = vpmovsxwd_avx(auVar38);
  auVar39._8_8_ = 0;
  auVar39._0_8_ = *(ulong *)(prim + uVar140 * 0x16 + 0xe);
  auVar212 = vpmovsxwd_avx(auVar39);
  auVar216 = vcvtdq2ps_avx(auVar312);
  auVar24 = vcvtdq2ps_avx(auVar339);
  auVar24 = vsubps_avx(auVar24,auVar216);
  auVar313._0_4_ = auVar216._0_4_ + auVar24._0_4_ * fVar244;
  auVar313._4_4_ = auVar216._4_4_ + auVar24._4_4_ * fVar238;
  auVar313._8_4_ = auVar216._8_4_ + auVar24._8_4_ * fVar240;
  auVar313._12_4_ = auVar216._12_4_ + auVar24._12_4_ * fVar242;
  auVar313._16_4_ = auVar216._16_4_ + auVar24._16_4_ * fVar244;
  auVar313._20_4_ = auVar216._20_4_ + auVar24._20_4_ * fVar238;
  auVar313._24_4_ = auVar216._24_4_ + auVar24._24_4_ * fVar240;
  auVar313._28_4_ = auVar216._28_4_ + auVar24._28_4_;
  auVar330._16_16_ = auVar232;
  auVar330._0_16_ = auVar228;
  auVar216 = vcvtdq2ps_avx(auVar330);
  auVar340._16_16_ = auVar212;
  auVar340._0_16_ = auVar269;
  auVar24 = vcvtdq2ps_avx(auVar340);
  auVar24 = vsubps_avx(auVar24,auVar216);
  auVar331._0_4_ = auVar216._0_4_ + auVar24._0_4_ * fVar244;
  auVar331._4_4_ = auVar216._4_4_ + auVar24._4_4_ * fVar238;
  auVar331._8_4_ = auVar216._8_4_ + auVar24._8_4_ * fVar240;
  auVar331._12_4_ = auVar216._12_4_ + auVar24._12_4_ * fVar242;
  auVar331._16_4_ = auVar216._16_4_ + auVar24._16_4_ * fVar244;
  auVar331._20_4_ = auVar216._20_4_ + auVar24._20_4_ * fVar238;
  auVar331._24_4_ = auVar216._24_4_ + auVar24._24_4_ * fVar240;
  auVar331._28_4_ = auVar216._28_4_ + auVar24._28_4_;
  auVar40._8_8_ = 0;
  auVar40._0_8_ = *(ulong *)(prim + uVar140 * 0x14 + 6);
  auVar269 = vpmovsxwd_avx(auVar40);
  auVar41._8_8_ = 0;
  auVar41._0_8_ = *(ulong *)(prim + uVar140 * 0x14 + 0xe);
  auVar212 = vpmovsxwd_avx(auVar41);
  auVar341._16_16_ = auVar212;
  auVar341._0_16_ = auVar269;
  auVar216 = vcvtdq2ps_avx(auVar341);
  auVar42._8_8_ = 0;
  auVar42._0_8_ = *(ulong *)(prim + uVar140 * 0x18 + 6);
  auVar269 = vpmovsxwd_avx(auVar42);
  auVar43._8_8_ = 0;
  auVar43._0_8_ = *(ulong *)(prim + uVar140 * 0x18 + 0xe);
  auVar212 = vpmovsxwd_avx(auVar43);
  auVar353._16_16_ = auVar212;
  auVar353._0_16_ = auVar269;
  auVar24 = vcvtdq2ps_avx(auVar353);
  auVar24 = vsubps_avx(auVar24,auVar216);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + uVar140 * 0x1d + 6);
  auVar269 = vpmovsxwd_avx(auVar11);
  auVar342._0_4_ = auVar216._0_4_ + auVar24._0_4_ * fVar244;
  auVar342._4_4_ = auVar216._4_4_ + auVar24._4_4_ * fVar238;
  auVar342._8_4_ = auVar216._8_4_ + auVar24._8_4_ * fVar240;
  auVar342._12_4_ = auVar216._12_4_ + auVar24._12_4_ * fVar242;
  auVar342._16_4_ = auVar216._16_4_ + auVar24._16_4_ * fVar244;
  auVar342._20_4_ = auVar216._20_4_ + auVar24._20_4_ * fVar238;
  auVar342._24_4_ = auVar216._24_4_ + auVar24._24_4_ * fVar240;
  auVar342._28_4_ = auVar216._28_4_ + auVar24._28_4_;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = *(ulong *)(prim + uVar140 * 0x1d + 0xe);
  auVar212 = vpmovsxwd_avx(auVar12);
  auVar354._16_16_ = auVar212;
  auVar354._0_16_ = auVar269;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = *(ulong *)(prim + uVar140 * 0x21 + 6);
  auVar269 = vpmovsxwd_avx(auVar13);
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar140 * 0x21 + 0xe);
  auVar212 = vpmovsxwd_avx(auVar14);
  auVar216 = vcvtdq2ps_avx(auVar354);
  auVar362._16_16_ = auVar212;
  auVar362._0_16_ = auVar269;
  auVar24 = vcvtdq2ps_avx(auVar362);
  auVar24 = vsubps_avx(auVar24,auVar216);
  auVar355._0_4_ = auVar216._0_4_ + auVar24._0_4_ * fVar244;
  auVar355._4_4_ = auVar216._4_4_ + auVar24._4_4_ * fVar238;
  auVar355._8_4_ = auVar216._8_4_ + auVar24._8_4_ * fVar240;
  auVar355._12_4_ = auVar216._12_4_ + auVar24._12_4_ * fVar242;
  auVar355._16_4_ = auVar216._16_4_ + auVar24._16_4_ * fVar244;
  auVar355._20_4_ = auVar216._20_4_ + auVar24._20_4_ * fVar238;
  auVar355._24_4_ = auVar216._24_4_ + auVar24._24_4_ * fVar240;
  auVar355._28_4_ = auVar216._28_4_ + auVar24._28_4_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar140 * 0x1f + 6);
  auVar269 = vpmovsxwd_avx(auVar15);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar140 * 0x1f + 0xe);
  auVar212 = vpmovsxwd_avx(auVar16);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar140 * 0x23 + 6);
  auVar228 = vpmovsxwd_avx(auVar17);
  auVar363._16_16_ = auVar212;
  auVar363._0_16_ = auVar269;
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar140 * 0x23 + 0xe);
  auVar269 = vpmovsxwd_avx(auVar18);
  auVar374._16_16_ = auVar269;
  auVar374._0_16_ = auVar228;
  auVar216 = vcvtdq2ps_avx(auVar363);
  auVar24 = vcvtdq2ps_avx(auVar374);
  auVar24 = vsubps_avx(auVar24,auVar216);
  auVar364._0_4_ = auVar216._0_4_ + auVar24._0_4_ * fVar244;
  auVar364._4_4_ = auVar216._4_4_ + auVar24._4_4_ * fVar238;
  auVar364._8_4_ = auVar216._8_4_ + auVar24._8_4_ * fVar240;
  auVar364._12_4_ = auVar216._12_4_ + auVar24._12_4_ * fVar242;
  auVar364._16_4_ = auVar216._16_4_ + auVar24._16_4_ * fVar244;
  auVar364._20_4_ = auVar216._20_4_ + auVar24._20_4_ * fVar238;
  auVar364._24_4_ = auVar216._24_4_ + auVar24._24_4_ * fVar240;
  auVar364._28_4_ = auVar216._28_4_ + fVar242;
  auVar216 = vsubps_avx(auVar301,auVar217);
  auVar230._0_4_ = fVar245 * auVar216._0_4_;
  auVar230._4_4_ = fVar252 * auVar216._4_4_;
  auVar230._8_4_ = fVar253 * auVar216._8_4_;
  auVar230._12_4_ = fVar255 * auVar216._12_4_;
  auVar30._16_4_ = fVar257 * auVar216._16_4_;
  auVar30._0_16_ = auVar230;
  auVar30._20_4_ = fVar259 * auVar216._20_4_;
  auVar30._24_4_ = fVar261 * auVar216._24_4_;
  auVar30._28_4_ = auVar216._28_4_;
  auVar216 = vsubps_avx(auVar313,auVar217);
  auVar246._0_4_ = fVar245 * auVar216._0_4_;
  auVar246._4_4_ = fVar252 * auVar216._4_4_;
  auVar246._8_4_ = fVar253 * auVar216._8_4_;
  auVar246._12_4_ = fVar255 * auVar216._12_4_;
  auVar31._16_4_ = fVar257 * auVar216._16_4_;
  auVar31._0_16_ = auVar246;
  auVar31._20_4_ = fVar259 * auVar216._20_4_;
  auVar31._24_4_ = fVar261 * auVar216._24_4_;
  auVar31._28_4_ = auVar26._28_4_ + auVar28._28_4_;
  auVar216 = vsubps_avx(auVar331,auVar182);
  auVar207._0_4_ = fVar265 * auVar216._0_4_;
  auVar207._4_4_ = fVar274 * auVar216._4_4_;
  auVar207._8_4_ = fVar276 * auVar216._8_4_;
  auVar207._12_4_ = fVar277 * auVar216._12_4_;
  auVar26._16_4_ = fVar278 * auVar216._16_4_;
  auVar26._0_16_ = auVar207;
  auVar26._20_4_ = fVar279 * auVar216._20_4_;
  auVar26._24_4_ = fVar280 * auVar216._24_4_;
  auVar26._28_4_ = auVar216._28_4_;
  auVar216 = vsubps_avx(auVar342,auVar182);
  auVar267._0_4_ = fVar265 * auVar216._0_4_;
  auVar267._4_4_ = fVar274 * auVar216._4_4_;
  auVar267._8_4_ = fVar276 * auVar216._8_4_;
  auVar267._12_4_ = fVar277 * auVar216._12_4_;
  auVar28._16_4_ = fVar278 * auVar216._16_4_;
  auVar28._0_16_ = auVar267;
  auVar28._20_4_ = fVar279 * auVar216._20_4_;
  auVar28._24_4_ = fVar280 * auVar216._24_4_;
  auVar28._28_4_ = auVar27._28_4_ + auVar25._28_4_;
  auVar216 = vsubps_avx(auVar355,auVar154);
  auVar180._0_4_ = fVar281 * auVar216._0_4_;
  auVar180._4_4_ = fVar288 * auVar216._4_4_;
  auVar180._8_4_ = fVar290 * auVar216._8_4_;
  auVar180._12_4_ = fVar292 * auVar216._12_4_;
  auVar25._16_4_ = fVar294 * auVar216._16_4_;
  auVar25._0_16_ = auVar180;
  auVar25._20_4_ = fVar295 * auVar216._20_4_;
  auVar25._24_4_ = fVar296 * auVar216._24_4_;
  auVar25._28_4_ = auVar216._28_4_;
  auVar216 = vsubps_avx(auVar364,auVar154);
  auVar152._0_4_ = fVar281 * auVar216._0_4_;
  auVar152._4_4_ = fVar288 * auVar216._4_4_;
  auVar152._8_4_ = fVar290 * auVar216._8_4_;
  auVar152._12_4_ = fVar292 * auVar216._12_4_;
  auVar23._16_4_ = fVar294 * auVar216._16_4_;
  auVar23._0_16_ = auVar152;
  auVar23._20_4_ = fVar295 * auVar216._20_4_;
  auVar23._24_4_ = fVar296 * auVar216._24_4_;
  auVar23._28_4_ = auVar216._28_4_;
  auVar269 = vpminsd_avx(auVar30._16_16_,auVar31._16_16_);
  auVar212 = vpminsd_avx(auVar230,auVar246);
  auVar343._16_16_ = auVar269;
  auVar343._0_16_ = auVar212;
  auVar232 = auVar28._16_16_;
  auVar318 = ZEXT1664(auVar232);
  auVar228 = auVar26._16_16_;
  auVar335 = ZEXT1664(auVar228);
  auVar269 = vpminsd_avx(auVar228,auVar232);
  auVar212 = vpminsd_avx(auVar207,auVar267);
  auVar356._16_16_ = auVar269;
  auVar356._0_16_ = auVar212;
  auVar216 = vmaxps_avx(auVar343,auVar356);
  auVar269 = vpminsd_avx(auVar25._16_16_,auVar23._16_16_);
  auVar212 = vpminsd_avx(auVar180,auVar152);
  auVar375._16_16_ = auVar269;
  auVar375._0_16_ = auVar212;
  uVar149 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar379._4_4_ = uVar149;
  auVar379._0_4_ = uVar149;
  auVar379._8_4_ = uVar149;
  auVar379._12_4_ = uVar149;
  auVar379._16_4_ = uVar149;
  auVar379._20_4_ = uVar149;
  auVar379._24_4_ = uVar149;
  auVar379._28_4_ = uVar149;
  auVar24 = vmaxps_avx(auVar375,auVar379);
  auVar216 = vmaxps_avx(auVar216,auVar24);
  local_80._4_4_ = auVar216._4_4_ * 0.99999964;
  local_80._0_4_ = auVar216._0_4_ * 0.99999964;
  local_80._8_4_ = auVar216._8_4_ * 0.99999964;
  local_80._12_4_ = auVar216._12_4_ * 0.99999964;
  local_80._16_4_ = auVar216._16_4_ * 0.99999964;
  local_80._20_4_ = auVar216._20_4_ * 0.99999964;
  local_80._24_4_ = auVar216._24_4_ * 0.99999964;
  local_80._28_4_ = 0x3f7ffffa;
  auVar269 = vpmaxsd_avx(auVar30._16_16_,auVar31._16_16_);
  auVar212 = vpmaxsd_avx(auVar230,auVar246);
  auVar234._16_16_ = auVar269;
  auVar234._0_16_ = auVar212;
  auVar269 = vpmaxsd_avx(auVar228,auVar232);
  auVar212 = vpmaxsd_avx(auVar207,auVar267);
  auVar218._16_16_ = auVar269;
  auVar218._0_16_ = auVar212;
  auVar216 = vminps_avx(auVar234,auVar218);
  auVar269 = vpmaxsd_avx(auVar25._16_16_,auVar23._16_16_);
  auVar212 = vpmaxsd_avx(auVar180,auVar152);
  fVar245 = (ray->super_RayK<1>).tfar;
  auVar183._4_4_ = fVar245;
  auVar183._0_4_ = fVar245;
  auVar183._8_4_ = fVar245;
  auVar183._12_4_ = fVar245;
  auVar183._16_4_ = fVar245;
  auVar183._20_4_ = fVar245;
  auVar183._24_4_ = fVar245;
  auVar183._28_4_ = fVar245;
  auVar155._16_16_ = auVar269;
  auVar155._0_16_ = auVar212;
  auVar24 = vminps_avx(auVar155,auVar183);
  auVar216 = vminps_avx(auVar216,auVar24);
  auVar44._4_4_ = auVar216._4_4_ * 1.0000004;
  auVar44._0_4_ = auVar216._0_4_ * 1.0000004;
  auVar44._8_4_ = auVar216._8_4_ * 1.0000004;
  auVar44._12_4_ = auVar216._12_4_ * 1.0000004;
  auVar44._16_4_ = auVar216._16_4_ * 1.0000004;
  auVar44._20_4_ = auVar216._20_4_ * 1.0000004;
  auVar44._24_4_ = auVar216._24_4_ * 1.0000004;
  auVar44._28_4_ = auVar216._28_4_;
  auVar216 = vcmpps_avx(local_80,auVar44,2);
  auVar269 = vpshufd_avx(ZEXT116((byte)PVar19),0);
  auVar184._16_16_ = auVar269;
  auVar184._0_16_ = auVar269;
  auVar24 = vcvtdq2ps_avx(auVar184);
  auVar24 = vcmpps_avx(_DAT_01f7b060,auVar24,1);
  auVar216 = vandps_avx(auVar216,auVar24);
  local_460[1]._0_8_ = mm_lookupmask_ps._16_8_;
  local_460[1]._8_8_ = mm_lookupmask_ps._24_8_;
  local_460[1]._16_8_ = mm_lookupmask_ps._16_8_;
  local_460[1]._24_8_ = mm_lookupmask_ps._24_8_;
  uVar149 = vmovmskps_avx(auVar216);
  uVar140 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),uVar149);
  local_700 = prim;
  local_7a0 = ray;
  do {
    if (uVar140 == 0) {
      return;
    }
    local_660 = auVar335._0_32_;
    local_6c0 = auVar318._0_32_;
    lVar142 = 0;
    if (uVar140 != 0) {
      for (; (uVar140 >> lVar142 & 1) == 0; lVar142 = lVar142 + 1) {
      }
    }
    uVar141 = *(uint *)(prim + 2);
    uVar139 = *(uint *)(prim + lVar142 * 4 + 6);
    local_798 = (ulong)uVar141;
    pGVar20 = (context->scene->geometries).items[uVar141].ptr;
    local_788 = (ulong)uVar139;
    uVar143 = (ulong)*(uint *)(*(long *)&pGVar20->field_0x58 +
                              (ulong)uVar139 *
                              pGVar20[1].super_RefCount.refCounter.
                              super___atomic_base<unsigned_long>._M_i);
    fVar245 = (pGVar20->time_range).lower;
    fVar245 = pGVar20->fnumTimeSegments *
              (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar245) /
              ((pGVar20->time_range).upper - fVar245));
    auVar269 = vroundss_avx(ZEXT416((uint)fVar245),ZEXT416((uint)fVar245),9);
    auVar269 = vminss_avx(auVar269,ZEXT416((uint)(pGVar20->fnumTimeSegments + -1.0)));
    auVar269 = vmaxss_avx(ZEXT816(0) << 0x20,auVar269);
    fVar245 = fVar245 - auVar269._0_4_;
    _Var21 = pGVar20[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    lVar145 = (long)(int)auVar269._0_4_ * 0x38;
    lVar142 = *(long *)(_Var21 + 0x10 + lVar145);
    lVar150 = *(long *)(_Var21 + 0x38 + lVar145);
    lVar148 = *(long *)(_Var21 + 0x48 + lVar145);
    auVar269 = vshufps_avx(ZEXT416((uint)fVar245),ZEXT416((uint)fVar245),0);
    pfVar1 = (float *)(lVar150 + uVar143 * lVar148);
    fVar257 = auVar269._0_4_;
    fVar259 = auVar269._4_4_;
    fVar261 = auVar269._8_4_;
    fVar244 = auVar269._12_4_;
    pfVar2 = (float *)(lVar150 + (uVar143 + 1) * lVar148);
    pfVar3 = (float *)(lVar150 + (uVar143 + 2) * lVar148);
    pfVar4 = (float *)(lVar150 + lVar148 * (uVar143 + 3));
    lVar150 = *(long *)(_Var21 + lVar145);
    auVar269 = vshufps_avx(ZEXT416((uint)(1.0 - fVar245)),ZEXT416((uint)(1.0 - fVar245)),0);
    pfVar5 = (float *)(lVar150 + lVar142 * uVar143);
    fVar245 = auVar269._0_4_;
    fVar252 = auVar269._4_4_;
    fVar253 = auVar269._8_4_;
    fVar255 = auVar269._12_4_;
    pfVar6 = (float *)(lVar150 + lVar142 * (uVar143 + 1));
    fVar266 = fVar257 * *pfVar1 + fVar245 * *pfVar5;
    fVar275 = fVar259 * pfVar1[1] + fVar252 * pfVar5[1];
    auVar268._0_8_ = CONCAT44(fVar275,fVar266);
    auVar268._8_4_ = fVar261 * pfVar1[2] + fVar253 * pfVar5[2];
    auVar268._12_4_ = fVar244 * pfVar1[3] + fVar255 * pfVar5[3];
    fVar307 = fVar245 * *pfVar6 + fVar257 * *pfVar2;
    fVar319 = fVar252 * pfVar6[1] + fVar259 * pfVar2[1];
    auVar309._0_8_ = CONCAT44(fVar319,fVar307);
    auVar309._8_4_ = fVar253 * pfVar6[2] + fVar261 * pfVar2[2];
    auVar309._12_4_ = fVar255 * pfVar6[3] + fVar244 * pfVar2[3];
    pfVar1 = (float *)(lVar150 + lVar142 * (uVar143 + 2));
    pfVar2 = (float *)(lVar150 + lVar142 * (uVar143 + 3));
    fVar388 = fVar245 * *pfVar1 + fVar257 * *pfVar3;
    fVar393 = fVar252 * pfVar1[1] + fVar259 * pfVar3[1];
    auVar390._0_8_ = CONCAT44(fVar393,fVar388);
    auVar390._8_4_ = fVar253 * pfVar1[2] + fVar261 * pfVar3[2];
    auVar390._12_4_ = fVar255 * pfVar1[3] + fVar244 * pfVar3[3];
    fVar205 = fVar245 * *pfVar2 + fVar257 * *pfVar4;
    fVar223 = fVar252 * pfVar2[1] + fVar259 * pfVar4[1];
    auVar208._0_8_ = CONCAT44(fVar223,fVar205);
    auVar208._8_4_ = fVar253 * pfVar2[2] + fVar261 * pfVar4[2];
    auVar208._12_4_ = fVar255 * pfVar2[3] + fVar244 * pfVar4[3];
    uVar146 = (uint)pGVar20[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    aVar10 = (local_7a0->super_RayK<1>).org.field_0;
    auVar228 = vsubps_avx(auVar268,(undefined1  [16])aVar10);
    _local_710 = auVar268;
    auVar35 = _local_710;
    auVar269 = vshufps_avx(auVar228,auVar228,0);
    auVar212 = vshufps_avx(auVar228,auVar228,0x55);
    auVar228 = vshufps_avx(auVar228,auVar228,0xaa);
    fVar245 = (local_6f8->ray_space).vx.field_0.m128[0];
    fVar252 = (local_6f8->ray_space).vx.field_0.m128[1];
    fVar253 = (local_6f8->ray_space).vx.field_0.m128[2];
    fVar255 = (local_6f8->ray_space).vx.field_0.m128[3];
    fVar257 = (local_6f8->ray_space).vy.field_0.m128[0];
    fVar259 = (local_6f8->ray_space).vy.field_0.m128[1];
    fVar261 = (local_6f8->ray_space).vy.field_0.m128[2];
    fVar244 = (local_6f8->ray_space).vy.field_0.m128[3];
    fVar238 = (local_6f8->ray_space).vz.field_0.m128[0];
    fVar240 = (local_6f8->ray_space).vz.field_0.m128[1];
    fVar242 = (local_6f8->ray_space).vz.field_0.m128[2];
    fVar265 = (local_6f8->ray_space).vz.field_0.m128[3];
    auVar231._0_4_ = auVar269._0_4_ * fVar245 + auVar228._0_4_ * fVar238 + auVar212._0_4_ * fVar257;
    auVar231._4_4_ = auVar269._4_4_ * fVar252 + auVar228._4_4_ * fVar240 + auVar212._4_4_ * fVar259;
    auVar231._8_4_ = auVar269._8_4_ * fVar253 + auVar228._8_4_ * fVar242 + auVar212._8_4_ * fVar261;
    auVar231._12_4_ =
         auVar269._12_4_ * fVar255 + auVar228._12_4_ * fVar265 + auVar212._12_4_ * fVar244;
    auVar269 = vblendps_avx(auVar231,auVar268,8);
    _local_720 = auVar309;
    auVar34 = _local_720;
    auVar232 = vsubps_avx(auVar309,(undefined1  [16])aVar10);
    auVar212 = vshufps_avx(auVar232,auVar232,0);
    auVar228 = vshufps_avx(auVar232,auVar232,0x55);
    auVar232 = vshufps_avx(auVar232,auVar232,0xaa);
    auVar371._0_4_ = auVar212._0_4_ * fVar245 + auVar232._0_4_ * fVar238 + auVar228._0_4_ * fVar257;
    auVar371._4_4_ = auVar212._4_4_ * fVar252 + auVar232._4_4_ * fVar240 + auVar228._4_4_ * fVar259;
    auVar371._8_4_ = auVar212._8_4_ * fVar253 + auVar232._8_4_ * fVar242 + auVar228._8_4_ * fVar261;
    auVar371._12_4_ =
         auVar212._12_4_ * fVar255 + auVar232._12_4_ * fVar265 + auVar228._12_4_ * fVar244;
    auVar212 = vblendps_avx(auVar371,auVar309,8);
    local_5a0._0_16_ = (undefined1  [16])aVar10;
    auVar32 = vsubps_avx(auVar390,(undefined1  [16])aVar10);
    auVar228 = vshufps_avx(auVar32,auVar32,0);
    auVar232 = vshufps_avx(auVar32,auVar32,0x55);
    auVar32 = vshufps_avx(auVar32,auVar32,0xaa);
    auVar284._0_4_ = auVar228._0_4_ * fVar245 + auVar232._0_4_ * fVar257 + auVar32._0_4_ * fVar238;
    auVar284._4_4_ = auVar228._4_4_ * fVar252 + auVar232._4_4_ * fVar259 + auVar32._4_4_ * fVar240;
    auVar284._8_4_ = auVar228._8_4_ * fVar253 + auVar232._8_4_ * fVar261 + auVar32._8_4_ * fVar242;
    auVar284._12_4_ =
         auVar228._12_4_ * fVar255 + auVar232._12_4_ * fVar244 + auVar32._12_4_ * fVar265;
    auVar228 = vblendps_avx(auVar284,auVar390,8);
    auVar33 = vsubps_avx(auVar208,(undefined1  [16])aVar10);
    auVar232 = vshufps_avx(auVar33,auVar33,0xaa);
    auVar32 = vshufps_avx(auVar33,auVar33,0);
    auVar33 = vshufps_avx(auVar33,auVar33,0x55);
    auVar181._0_4_ = auVar32._0_4_ * fVar245 + auVar232._0_4_ * fVar238 + auVar33._0_4_ * fVar257;
    auVar181._4_4_ = auVar32._4_4_ * fVar252 + auVar232._4_4_ * fVar240 + auVar33._4_4_ * fVar259;
    auVar181._8_4_ = auVar32._8_4_ * fVar253 + auVar232._8_4_ * fVar242 + auVar33._8_4_ * fVar261;
    auVar181._12_4_ =
         auVar32._12_4_ * fVar255 + auVar232._12_4_ * fVar265 + auVar33._12_4_ * fVar244;
    auVar232 = vblendps_avx(auVar181,auVar208,8);
    auVar247._8_4_ = 0x7fffffff;
    auVar247._0_8_ = 0x7fffffff7fffffff;
    auVar247._12_4_ = 0x7fffffff;
    auVar269 = vandps_avx(auVar269,auVar247);
    auVar212 = vandps_avx(auVar212,auVar247);
    auVar32 = vmaxps_avx(auVar269,auVar212);
    auVar269 = vandps_avx(auVar228,auVar247);
    auVar212 = vandps_avx(auVar232,auVar247);
    auVar269 = vmaxps_avx(auVar269,auVar212);
    auVar269 = vmaxps_avx(auVar32,auVar269);
    auVar212 = vmovshdup_avx(auVar269);
    auVar212 = vmaxss_avx(auVar212,auVar269);
    auVar269 = vshufpd_avx(auVar269,auVar269,1);
    auVar269 = vmaxss_avx(auVar269,auVar212);
    lVar142 = (long)(int)uVar146;
    lVar150 = lVar142 * 0x44;
    fVar277 = *(float *)(bspline_basis0 + lVar150 + 0x908);
    fVar278 = *(float *)(bspline_basis0 + lVar150 + 0x90c);
    fVar279 = *(float *)(bspline_basis0 + lVar150 + 0x910);
    fVar280 = *(float *)(bspline_basis0 + lVar150 + 0x914);
    fVar281 = *(float *)(bspline_basis0 + lVar150 + 0x918);
    fVar288 = *(float *)(bspline_basis0 + lVar150 + 0x91c);
    fVar290 = *(float *)(bspline_basis0 + lVar150 + 0x920);
    auVar212 = vshufps_avx(auVar284,auVar284,0);
    register0x00001250 = auVar212;
    _local_6a0 = auVar212;
    fVar245 = *(float *)*(undefined1 (*) [28])(bspline_basis0 + lVar150 + 0xd8c);
    fVar252 = *(float *)(bspline_basis0 + lVar150 + 0xd90);
    fVar253 = *(float *)(bspline_basis0 + lVar150 + 0xd94);
    fVar255 = *(float *)(bspline_basis0 + lVar150 + 0xd98);
    fVar257 = *(float *)(bspline_basis0 + lVar150 + 0xd9c);
    fVar259 = *(float *)(bspline_basis0 + lVar150 + 0xda0);
    fVar261 = *(float *)(bspline_basis0 + lVar150 + 0xda4);
    auVar133 = *(undefined1 (*) [28])(bspline_basis0 + lVar150 + 0xd8c);
    auVar228 = vshufps_avx(auVar181,auVar181,0);
    register0x00001590 = auVar228;
    _local_360 = auVar228;
    fVar378 = auVar228._0_4_;
    fVar382 = auVar228._4_4_;
    fVar384 = auVar228._8_4_;
    fVar386 = auVar228._12_4_;
    fVar178 = auVar212._0_4_;
    fVar194 = auVar212._4_4_;
    fVar196 = auVar212._8_4_;
    fVar198 = auVar212._12_4_;
    auVar212 = vshufps_avx(auVar284,auVar284,0x55);
    register0x000012d0 = auVar212;
    _local_740 = auVar212;
    auVar228 = vshufps_avx(auVar181,auVar181,0x55);
    register0x000014d0 = auVar228;
    _local_480 = auVar228;
    fVar351 = auVar228._0_4_;
    fVar357 = auVar228._4_4_;
    fVar358 = auVar228._8_4_;
    fVar151 = auVar228._12_4_;
    fVar229 = auVar212._0_4_;
    fVar239 = auVar212._4_4_;
    fVar241 = auVar212._8_4_;
    fVar243 = auVar212._12_4_;
    _local_670 = auVar390;
    auVar37 = _local_670;
    auVar212 = vshufps_avx(auVar390,auVar390,0xff);
    register0x00001390 = auVar212;
    _local_a0 = auVar212;
    _local_680 = auVar208;
    auVar36 = _local_680;
    auVar228 = vshufps_avx(auVar208,auVar208,0xff);
    register0x00001450 = auVar228;
    _local_c0 = auVar228;
    fVar227 = auVar228._0_4_;
    fVar263 = auVar228._4_4_;
    fVar282 = auVar228._8_4_;
    fVar289 = auVar228._12_4_;
    fVar206 = auVar212._0_4_;
    fVar224 = auVar212._4_4_;
    fVar225 = auVar212._8_4_;
    local_540._0_16_ = auVar371;
    auVar228 = vshufps_avx(auVar371,auVar371,0);
    register0x00001290 = auVar228;
    _local_340 = auVar228;
    fVar244 = *(float *)*(undefined1 (*) [28])(bspline_basis0 + lVar150 + 0x484);
    fVar238 = *(float *)(bspline_basis0 + lVar150 + 0x488);
    fVar240 = *(float *)(bspline_basis0 + lVar150 + 0x48c);
    fVar242 = *(float *)(bspline_basis0 + lVar150 + 0x490);
    fVar265 = *(float *)(bspline_basis0 + lVar150 + 0x494);
    fVar274 = *(float *)(bspline_basis0 + lVar150 + 0x498);
    fVar276 = *(float *)(bspline_basis0 + lVar150 + 0x49c);
    auVar134 = *(undefined1 (*) [28])(bspline_basis0 + lVar150 + 0x484);
    fVar171 = auVar228._0_4_;
    fVar175 = auVar228._4_4_;
    fVar177 = auVar228._8_4_;
    fVar298 = auVar228._12_4_;
    auVar228 = vshufps_avx(auVar371,auVar371,0x55);
    register0x00001290 = auVar228;
    _local_620 = auVar228;
    fVar173 = auVar228._0_4_;
    fVar176 = auVar228._4_4_;
    fVar204 = auVar228._8_4_;
    fVar226 = auVar228._12_4_;
    auVar232 = vpermilps_avx(auVar309,0xff);
    register0x000015d0 = auVar232;
    _local_100 = auVar232;
    fVar383 = auVar232._0_4_;
    fVar385 = auVar232._4_4_;
    fVar387 = auVar232._8_4_;
    fVar389 = auVar232._12_4_;
    auVar232 = vshufps_avx(auVar231,auVar231,0);
    register0x00001250 = auVar232;
    _local_640 = auVar232;
    pauVar7 = (undefined1 (*) [32])(bspline_basis0 + lVar150);
    fVar292 = *(float *)*pauVar7;
    fVar294 = *(float *)(bspline_basis0 + lVar150 + 4);
    fVar295 = *(float *)(bspline_basis0 + lVar150 + 8);
    fVar296 = *(float *)(bspline_basis0 + lVar150 + 0xc);
    fVar254 = *(float *)(bspline_basis0 + lVar150 + 0x10);
    fVar199 = *(float *)(bspline_basis0 + lVar150 + 0x14);
    fVar297 = *(float *)(bspline_basis0 + lVar150 + 0x18);
    auVar135 = *(undefined1 (*) [28])*pauVar7;
    fVar179 = auVar232._0_4_;
    fVar195 = auVar232._4_4_;
    fVar197 = auVar232._8_4_;
    fVar264 = auVar232._12_4_;
    auVar302._0_4_ = fVar179 * fVar292 + fVar171 * fVar244 + fVar178 * fVar277 + fVar378 * fVar245;
    auVar302._4_4_ = fVar195 * fVar294 + fVar175 * fVar238 + fVar194 * fVar278 + fVar382 * fVar252;
    auVar302._8_4_ = fVar197 * fVar295 + fVar177 * fVar240 + fVar196 * fVar279 + fVar384 * fVar253;
    auVar302._12_4_ = fVar264 * fVar296 + fVar298 * fVar242 + fVar198 * fVar280 + fVar386 * fVar255;
    auVar302._16_4_ = fVar179 * fVar254 + fVar171 * fVar265 + fVar178 * fVar281 + fVar378 * fVar257;
    auVar302._20_4_ = fVar195 * fVar199 + fVar175 * fVar274 + fVar194 * fVar288 + fVar382 * fVar259;
    auVar302._24_4_ = fVar197 * fVar297 + fVar177 * fVar276 + fVar196 * fVar290 + fVar384 * fVar261;
    auVar302._28_4_ =
         *(float *)(bspline_basis0 + lVar150 + 0xda8) +
         *(float *)(bspline_basis0 + lVar150 + 0x924) + fVar198 + 0.0;
    auVar232 = vshufps_avx(auVar231,auVar231,0x55);
    register0x00001410 = auVar232;
    _local_600 = auVar232;
    fVar308 = auVar232._0_4_;
    fVar320 = auVar232._4_4_;
    fVar321 = auVar232._8_4_;
    fVar323 = auVar232._12_4_;
    auVar365._0_4_ = fVar308 * fVar292 + fVar173 * fVar244 + fVar229 * fVar277 + fVar351 * fVar245;
    auVar365._4_4_ = fVar320 * fVar294 + fVar176 * fVar238 + fVar239 * fVar278 + fVar357 * fVar252;
    auVar365._8_4_ = fVar321 * fVar295 + fVar204 * fVar240 + fVar241 * fVar279 + fVar358 * fVar253;
    auVar365._12_4_ = fVar323 * fVar296 + fVar226 * fVar242 + fVar243 * fVar280 + fVar151 * fVar255;
    auVar365._16_4_ = fVar308 * fVar254 + fVar173 * fVar265 + fVar229 * fVar281 + fVar351 * fVar257;
    auVar365._20_4_ = fVar320 * fVar199 + fVar176 * fVar274 + fVar239 * fVar288 + fVar357 * fVar259;
    auVar365._24_4_ = fVar321 * fVar297 + fVar204 * fVar276 + fVar241 * fVar290 + fVar358 * fVar261;
    auVar365._28_4_ = fVar243 + 0.0 + 0.0 + 0.0;
    auVar232 = vpermilps_avx(auVar268,0xff);
    register0x00001490 = auVar232;
    _local_e0 = auVar232;
    _local_2a0 = *pauVar7;
    auVar28 = _local_2a0;
    fVar291 = auVar232._0_4_;
    fVar293 = auVar232._4_4_;
    fVar349 = auVar232._8_4_;
    local_780._0_4_ = fVar291 * fVar292 + fVar383 * fVar244 + fVar206 * fVar277 + fVar227 * fVar245;
    local_780._4_4_ = fVar293 * fVar294 + fVar385 * fVar238 + fVar224 * fVar278 + fVar263 * fVar252;
    auStack_778._0_4_ =
         fVar349 * fVar295 + fVar387 * fVar240 + fVar225 * fVar279 + fVar282 * fVar253;
    auStack_778._4_4_ =
         auVar232._12_4_ * fVar296 +
         fVar389 * fVar242 + auVar212._12_4_ * fVar280 + fVar289 * fVar255;
    register0x00001210 =
         fVar291 * fVar254 + fVar383 * fVar265 + fVar206 * fVar281 + fVar227 * fVar257;
    register0x00001214 =
         fVar293 * fVar199 + fVar385 * fVar274 + fVar224 * fVar288 + fVar263 * fVar259;
    register0x00001218 =
         fVar349 * fVar297 + fVar387 * fVar276 + fVar225 * fVar290 + fVar282 * fVar261;
    register0x0000121c = 0;
    fVar292 = *(float *)(bspline_basis1 + lVar150 + 0x908);
    fVar294 = *(float *)(bspline_basis1 + lVar150 + 0x90c);
    fVar295 = *(float *)(bspline_basis1 + lVar150 + 0x910);
    fVar296 = *(float *)(bspline_basis1 + lVar150 + 0x914);
    fVar254 = *(float *)(bspline_basis1 + lVar150 + 0x918);
    fVar199 = *(float *)(bspline_basis1 + lVar150 + 0x91c);
    fVar297 = *(float *)(bspline_basis1 + lVar150 + 0x920);
    fVar322 = *(float *)(bspline_basis1 + lVar150 + 0xd8c);
    fVar256 = *(float *)(bspline_basis1 + lVar150 + 0xd90);
    fVar200 = *(float *)(bspline_basis1 + lVar150 + 0xd94);
    fVar324 = *(float *)(bspline_basis1 + lVar150 + 0xd98);
    fVar325 = *(float *)(bspline_basis1 + lVar150 + 0xd9c);
    fVar258 = *(float *)(bspline_basis1 + lVar150 + 0xda0);
    fVar201 = *(float *)(bspline_basis1 + lVar150 + 0xda4);
    fVar326 = *(float *)(bspline_basis1 + lVar150 + 0x484);
    fVar327 = *(float *)(bspline_basis1 + lVar150 + 0x488);
    fVar260 = *(float *)(bspline_basis1 + lVar150 + 0x48c);
    fVar202 = *(float *)(bspline_basis1 + lVar150 + 0x490);
    fVar347 = *(float *)(bspline_basis1 + lVar150 + 0x494);
    fVar350 = *(float *)(bspline_basis1 + lVar150 + 0x498);
    fVar262 = *(float *)(bspline_basis1 + lVar150 + 0x49c);
    auVar359._0_4_ = fVar289 + 0.0 + 0.0;
    fVar203 = *(float *)(bspline_basis1 + lVar150);
    fVar306 = *(float *)(bspline_basis1 + lVar150 + 4);
    fVar336 = *(float *)(bspline_basis1 + lVar150 + 8);
    fVar169 = *(float *)(bspline_basis1 + lVar150 + 0xc);
    fVar170 = *(float *)(bspline_basis1 + lVar150 + 0x10);
    fVar172 = *(float *)(bspline_basis1 + lVar150 + 0x14);
    fVar174 = *(float *)(bspline_basis1 + lVar150 + 0x18);
    local_4e0._0_4_ = fVar179 * fVar203 + fVar171 * fVar326 + fVar292 * fVar178 + fVar378 * fVar322;
    local_4e0._4_4_ = fVar195 * fVar306 + fVar175 * fVar327 + fVar294 * fVar194 + fVar382 * fVar256;
    fStack_4d8 = fVar197 * fVar336 + fVar177 * fVar260 + fVar295 * fVar196 + fVar384 * fVar200;
    fStack_4d4 = fVar264 * fVar169 + fVar298 * fVar202 + fVar296 * fVar198 + fVar386 * fVar324;
    fStack_4d0 = fVar179 * fVar170 + fVar171 * fVar347 + fVar254 * fVar178 + fVar378 * fVar325;
    fStack_4cc = fVar195 * fVar172 + fVar175 * fVar350 + fVar199 * fVar194 + fVar382 * fVar258;
    fStack_4c8 = fVar197 * fVar174 + fVar177 * fVar262 + fVar297 * fVar196 + fVar384 * fVar201;
    register0x0000139c = fVar389 + fVar386 + 0.0;
    local_4a0._0_4_ = fVar308 * fVar203 + fVar326 * fVar173 + fVar292 * fVar229 + fVar351 * fVar322;
    local_4a0._4_4_ = fVar320 * fVar306 + fVar327 * fVar176 + fVar294 * fVar239 + fVar357 * fVar256;
    fStack_498 = fVar321 * fVar336 + fVar260 * fVar204 + fVar295 * fVar241 + fVar358 * fVar200;
    fStack_494 = fVar323 * fVar169 + fVar202 * fVar226 + fVar296 * fVar243 + fVar151 * fVar324;
    fStack_490 = fVar308 * fVar170 + fVar347 * fVar173 + fVar254 * fVar229 + fVar351 * fVar325;
    fStack_48c = fVar320 * fVar172 + fVar350 * fVar176 + fVar199 * fVar239 + fVar357 * fVar258;
    fStack_488 = fVar321 * fVar174 + fVar262 * fVar204 + fVar297 * fVar241 + fVar358 * fVar201;
    fStack_484 = fVar386 + 0.0 + 0.0;
    local_400._0_4_ = fVar291 * fVar203 + fVar383 * fVar326 + fVar292 * fVar206 + fVar227 * fVar322;
    local_400._4_4_ = fVar293 * fVar306 + fVar385 * fVar327 + fVar294 * fVar224 + fVar263 * fVar256;
    local_400._8_4_ = fVar349 * fVar336 + fVar387 * fVar260 + fVar295 * fVar225 + fVar282 * fVar200;
    local_400._12_4_ =
         auVar232._12_4_ * fVar169 +
         fVar389 * fVar202 + fVar296 * auVar212._12_4_ + fVar289 * fVar324;
    local_400._16_4_ = fVar291 * fVar170 + fVar383 * fVar347 + fVar254 * fVar206 + fVar227 * fVar325
    ;
    local_400._20_4_ = fVar293 * fVar172 + fVar385 * fVar350 + fVar199 * fVar224 + fVar263 * fVar258
    ;
    local_400._24_4_ = fVar349 * fVar174 + fVar387 * fVar262 + fVar297 * fVar225 + fVar282 * fVar201
    ;
    local_400._28_4_ = auVar359._0_4_ + 0.0;
    auVar25 = vsubps_avx(_local_4e0,auVar302);
    auVar26 = vsubps_avx(_local_4a0,auVar365);
    _auStack_390 = auVar26._16_16_;
    fVar245 = auVar25._0_4_;
    fVar253 = auVar25._4_4_;
    auVar45._4_4_ = auVar365._4_4_ * fVar253;
    auVar45._0_4_ = auVar365._0_4_ * fVar245;
    fVar257 = auVar25._8_4_;
    auVar45._8_4_ = auVar365._8_4_ * fVar257;
    fVar261 = auVar25._12_4_;
    auVar45._12_4_ = auVar365._12_4_ * fVar261;
    fVar238 = auVar25._16_4_;
    auVar45._16_4_ = auVar365._16_4_ * fVar238;
    fVar242 = auVar25._20_4_;
    auVar45._20_4_ = auVar365._20_4_ * fVar242;
    fVar274 = auVar25._24_4_;
    auVar45._24_4_ = auVar365._24_4_ * fVar274;
    auVar45._28_4_ = 0;
    fVar252 = auVar26._0_4_;
    fVar255 = auVar26._4_4_;
    auVar46._4_4_ = auVar302._4_4_ * fVar255;
    auVar46._0_4_ = auVar302._0_4_ * fVar252;
    fVar259 = auVar26._8_4_;
    auVar46._8_4_ = auVar302._8_4_ * fVar259;
    fVar244 = auVar26._12_4_;
    auVar46._12_4_ = auVar302._12_4_ * fVar244;
    fVar240 = auVar26._16_4_;
    auVar46._16_4_ = auVar302._16_4_ * fVar240;
    fVar265 = auVar26._20_4_;
    auVar46._20_4_ = auVar302._20_4_ * fVar265;
    fVar276 = auVar26._24_4_;
    auVar46._24_4_ = auVar302._24_4_ * fVar276;
    auVar46._28_4_ = auVar359._0_4_;
    auVar24 = vsubps_avx(auVar45,auVar46);
    auVar216 = vmaxps_avx(_local_780,local_400);
    auVar47._4_4_ = auVar216._4_4_ * auVar216._4_4_ * (fVar253 * fVar253 + fVar255 * fVar255);
    auVar47._0_4_ = auVar216._0_4_ * auVar216._0_4_ * (fVar245 * fVar245 + fVar252 * fVar252);
    auVar47._8_4_ = auVar216._8_4_ * auVar216._8_4_ * (fVar257 * fVar257 + fVar259 * fVar259);
    auVar47._12_4_ = auVar216._12_4_ * auVar216._12_4_ * (fVar261 * fVar261 + fVar244 * fVar244);
    auVar47._16_4_ = auVar216._16_4_ * auVar216._16_4_ * (fVar238 * fVar238 + fVar240 * fVar240);
    auVar47._20_4_ = auVar216._20_4_ * auVar216._20_4_ * (fVar242 * fVar242 + fVar265 * fVar265);
    auVar47._24_4_ = auVar216._24_4_ * auVar216._24_4_ * (fVar274 * fVar274 + fVar276 * fVar276);
    auVar47._28_4_ = register0x0000139c + auVar359._0_4_;
    auVar48._4_4_ = auVar24._4_4_ * auVar24._4_4_;
    auVar48._0_4_ = auVar24._0_4_ * auVar24._0_4_;
    auVar48._8_4_ = auVar24._8_4_ * auVar24._8_4_;
    auVar48._12_4_ = auVar24._12_4_ * auVar24._12_4_;
    auVar48._16_4_ = auVar24._16_4_ * auVar24._16_4_;
    auVar48._20_4_ = auVar24._20_4_ * auVar24._20_4_;
    auVar48._24_4_ = auVar24._24_4_ * auVar24._24_4_;
    auVar48._28_4_ = auVar24._28_4_;
    auVar216 = vcmpps_avx(auVar48,auVar47,2);
    auVar359._0_4_ = (float)(int)uVar146;
    auVar359._4_12_ = auVar228._4_12_;
    auVar212 = vshufps_avx(auVar359,auVar359,0);
    auVar270._16_16_ = auVar212;
    auVar270._0_16_ = auVar212;
    auVar24 = vcmpps_avx(_DAT_01f7b060,auVar270,1);
    auVar212 = vpermilps_avx(auVar231,0xaa);
    auVar219._16_16_ = auVar212;
    auVar219._0_16_ = auVar212;
    auVar228 = vpermilps_avx(auVar371,0xaa);
    register0x00001590 = auVar228;
    _local_260 = auVar228;
    auVar232 = vpermilps_avx(auVar284,0xaa);
    register0x000015d0 = auVar232;
    _local_280 = auVar232;
    auVar32 = vpermilps_avx(auVar181,0xaa);
    register0x00001390 = auVar32;
    _local_520 = auVar32;
    auVar27 = auVar24 & auVar216;
    auVar33 = vpermilps_avx((undefined1  [16])aVar10,0xff);
    _local_760 = ZEXT1632(auVar33);
    auVar269 = ZEXT416((uint)(auVar269._0_4_ * 4.7683716e-07));
    ray = local_7a0;
    fVar245 = fVar178;
    fVar252 = fVar194;
    fVar253 = fVar196;
    fVar255 = fVar198;
    fVar257 = fVar351;
    fVar259 = fVar357;
    fVar261 = fVar358;
    fVar244 = fVar151;
    fVar238 = fVar179;
    fVar240 = fVar195;
    fVar242 = fVar197;
    fVar265 = fVar229;
    fVar274 = fVar239;
    fVar276 = fVar241;
    _local_760 = auVar33;
    if ((((((((auVar27 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar27 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar27 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar27 >> 0x7f,0) == '\0') &&
          (auVar27 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar27 >> 0xbf,0) == '\0') &&
        (auVar27 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar27[0x1f]) {
      auVar318 = ZEXT3264(local_6c0);
      auVar335 = ZEXT3264(local_660);
      auVar305 = ZEXT3264(_local_620);
      auVar273 = ZEXT3264(_local_600);
    }
    else {
      local_540._0_16_ = auVar359;
      local_5a0._0_16_ = auVar269;
      _local_2c0 = vandps_avx(auVar216,auVar24);
      fVar206 = auVar212._0_4_;
      fVar224 = auVar212._4_4_;
      fVar225 = auVar212._8_4_;
      fVar227 = auVar212._12_4_;
      fVar349 = auVar228._0_4_;
      fVar383 = auVar228._4_4_;
      fVar385 = auVar228._8_4_;
      fVar387 = auVar228._12_4_;
      fVar389 = auVar232._0_4_;
      fVar394 = auVar232._4_4_;
      fVar395 = auVar232._8_4_;
      fVar396 = auVar232._12_4_;
      fVar282 = auVar32._0_4_;
      fVar289 = auVar32._4_4_;
      fVar291 = auVar32._8_4_;
      fVar293 = auVar32._12_4_;
      fVar263 = auVar216._28_4_ + auVar24._28_4_ + fVar293;
      local_3e0 = fVar206 * fVar203 + fVar349 * fVar326 + fVar389 * fVar292 + fVar282 * fVar322;
      fStack_3dc = fVar224 * fVar306 + fVar383 * fVar327 + fVar394 * fVar294 + fVar289 * fVar256;
      fStack_3d8 = fVar225 * fVar336 + fVar385 * fVar260 + fVar395 * fVar295 + fVar291 * fVar200;
      fStack_3d4 = fVar227 * fVar169 + fVar387 * fVar202 + fVar396 * fVar296 + fVar293 * fVar324;
      fStack_3d0 = fVar206 * fVar170 + fVar349 * fVar347 + fVar389 * fVar254 + fVar282 * fVar325;
      fStack_3cc = fVar224 * fVar172 + fVar383 * fVar350 + fVar394 * fVar199 + fVar289 * fVar258;
      fStack_3c8 = fVar225 * fVar174 + fVar385 * fVar262 + fVar395 * fVar297 + fVar291 * fVar201;
      fStack_3c4 = *(float *)(bspline_basis1 + lVar150 + 0x1c) + fVar263;
      local_2a0._0_4_ = auVar135._0_4_;
      local_2a0._4_4_ = auVar135._4_4_;
      fStack_298 = auVar135._8_4_;
      fStack_294 = auVar135._12_4_;
      fStack_290 = auVar135._16_4_;
      fStack_28c = auVar135._20_4_;
      fStack_288 = auVar135._24_4_;
      local_3c0._0_4_ = auVar134._0_4_;
      local_3c0._4_4_ = auVar134._4_4_;
      fStack_3b8 = auVar134._8_4_;
      fStack_3b4 = auVar134._12_4_;
      fStack_3b0 = auVar134._16_4_;
      fStack_3ac = auVar134._20_4_;
      fStack_3a8 = auVar134._24_4_;
      local_580._0_4_ = auVar133._0_4_;
      local_580._4_4_ = auVar133._4_4_;
      fStack_578 = auVar133._8_4_;
      fStack_574 = auVar133._12_4_;
      fStack_570 = auVar133._16_4_;
      fStack_56c = auVar133._20_4_;
      fStack_568 = auVar133._24_4_;
      local_4c0 = fVar206 * (float)local_2a0._0_4_ +
                  fVar349 * (float)local_3c0._0_4_ +
                  fVar389 * fVar277 + fVar282 * (float)local_580._0_4_;
      fStack_4bc = fVar224 * (float)local_2a0._4_4_ +
                   fVar383 * (float)local_3c0._4_4_ +
                   fVar394 * fVar278 + fVar289 * (float)local_580._4_4_;
      fStack_4b8 = fVar225 * fStack_298 +
                   fVar385 * fStack_3b8 + fVar395 * fVar279 + fVar291 * fStack_578;
      fStack_4b4 = fVar227 * fStack_294 +
                   fVar387 * fStack_3b4 + fVar396 * fVar280 + fVar293 * fStack_574;
      fStack_4b0 = fVar206 * fStack_290 +
                   fVar349 * fStack_3b0 + fVar389 * fVar281 + fVar282 * fStack_570;
      fStack_4ac = fVar224 * fStack_28c +
                   fVar383 * fStack_3ac + fVar394 * fVar288 + fVar289 * fStack_56c;
      fStack_4a8 = fVar225 * fStack_288 +
                   fVar385 * fStack_3a8 + fVar395 * fVar290 + fVar291 * fStack_568;
      fStack_4a4 = fVar264 + fStack_3c4 + *(float *)(bspline_basis1 + lVar150 + 0x1c) + fVar263;
      fVar277 = *(float *)(bspline_basis0 + lVar150 + 0x1210);
      fVar278 = *(float *)(bspline_basis0 + lVar150 + 0x1214);
      fVar279 = *(float *)(bspline_basis0 + lVar150 + 0x1218);
      fVar280 = *(float *)(bspline_basis0 + lVar150 + 0x121c);
      fVar281 = *(float *)(bspline_basis0 + lVar150 + 0x1220);
      fVar288 = *(float *)(bspline_basis0 + lVar150 + 0x1224);
      fVar290 = *(float *)(bspline_basis0 + lVar150 + 0x1228);
      fVar292 = *(float *)(bspline_basis0 + lVar150 + 0x1694);
      fVar294 = *(float *)(bspline_basis0 + lVar150 + 0x1698);
      fVar295 = *(float *)(bspline_basis0 + lVar150 + 0x169c);
      fVar296 = *(float *)(bspline_basis0 + lVar150 + 0x16a0);
      fVar254 = *(float *)(bspline_basis0 + lVar150 + 0x16a4);
      fVar199 = *(float *)(bspline_basis0 + lVar150 + 0x16a8);
      fVar297 = *(float *)(bspline_basis0 + lVar150 + 0x16ac);
      fVar322 = *(float *)(bspline_basis0 + lVar150 + 0x1b18);
      fVar256 = *(float *)(bspline_basis0 + lVar150 + 0x1b1c);
      fVar200 = *(float *)(bspline_basis0 + lVar150 + 0x1b20);
      fVar324 = *(float *)(bspline_basis0 + lVar150 + 0x1b24);
      fVar325 = *(float *)(bspline_basis0 + lVar150 + 0x1b28);
      fVar258 = *(float *)(bspline_basis0 + lVar150 + 0x1b2c);
      fVar201 = *(float *)(bspline_basis0 + lVar150 + 0x1b30);
      fVar326 = *(float *)(bspline_basis0 + lVar150 + 0x1f9c);
      fVar327 = *(float *)(bspline_basis0 + lVar150 + 0x1fa0);
      fVar260 = *(float *)(bspline_basis0 + lVar150 + 0x1fa4);
      fVar202 = *(float *)(bspline_basis0 + lVar150 + 0x1fa8);
      fVar347 = *(float *)(bspline_basis0 + lVar150 + 0x1fac);
      fVar350 = *(float *)(bspline_basis0 + lVar150 + 0x1fb0);
      fVar262 = *(float *)(bspline_basis0 + lVar150 + 0x1fb4);
      fVar306 = *(float *)(bspline_basis1 + lVar150 + 0x4a0) + auVar302._28_4_;
      fVar203 = *(float *)(bspline_basis0 + lVar150 + 0x1b34) +
                *(float *)(bspline_basis0 + lVar150 + 0x1fb8);
      fVar336 = *(float *)(bspline_basis0 + lVar150 + 0x16b0) + fVar203;
      local_3c0._4_4_ =
           fVar195 * fVar278 + fVar175 * fVar294 + fVar194 * fVar256 + fVar382 * fVar327;
      local_3c0._0_4_ =
           fVar179 * fVar277 + fVar171 * fVar292 + fVar178 * fVar322 + fVar378 * fVar326;
      fStack_3b8 = fVar197 * fVar279 + fVar177 * fVar295 + fVar196 * fVar200 + fVar384 * fVar260;
      fStack_3b4 = fVar264 * fVar280 + fVar298 * fVar296 + fVar198 * fVar324 + fVar386 * fVar202;
      fStack_3b0 = fVar179 * fVar281 + fVar171 * fVar254 + fVar178 * fVar325 + fVar378 * fVar347;
      fStack_3ac = fVar195 * fVar288 + fVar175 * fVar199 + fVar194 * fVar258 + fVar382 * fVar350;
      fStack_3a8 = fVar197 * fVar290 + fVar177 * fVar297 + fVar196 * fVar201 + fVar384 * fVar262;
      fStack_3a4 = *(float *)(bspline_basis0 + lVar150 + 0x16b0) +
                   *(float *)(bspline_basis0 + lVar150 + 0x1fb8) + fVar306;
      auVar185._0_4_ = fVar308 * fVar277 + fVar173 * fVar292 + fVar229 * fVar322 + fVar351 * fVar326
      ;
      auVar185._4_4_ = fVar320 * fVar278 + fVar176 * fVar294 + fVar239 * fVar256 + fVar357 * fVar327
      ;
      auVar185._8_4_ = fVar321 * fVar279 + fVar204 * fVar295 + fVar241 * fVar200 + fVar358 * fVar260
      ;
      auVar185._12_4_ =
           fVar323 * fVar280 + fVar226 * fVar296 + fVar243 * fVar324 + fVar151 * fVar202;
      auVar185._16_4_ =
           fVar308 * fVar281 + fVar173 * fVar254 + fVar229 * fVar325 + fVar351 * fVar347;
      auVar185._20_4_ =
           fVar320 * fVar288 + fVar176 * fVar199 + fVar239 * fVar258 + fVar357 * fVar350;
      auVar185._24_4_ =
           fVar321 * fVar290 + fVar204 * fVar297 + fVar241 * fVar201 + fVar358 * fVar262;
      auVar185._28_4_ = fVar203 + fVar306 + *(float *)(bspline_basis1 + lVar150 + 0x4a0) + fVar293;
      auVar235._0_4_ = fVar349 * fVar292 + fVar389 * fVar322 + fVar282 * fVar326 + fVar206 * fVar277
      ;
      auVar235._4_4_ = fVar383 * fVar294 + fVar394 * fVar256 + fVar289 * fVar327 + fVar224 * fVar278
      ;
      auVar235._8_4_ = fVar385 * fVar295 + fVar395 * fVar200 + fVar291 * fVar260 + fVar225 * fVar279
      ;
      auVar235._12_4_ =
           fVar387 * fVar296 + fVar396 * fVar324 + fVar293 * fVar202 + fVar227 * fVar280;
      auVar235._16_4_ =
           fVar349 * fVar254 + fVar389 * fVar325 + fVar282 * fVar347 + fVar206 * fVar281;
      auVar235._20_4_ =
           fVar383 * fVar199 + fVar394 * fVar258 + fVar289 * fVar350 + fVar224 * fVar288;
      auVar235._24_4_ =
           fVar385 * fVar297 + fVar395 * fVar201 + fVar291 * fVar262 + fVar225 * fVar290;
      auVar235._28_4_ = fVar336 + *(float *)(bspline_basis0 + lVar150 + 0x122c);
      fVar277 = *(float *)(bspline_basis1 + lVar150 + 0x1b18);
      fVar278 = *(float *)(bspline_basis1 + lVar150 + 0x1b1c);
      fVar279 = *(float *)(bspline_basis1 + lVar150 + 0x1b20);
      fVar280 = *(float *)(bspline_basis1 + lVar150 + 0x1b24);
      fVar281 = *(float *)(bspline_basis1 + lVar150 + 0x1b28);
      fVar288 = *(float *)(bspline_basis1 + lVar150 + 0x1b2c);
      fVar290 = *(float *)(bspline_basis1 + lVar150 + 0x1b30);
      fVar292 = *(float *)(bspline_basis1 + lVar150 + 0x1f9c);
      fVar294 = *(float *)(bspline_basis1 + lVar150 + 0x1fa0);
      fVar295 = *(float *)(bspline_basis1 + lVar150 + 0x1fa4);
      fVar296 = *(float *)(bspline_basis1 + lVar150 + 0x1fa8);
      fVar254 = *(float *)(bspline_basis1 + lVar150 + 0x1fac);
      fVar199 = *(float *)(bspline_basis1 + lVar150 + 0x1fb0);
      fVar297 = *(float *)(bspline_basis1 + lVar150 + 0x1fb4);
      fVar322 = *(float *)(bspline_basis1 + lVar150 + 0x1694);
      fVar256 = *(float *)(bspline_basis1 + lVar150 + 0x1698);
      fVar200 = *(float *)(bspline_basis1 + lVar150 + 0x169c);
      fVar324 = *(float *)(bspline_basis1 + lVar150 + 0x16a0);
      fVar325 = *(float *)(bspline_basis1 + lVar150 + 0x16a4);
      fVar258 = *(float *)(bspline_basis1 + lVar150 + 0x16a8);
      fVar201 = *(float *)(bspline_basis1 + lVar150 + 0x16ac);
      fVar326 = *(float *)(bspline_basis1 + lVar150 + 0x1210);
      fVar327 = *(float *)(bspline_basis1 + lVar150 + 0x1214);
      fVar260 = *(float *)(bspline_basis1 + lVar150 + 0x1218);
      fVar202 = *(float *)(bspline_basis1 + lVar150 + 0x121c);
      fVar347 = *(float *)(bspline_basis1 + lVar150 + 0x1220);
      fVar350 = *(float *)(bspline_basis1 + lVar150 + 0x1224);
      fVar262 = *(float *)(bspline_basis1 + lVar150 + 0x1228);
      auVar314._0_4_ = fVar179 * fVar326 + fVar322 * fVar171 + fVar178 * fVar277 + fVar378 * fVar292
      ;
      auVar314._4_4_ = fVar195 * fVar327 + fVar256 * fVar175 + fVar194 * fVar278 + fVar382 * fVar294
      ;
      auVar314._8_4_ = fVar197 * fVar260 + fVar200 * fVar177 + fVar196 * fVar279 + fVar384 * fVar295
      ;
      auVar314._12_4_ =
           fVar264 * fVar202 + fVar324 * fVar298 + fVar198 * fVar280 + fVar386 * fVar296;
      auVar314._16_4_ =
           fVar179 * fVar347 + fVar325 * fVar171 + fVar178 * fVar281 + fVar378 * fVar254;
      auVar314._20_4_ =
           fVar195 * fVar350 + fVar258 * fVar175 + fVar194 * fVar288 + fVar382 * fVar199;
      auVar314._24_4_ =
           fVar197 * fVar262 + fVar201 * fVar177 + fVar196 * fVar290 + fVar384 * fVar297;
      auVar314._28_4_ = fVar386 + fVar386 + fVar336 + fVar386;
      auVar332._0_4_ = fVar308 * fVar326 + fVar173 * fVar322 + fVar229 * fVar277 + fVar351 * fVar292
      ;
      auVar332._4_4_ = fVar320 * fVar327 + fVar176 * fVar256 + fVar239 * fVar278 + fVar357 * fVar294
      ;
      auVar332._8_4_ = fVar321 * fVar260 + fVar204 * fVar200 + fVar241 * fVar279 + fVar358 * fVar295
      ;
      auVar332._12_4_ =
           fVar323 * fVar202 + fVar226 * fVar324 + fVar243 * fVar280 + fVar151 * fVar296;
      auVar332._16_4_ =
           fVar308 * fVar347 + fVar173 * fVar325 + fVar229 * fVar281 + fVar351 * fVar254;
      auVar332._20_4_ =
           fVar320 * fVar350 + fVar176 * fVar258 + fVar239 * fVar288 + fVar357 * fVar199;
      auVar332._24_4_ =
           fVar321 * fVar262 + fVar204 * fVar201 + fVar241 * fVar290 + fVar358 * fVar297;
      auVar332._28_4_ = fVar386 + fVar386 + fVar386 + fVar336;
      _local_500 = auVar219;
      auVar249._0_4_ = fVar206 * fVar326 + fVar349 * fVar322 + fVar389 * fVar277 + fVar282 * fVar292
      ;
      auVar249._4_4_ = fVar224 * fVar327 + fVar383 * fVar256 + fVar394 * fVar278 + fVar289 * fVar294
      ;
      auVar249._8_4_ = fVar225 * fVar260 + fVar385 * fVar200 + fVar395 * fVar279 + fVar291 * fVar295
      ;
      auVar249._12_4_ =
           fVar227 * fVar202 + fVar387 * fVar324 + fVar396 * fVar280 + fVar293 * fVar296;
      auVar249._16_4_ =
           fVar206 * fVar347 + fVar349 * fVar325 + fVar389 * fVar281 + fVar282 * fVar254;
      auVar249._20_4_ =
           fVar224 * fVar350 + fVar383 * fVar258 + fVar394 * fVar288 + fVar289 * fVar199;
      auVar249._24_4_ =
           fVar225 * fVar262 + fVar385 * fVar201 + fVar395 * fVar290 + fVar291 * fVar297;
      auVar249._28_4_ =
           *(float *)(bspline_basis1 + lVar150 + 0x122c) +
           *(float *)(bspline_basis1 + lVar150 + 0x16b0) +
           *(float *)(bspline_basis1 + lVar150 + 0x1b34) +
           *(float *)(bspline_basis1 + lVar150 + 0x1fb8);
      auVar220._8_4_ = 0x7fffffff;
      auVar220._0_8_ = 0x7fffffff7fffffff;
      auVar220._12_4_ = 0x7fffffff;
      auVar220._16_4_ = 0x7fffffff;
      auVar220._20_4_ = 0x7fffffff;
      auVar220._24_4_ = 0x7fffffff;
      auVar220._28_4_ = 0x7fffffff;
      auVar216 = vandps_avx(_local_3c0,auVar220);
      auVar24 = vandps_avx(auVar185,auVar220);
      auVar24 = vmaxps_avx(auVar216,auVar24);
      auVar216 = vandps_avx(auVar235,auVar220);
      auVar216 = vmaxps_avx(auVar24,auVar216);
      auVar269 = vpermilps_avx(auVar269,0);
      auVar303._16_16_ = auVar269;
      auVar303._0_16_ = auVar269;
      auVar216 = vcmpps_avx(auVar216,auVar303,1);
      auVar27 = vblendvps_avx(_local_3c0,auVar25,auVar216);
      auVar29 = vblendvps_avx(auVar185,auVar26,auVar216);
      auVar216 = vandps_avx(auVar314,auVar220);
      auVar24 = vandps_avx(auVar332,auVar220);
      auVar30 = vmaxps_avx(auVar216,auVar24);
      auVar216 = vandps_avx(auVar249,auVar220);
      auVar216 = vmaxps_avx(auVar30,auVar216);
      auVar30 = vcmpps_avx(auVar216,auVar303,1);
      auVar216 = vblendvps_avx(auVar314,auVar25,auVar30);
      auVar25 = vblendvps_avx(auVar332,auVar26,auVar30);
      fVar336 = auVar27._0_4_;
      fVar169 = auVar27._4_4_;
      fVar170 = auVar27._8_4_;
      fVar172 = auVar27._12_4_;
      fVar174 = auVar27._16_4_;
      fVar171 = auVar27._20_4_;
      fVar173 = auVar27._24_4_;
      fVar175 = auVar216._0_4_;
      fVar176 = auVar216._4_4_;
      fVar177 = auVar216._8_4_;
      fVar204 = auVar216._12_4_;
      fVar298 = auVar216._16_4_;
      fVar226 = auVar216._20_4_;
      fVar206 = auVar216._24_4_;
      fVar277 = auVar29._0_4_;
      fVar281 = auVar29._4_4_;
      fVar294 = auVar29._8_4_;
      fVar199 = auVar29._12_4_;
      fVar200 = auVar29._16_4_;
      fVar201 = auVar29._20_4_;
      fVar202 = auVar29._24_4_;
      auVar156._0_4_ = fVar277 * fVar277 + fVar336 * fVar336;
      auVar156._4_4_ = fVar281 * fVar281 + fVar169 * fVar169;
      auVar156._8_4_ = fVar294 * fVar294 + fVar170 * fVar170;
      auVar156._12_4_ = fVar199 * fVar199 + fVar172 * fVar172;
      auVar156._16_4_ = fVar200 * fVar200 + fVar174 * fVar174;
      auVar156._20_4_ = fVar201 * fVar201 + fVar171 * fVar171;
      auVar156._24_4_ = fVar202 * fVar202 + fVar173 * fVar173;
      auVar156._28_4_ = auVar332._28_4_ + auVar27._28_4_;
      auVar26 = vrsqrtps_avx(auVar156);
      fVar278 = auVar26._0_4_;
      fVar279 = auVar26._4_4_;
      auVar49._4_4_ = fVar279 * 1.5;
      auVar49._0_4_ = fVar278 * 1.5;
      fVar280 = auVar26._8_4_;
      auVar49._8_4_ = fVar280 * 1.5;
      fVar288 = auVar26._12_4_;
      auVar49._12_4_ = fVar288 * 1.5;
      fVar290 = auVar26._16_4_;
      auVar49._16_4_ = fVar290 * 1.5;
      fVar292 = auVar26._20_4_;
      auVar49._20_4_ = fVar292 * 1.5;
      fVar295 = auVar26._24_4_;
      auVar49._24_4_ = fVar295 * 1.5;
      auVar49._28_4_ = auVar24._28_4_;
      auVar50._4_4_ = fVar279 * fVar279 * fVar279 * auVar156._4_4_ * 0.5;
      auVar50._0_4_ = fVar278 * fVar278 * fVar278 * auVar156._0_4_ * 0.5;
      auVar50._8_4_ = fVar280 * fVar280 * fVar280 * auVar156._8_4_ * 0.5;
      auVar50._12_4_ = fVar288 * fVar288 * fVar288 * auVar156._12_4_ * 0.5;
      auVar50._16_4_ = fVar290 * fVar290 * fVar290 * auVar156._16_4_ * 0.5;
      auVar50._20_4_ = fVar292 * fVar292 * fVar292 * auVar156._20_4_ * 0.5;
      auVar50._24_4_ = fVar295 * fVar295 * fVar295 * auVar156._24_4_ * 0.5;
      auVar50._28_4_ = auVar156._28_4_;
      auVar26 = vsubps_avx(auVar49,auVar50);
      fVar278 = auVar26._0_4_;
      fVar288 = auVar26._4_4_;
      fVar295 = auVar26._8_4_;
      fVar297 = auVar26._12_4_;
      fVar324 = auVar26._16_4_;
      fVar326 = auVar26._20_4_;
      fVar347 = auVar26._24_4_;
      fVar203 = auVar29._28_4_;
      fVar279 = auVar25._0_4_;
      fVar290 = auVar25._4_4_;
      fVar296 = auVar25._8_4_;
      fVar322 = auVar25._12_4_;
      fVar325 = auVar25._16_4_;
      fVar327 = auVar25._20_4_;
      fVar350 = auVar25._24_4_;
      auVar157._0_4_ = fVar279 * fVar279 + fVar175 * fVar175;
      auVar157._4_4_ = fVar290 * fVar290 + fVar176 * fVar176;
      auVar157._8_4_ = fVar296 * fVar296 + fVar177 * fVar177;
      auVar157._12_4_ = fVar322 * fVar322 + fVar204 * fVar204;
      auVar157._16_4_ = fVar325 * fVar325 + fVar298 * fVar298;
      auVar157._20_4_ = fVar327 * fVar327 + fVar226 * fVar226;
      auVar157._24_4_ = fVar350 * fVar350 + fVar206 * fVar206;
      auVar157._28_4_ = auVar216._28_4_ + auVar26._28_4_;
      auVar216 = vrsqrtps_avx(auVar157);
      fVar280 = auVar216._0_4_;
      fVar292 = auVar216._4_4_;
      auVar51._4_4_ = fVar292 * 1.5;
      auVar51._0_4_ = fVar280 * 1.5;
      fVar254 = auVar216._8_4_;
      auVar51._8_4_ = fVar254 * 1.5;
      fVar256 = auVar216._12_4_;
      auVar51._12_4_ = fVar256 * 1.5;
      fVar258 = auVar216._16_4_;
      auVar51._16_4_ = fVar258 * 1.5;
      fVar260 = auVar216._20_4_;
      auVar51._20_4_ = fVar260 * 1.5;
      fVar262 = auVar216._24_4_;
      auVar51._24_4_ = fVar262 * 1.5;
      auVar51._28_4_ = auVar24._28_4_;
      fVar306 = auVar216._28_4_;
      auVar52._4_4_ = fVar292 * fVar292 * fVar292 * auVar157._4_4_ * 0.5;
      auVar52._0_4_ = fVar280 * fVar280 * fVar280 * auVar157._0_4_ * 0.5;
      auVar52._8_4_ = fVar254 * fVar254 * fVar254 * auVar157._8_4_ * 0.5;
      auVar52._12_4_ = fVar256 * fVar256 * fVar256 * auVar157._12_4_ * 0.5;
      auVar52._16_4_ = fVar258 * fVar258 * fVar258 * auVar157._16_4_ * 0.5;
      auVar52._20_4_ = fVar260 * fVar260 * fVar260 * auVar157._20_4_ * 0.5;
      auVar52._24_4_ = fVar262 * fVar262 * fVar262 * auVar157._24_4_ * 0.5;
      auVar52._28_4_ = auVar157._28_4_;
      auVar216 = vsubps_avx(auVar51,auVar52);
      fVar280 = auVar216._0_4_;
      fVar292 = auVar216._4_4_;
      fVar254 = auVar216._8_4_;
      fVar256 = auVar216._12_4_;
      fVar258 = auVar216._16_4_;
      fVar260 = auVar216._20_4_;
      fVar262 = auVar216._24_4_;
      fVar277 = (float)local_780._0_4_ * fVar277 * fVar278;
      fVar281 = (float)local_780._4_4_ * fVar281 * fVar288;
      auVar53._4_4_ = fVar281;
      auVar53._0_4_ = fVar277;
      fVar294 = (float)auStack_778._0_4_ * fVar294 * fVar295;
      auVar53._8_4_ = fVar294;
      fVar199 = (float)auStack_778._4_4_ * fVar199 * fVar297;
      auVar53._12_4_ = fVar199;
      fVar200 = register0x00001210 * fVar200 * fVar324;
      auVar53._16_4_ = fVar200;
      fVar201 = register0x00001214 * fVar201 * fVar326;
      auVar53._20_4_ = fVar201;
      fVar202 = register0x00001218 * fVar202 * fVar347;
      auVar53._24_4_ = fVar202;
      auVar53._28_4_ = fVar203;
      local_580._4_4_ = auVar302._4_4_ + fVar281;
      local_580._0_4_ = auVar302._0_4_ + fVar277;
      fStack_578 = auVar302._8_4_ + fVar294;
      fStack_574 = auVar302._12_4_ + fVar199;
      fStack_570 = auVar302._16_4_ + fVar200;
      fStack_56c = auVar302._20_4_ + fVar201;
      fStack_568 = auVar302._24_4_ + fVar202;
      fStack_564 = auVar302._28_4_ + fVar203;
      fVar277 = (float)local_780._0_4_ * fVar278 * -fVar336;
      fVar281 = (float)local_780._4_4_ * fVar288 * -fVar169;
      auVar54._4_4_ = fVar281;
      auVar54._0_4_ = fVar277;
      fVar294 = (float)auStack_778._0_4_ * fVar295 * -fVar170;
      auVar54._8_4_ = fVar294;
      fVar199 = (float)auStack_778._4_4_ * fVar297 * -fVar172;
      auVar54._12_4_ = fVar199;
      fVar200 = register0x00001210 * fVar324 * -fVar174;
      auVar54._16_4_ = fVar200;
      fVar201 = register0x00001214 * fVar326 * -fVar171;
      auVar54._20_4_ = fVar201;
      fVar202 = register0x00001218 * fVar347 * -fVar173;
      auVar54._24_4_ = fVar202;
      auVar54._28_4_ = 0x3f000000;
      local_3a0._4_4_ = fVar281 + auVar365._4_4_;
      local_3a0._0_4_ = fVar277 + auVar365._0_4_;
      fStack_398 = fVar294 + auVar365._8_4_;
      fStack_394 = fVar199 + auVar365._12_4_;
      auStack_390._0_4_ = fVar200 + auVar365._16_4_;
      auStack_390._4_4_ = fVar201 + auVar365._20_4_;
      fStack_388 = fVar202 + auVar365._24_4_;
      fStack_384 = auVar365._28_4_ + 0.5;
      fVar277 = (float)local_780._0_4_ * fVar278 * 0.0;
      fVar278 = (float)local_780._4_4_ * fVar288 * 0.0;
      auVar55._4_4_ = fVar278;
      auVar55._0_4_ = fVar277;
      fVar281 = (float)auStack_778._0_4_ * fVar295 * 0.0;
      auVar55._8_4_ = fVar281;
      fVar288 = (float)auStack_778._4_4_ * fVar297 * 0.0;
      auVar55._12_4_ = fVar288;
      fVar294 = register0x00001210 * fVar324 * 0.0;
      auVar55._16_4_ = fVar294;
      fVar295 = register0x00001214 * fVar326 * 0.0;
      auVar55._20_4_ = fVar295;
      fVar199 = register0x00001218 * fVar347 * 0.0;
      auVar55._24_4_ = fVar199;
      auVar55._28_4_ = fVar151;
      auVar129._4_4_ = fStack_4bc;
      auVar129._0_4_ = local_4c0;
      auVar129._8_4_ = fStack_4b8;
      auVar129._12_4_ = fStack_4b4;
      auVar129._16_4_ = fStack_4b0;
      auVar129._20_4_ = fStack_4ac;
      auVar129._24_4_ = fStack_4a8;
      auVar129._28_4_ = fStack_4a4;
      auVar315._0_4_ = fVar277 + local_4c0;
      auVar315._4_4_ = fVar278 + fStack_4bc;
      auVar315._8_4_ = fVar281 + fStack_4b8;
      auVar315._12_4_ = fVar288 + fStack_4b4;
      auVar315._16_4_ = fVar294 + fStack_4b0;
      auVar315._20_4_ = fVar295 + fStack_4ac;
      auVar315._24_4_ = fVar199 + fStack_4a8;
      auVar315._28_4_ = fVar151 + fStack_4a4;
      fVar277 = local_400._0_4_ * fVar279 * fVar280;
      fVar278 = local_400._4_4_ * fVar290 * fVar292;
      auVar56._4_4_ = fVar278;
      auVar56._0_4_ = fVar277;
      fVar279 = local_400._8_4_ * fVar296 * fVar254;
      auVar56._8_4_ = fVar279;
      fVar281 = local_400._12_4_ * fVar322 * fVar256;
      auVar56._12_4_ = fVar281;
      fVar288 = local_400._16_4_ * fVar325 * fVar258;
      auVar56._16_4_ = fVar288;
      fVar290 = local_400._20_4_ * fVar327 * fVar260;
      auVar56._20_4_ = fVar290;
      fVar294 = local_400._24_4_ * fVar350 * fVar262;
      auVar56._24_4_ = fVar294;
      auVar56._28_4_ = auVar25._28_4_;
      auVar27 = vsubps_avx(auVar302,auVar53);
      auVar344._0_4_ = (float)local_4e0._0_4_ + fVar277;
      auVar344._4_4_ = (float)local_4e0._4_4_ + fVar278;
      auVar344._8_4_ = fStack_4d8 + fVar279;
      auVar344._12_4_ = fStack_4d4 + fVar281;
      auVar344._16_4_ = fStack_4d0 + fVar288;
      auVar344._20_4_ = fStack_4cc + fVar290;
      auVar344._24_4_ = fStack_4c8 + fVar294;
      auVar344._28_4_ = register0x0000139c + auVar25._28_4_;
      fVar277 = local_400._0_4_ * -fVar175 * fVar280;
      fVar278 = local_400._4_4_ * -fVar176 * fVar292;
      auVar57._4_4_ = fVar278;
      auVar57._0_4_ = fVar277;
      fVar279 = local_400._8_4_ * -fVar177 * fVar254;
      auVar57._8_4_ = fVar279;
      fVar281 = local_400._12_4_ * -fVar204 * fVar256;
      auVar57._12_4_ = fVar281;
      fVar288 = local_400._16_4_ * -fVar298 * fVar258;
      auVar57._16_4_ = fVar288;
      fVar290 = local_400._20_4_ * -fVar226 * fVar260;
      auVar57._20_4_ = fVar290;
      fVar294 = local_400._24_4_ * -fVar206 * fVar262;
      auVar57._24_4_ = fVar294;
      auVar57._28_4_ = fVar203;
      auVar23 = vsubps_avx(auVar365,auVar54);
      auVar380._0_4_ = (float)local_4a0._0_4_ + fVar277;
      auVar380._4_4_ = (float)local_4a0._4_4_ + fVar278;
      auVar380._8_4_ = fStack_498 + fVar279;
      auVar380._12_4_ = fStack_494 + fVar281;
      auVar380._16_4_ = fStack_490 + fVar288;
      auVar380._20_4_ = fStack_48c + fVar290;
      auVar380._24_4_ = fStack_488 + fVar294;
      auVar380._28_4_ = fStack_484 + fVar203;
      fVar277 = fVar280 * 0.0 * local_400._0_4_;
      fVar278 = fVar292 * 0.0 * local_400._4_4_;
      auVar58._4_4_ = fVar278;
      auVar58._0_4_ = fVar277;
      fVar279 = fVar254 * 0.0 * local_400._8_4_;
      auVar58._8_4_ = fVar279;
      fVar280 = fVar256 * 0.0 * local_400._12_4_;
      auVar58._12_4_ = fVar280;
      fVar281 = fVar258 * 0.0 * local_400._16_4_;
      auVar58._16_4_ = fVar281;
      fVar288 = fVar260 * 0.0 * local_400._20_4_;
      auVar58._20_4_ = fVar288;
      fVar290 = fVar262 * 0.0 * local_400._24_4_;
      auVar58._24_4_ = fVar290;
      auVar58._28_4_ = fVar306;
      auVar30 = vsubps_avx(auVar129,auVar55);
      auVar131._4_4_ = fStack_3dc;
      auVar131._0_4_ = local_3e0;
      auVar131._8_4_ = fStack_3d8;
      auVar131._12_4_ = fStack_3d4;
      auVar131._16_4_ = fStack_3d0;
      auVar131._20_4_ = fStack_3cc;
      auVar131._24_4_ = fStack_3c8;
      auVar131._28_4_ = fStack_3c4;
      auVar391._0_4_ = local_3e0 + fVar277;
      auVar391._4_4_ = fStack_3dc + fVar278;
      auVar391._8_4_ = fStack_3d8 + fVar279;
      auVar391._12_4_ = fStack_3d4 + fVar280;
      auVar391._16_4_ = fStack_3d0 + fVar281;
      auVar391._20_4_ = fStack_3cc + fVar288;
      auVar391._24_4_ = fStack_3c8 + fVar290;
      auVar391._28_4_ = fStack_3c4 + fVar306;
      auVar216 = vsubps_avx(_local_4e0,auVar56);
      auVar24 = vsubps_avx(_local_4a0,auVar57);
      auVar25 = vsubps_avx(auVar131,auVar58);
      auVar26 = vsubps_avx(auVar380,auVar23);
      auVar29 = vsubps_avx(auVar391,auVar30);
      auVar59._4_4_ = auVar30._4_4_ * auVar26._4_4_;
      auVar59._0_4_ = auVar30._0_4_ * auVar26._0_4_;
      auVar59._8_4_ = auVar30._8_4_ * auVar26._8_4_;
      auVar59._12_4_ = auVar30._12_4_ * auVar26._12_4_;
      auVar59._16_4_ = auVar30._16_4_ * auVar26._16_4_;
      auVar59._20_4_ = auVar30._20_4_ * auVar26._20_4_;
      auVar59._24_4_ = auVar30._24_4_ * auVar26._24_4_;
      auVar59._28_4_ = fVar306;
      auVar60._4_4_ = auVar23._4_4_ * auVar29._4_4_;
      auVar60._0_4_ = auVar23._0_4_ * auVar29._0_4_;
      auVar60._8_4_ = auVar23._8_4_ * auVar29._8_4_;
      auVar60._12_4_ = auVar23._12_4_ * auVar29._12_4_;
      auVar60._16_4_ = auVar23._16_4_ * auVar29._16_4_;
      auVar60._20_4_ = auVar23._20_4_ * auVar29._20_4_;
      auVar60._24_4_ = auVar23._24_4_ * auVar29._24_4_;
      auVar60._28_4_ = fStack_484;
      auVar31 = vsubps_avx(auVar60,auVar59);
      auVar61._4_4_ = auVar27._4_4_ * auVar29._4_4_;
      auVar61._0_4_ = auVar27._0_4_ * auVar29._0_4_;
      auVar61._8_4_ = auVar27._8_4_ * auVar29._8_4_;
      auVar61._12_4_ = auVar27._12_4_ * auVar29._12_4_;
      auVar61._16_4_ = auVar27._16_4_ * auVar29._16_4_;
      auVar61._20_4_ = auVar27._20_4_ * auVar29._20_4_;
      auVar61._24_4_ = auVar27._24_4_ * auVar29._24_4_;
      auVar61._28_4_ = auVar29._28_4_;
      auVar44 = vsubps_avx(auVar344,auVar27);
      auVar62._4_4_ = auVar30._4_4_ * auVar44._4_4_;
      auVar62._0_4_ = auVar30._0_4_ * auVar44._0_4_;
      auVar62._8_4_ = auVar30._8_4_ * auVar44._8_4_;
      auVar62._12_4_ = auVar30._12_4_ * auVar44._12_4_;
      auVar62._16_4_ = auVar30._16_4_ * auVar44._16_4_;
      auVar62._20_4_ = auVar30._20_4_ * auVar44._20_4_;
      auVar62._24_4_ = auVar30._24_4_ * auVar44._24_4_;
      auVar62._28_4_ = register0x0000139c;
      auVar154 = vsubps_avx(auVar62,auVar61);
      auVar63._4_4_ = auVar23._4_4_ * auVar44._4_4_;
      auVar63._0_4_ = auVar23._0_4_ * auVar44._0_4_;
      auVar63._8_4_ = auVar23._8_4_ * auVar44._8_4_;
      auVar63._12_4_ = auVar23._12_4_ * auVar44._12_4_;
      auVar63._16_4_ = auVar23._16_4_ * auVar44._16_4_;
      auVar63._20_4_ = auVar23._20_4_ * auVar44._20_4_;
      auVar63._24_4_ = auVar23._24_4_ * auVar44._24_4_;
      auVar63._28_4_ = auVar29._28_4_;
      auVar64._4_4_ = auVar27._4_4_ * auVar26._4_4_;
      auVar64._0_4_ = auVar27._0_4_ * auVar26._0_4_;
      auVar64._8_4_ = auVar27._8_4_ * auVar26._8_4_;
      auVar64._12_4_ = auVar27._12_4_ * auVar26._12_4_;
      auVar64._16_4_ = auVar27._16_4_ * auVar26._16_4_;
      auVar64._20_4_ = auVar27._20_4_ * auVar26._20_4_;
      auVar64._24_4_ = auVar27._24_4_ * auVar26._24_4_;
      auVar64._28_4_ = auVar26._28_4_;
      auVar26 = vsubps_avx(auVar64,auVar63);
      auVar158._0_4_ = auVar31._0_4_ * 0.0 + auVar26._0_4_ + auVar154._0_4_ * 0.0;
      auVar158._4_4_ = auVar31._4_4_ * 0.0 + auVar26._4_4_ + auVar154._4_4_ * 0.0;
      auVar158._8_4_ = auVar31._8_4_ * 0.0 + auVar26._8_4_ + auVar154._8_4_ * 0.0;
      auVar158._12_4_ = auVar31._12_4_ * 0.0 + auVar26._12_4_ + auVar154._12_4_ * 0.0;
      auVar158._16_4_ = auVar31._16_4_ * 0.0 + auVar26._16_4_ + auVar154._16_4_ * 0.0;
      auVar158._20_4_ = auVar31._20_4_ * 0.0 + auVar26._20_4_ + auVar154._20_4_ * 0.0;
      auVar158._24_4_ = auVar31._24_4_ * 0.0 + auVar26._24_4_ + auVar154._24_4_ * 0.0;
      auVar158._28_4_ = auVar26._28_4_ + auVar26._28_4_ + auVar154._28_4_;
      auVar31 = vcmpps_avx(auVar158,ZEXT832(0) << 0x20,2);
      _local_560 = vblendvps_avx(auVar216,_local_580,auVar31);
      local_380 = vblendvps_avx(auVar24,_local_3a0,auVar31);
      auVar216 = vblendvps_avx(auVar25,auVar315,auVar31);
      auVar24 = vblendvps_avx(auVar27,auVar344,auVar31);
      auVar25 = vblendvps_avx(auVar23,auVar380,auVar31);
      auVar26 = vblendvps_avx(auVar30,auVar391,auVar31);
      auVar27 = vblendvps_avx(auVar344,auVar27,auVar31);
      auVar29 = vblendvps_avx(auVar380,auVar23,auVar31);
      auVar269 = vpackssdw_avx(local_2c0._0_16_,local_2c0._16_16_);
      auVar30 = vblendvps_avx(auVar391,auVar30,auVar31);
      auVar27 = vsubps_avx(auVar27,_local_560);
      auVar29 = vsubps_avx(auVar29,local_380);
      auVar30 = vsubps_avx(auVar30,auVar216);
      auVar44 = vsubps_avx(local_380,auVar25);
      fVar277 = auVar29._0_4_;
      fVar171 = auVar216._0_4_;
      fVar288 = auVar29._4_4_;
      fVar173 = auVar216._4_4_;
      auVar65._4_4_ = fVar173 * fVar288;
      auVar65._0_4_ = fVar171 * fVar277;
      fVar296 = auVar29._8_4_;
      fVar175 = auVar216._8_4_;
      auVar65._8_4_ = fVar175 * fVar296;
      fVar256 = auVar29._12_4_;
      fVar176 = auVar216._12_4_;
      auVar65._12_4_ = fVar176 * fVar256;
      fVar201 = auVar29._16_4_;
      fVar177 = auVar216._16_4_;
      auVar65._16_4_ = fVar177 * fVar201;
      fVar347 = auVar29._20_4_;
      fVar204 = auVar216._20_4_;
      auVar65._20_4_ = fVar204 * fVar347;
      fVar336 = auVar29._24_4_;
      fVar298 = auVar216._24_4_;
      auVar65._24_4_ = fVar298 * fVar336;
      auVar65._28_4_ = local_2c0._28_4_;
      fVar278 = local_380._0_4_;
      fVar323 = auVar30._0_4_;
      fVar290 = local_380._4_4_;
      fVar227 = auVar30._4_4_;
      auVar66._4_4_ = fVar227 * fVar290;
      auVar66._0_4_ = fVar323 * fVar278;
      fVar254 = local_380._8_4_;
      fVar263 = auVar30._8_4_;
      auVar66._8_4_ = fVar263 * fVar254;
      fVar200 = local_380._12_4_;
      fVar282 = auVar30._12_4_;
      auVar66._12_4_ = fVar282 * fVar200;
      fVar326 = local_380._16_4_;
      fVar289 = auVar30._16_4_;
      auVar66._16_4_ = fVar289 * fVar326;
      fVar350 = local_380._20_4_;
      fVar291 = auVar30._20_4_;
      auVar66._20_4_ = fVar291 * fVar350;
      fVar169 = local_380._24_4_;
      fVar293 = auVar30._24_4_;
      uVar149 = auVar23._28_4_;
      auVar66._24_4_ = fVar293 * fVar169;
      auVar66._28_4_ = uVar149;
      auVar23 = vsubps_avx(auVar66,auVar65);
      fVar279 = local_560._0_4_;
      fVar292 = local_560._4_4_;
      auVar67._4_4_ = fVar227 * fVar292;
      auVar67._0_4_ = fVar323 * fVar279;
      fVar199 = local_560._8_4_;
      auVar67._8_4_ = fVar263 * fVar199;
      fVar324 = local_560._12_4_;
      auVar67._12_4_ = fVar282 * fVar324;
      fVar327 = local_560._16_4_;
      auVar67._16_4_ = fVar289 * fVar327;
      fVar262 = local_560._20_4_;
      auVar67._20_4_ = fVar291 * fVar262;
      fVar170 = local_560._24_4_;
      auVar67._24_4_ = fVar293 * fVar170;
      auVar67._28_4_ = uVar149;
      fVar280 = auVar27._0_4_;
      fVar294 = auVar27._4_4_;
      auVar68._4_4_ = fVar173 * fVar294;
      auVar68._0_4_ = fVar171 * fVar280;
      fVar297 = auVar27._8_4_;
      auVar68._8_4_ = fVar175 * fVar297;
      fVar325 = auVar27._12_4_;
      auVar68._12_4_ = fVar176 * fVar325;
      fVar260 = auVar27._16_4_;
      auVar68._16_4_ = fVar177 * fVar260;
      fVar203 = auVar27._20_4_;
      auVar68._20_4_ = fVar204 * fVar203;
      fVar172 = auVar27._24_4_;
      auVar68._24_4_ = fVar298 * fVar172;
      auVar68._28_4_ = auVar380._28_4_;
      auVar154 = vsubps_avx(auVar68,auVar67);
      auVar69._4_4_ = fVar290 * fVar294;
      auVar69._0_4_ = fVar278 * fVar280;
      auVar69._8_4_ = fVar254 * fVar297;
      auVar69._12_4_ = fVar200 * fVar325;
      auVar69._16_4_ = fVar326 * fVar260;
      auVar69._20_4_ = fVar350 * fVar203;
      auVar69._24_4_ = fVar169 * fVar172;
      auVar69._28_4_ = uVar149;
      auVar70._4_4_ = fVar292 * fVar288;
      auVar70._0_4_ = fVar279 * fVar277;
      auVar70._8_4_ = fVar199 * fVar296;
      auVar70._12_4_ = fVar324 * fVar256;
      auVar70._16_4_ = fVar327 * fVar201;
      auVar70._20_4_ = fVar262 * fVar347;
      auVar70._24_4_ = fVar170 * fVar336;
      auVar70._28_4_ = auVar391._28_4_;
      auVar155 = vsubps_avx(auVar70,auVar69);
      auVar182 = vsubps_avx(auVar216,auVar26);
      fVar281 = auVar155._28_4_ + auVar154._28_4_;
      auVar250._0_4_ = auVar155._0_4_ + auVar154._0_4_ * 0.0 + auVar23._0_4_ * 0.0;
      auVar250._4_4_ = auVar155._4_4_ + auVar154._4_4_ * 0.0 + auVar23._4_4_ * 0.0;
      auVar250._8_4_ = auVar155._8_4_ + auVar154._8_4_ * 0.0 + auVar23._8_4_ * 0.0;
      auVar250._12_4_ = auVar155._12_4_ + auVar154._12_4_ * 0.0 + auVar23._12_4_ * 0.0;
      auVar250._16_4_ = auVar155._16_4_ + auVar154._16_4_ * 0.0 + auVar23._16_4_ * 0.0;
      auVar250._20_4_ = auVar155._20_4_ + auVar154._20_4_ * 0.0 + auVar23._20_4_ * 0.0;
      auVar250._24_4_ = auVar155._24_4_ + auVar154._24_4_ * 0.0 + auVar23._24_4_ * 0.0;
      auVar250._28_4_ = fVar281 + 0.0;
      fVar226 = auVar44._0_4_;
      fVar206 = auVar44._4_4_;
      auVar71._4_4_ = fVar206 * auVar26._4_4_;
      auVar71._0_4_ = fVar226 * auVar26._0_4_;
      fVar224 = auVar44._8_4_;
      auVar71._8_4_ = fVar224 * auVar26._8_4_;
      fVar225 = auVar44._12_4_;
      auVar71._12_4_ = fVar225 * auVar26._12_4_;
      fVar308 = auVar44._16_4_;
      auVar71._16_4_ = fVar308 * auVar26._16_4_;
      fVar320 = auVar44._20_4_;
      auVar71._20_4_ = fVar320 * auVar26._20_4_;
      fVar321 = auVar44._24_4_;
      auVar71._24_4_ = fVar321 * auVar26._24_4_;
      auVar71._28_4_ = fVar281;
      fVar281 = auVar182._0_4_;
      fVar295 = auVar182._4_4_;
      auVar72._4_4_ = auVar25._4_4_ * fVar295;
      auVar72._0_4_ = auVar25._0_4_ * fVar281;
      fVar322 = auVar182._8_4_;
      auVar72._8_4_ = auVar25._8_4_ * fVar322;
      fVar258 = auVar182._12_4_;
      auVar72._12_4_ = auVar25._12_4_ * fVar258;
      fVar202 = auVar182._16_4_;
      auVar72._16_4_ = auVar25._16_4_ * fVar202;
      fVar306 = auVar182._20_4_;
      auVar72._20_4_ = auVar25._20_4_ * fVar306;
      fVar174 = auVar182._24_4_;
      auVar72._24_4_ = auVar25._24_4_ * fVar174;
      auVar72._28_4_ = auVar155._28_4_;
      auVar23 = vsubps_avx(auVar72,auVar71);
      auVar44 = vsubps_avx(_local_560,auVar24);
      fVar349 = auVar44._0_4_;
      fVar378 = auVar44._4_4_;
      auVar73._4_4_ = fVar378 * auVar26._4_4_;
      auVar73._0_4_ = fVar349 * auVar26._0_4_;
      fVar382 = auVar44._8_4_;
      auVar73._8_4_ = fVar382 * auVar26._8_4_;
      fVar384 = auVar44._12_4_;
      auVar73._12_4_ = fVar384 * auVar26._12_4_;
      fVar386 = auVar44._16_4_;
      auVar73._16_4_ = fVar386 * auVar26._16_4_;
      fVar383 = auVar44._20_4_;
      auVar73._20_4_ = fVar383 * auVar26._20_4_;
      fVar385 = auVar44._24_4_;
      auVar73._24_4_ = fVar385 * auVar26._24_4_;
      auVar73._28_4_ = auVar26._28_4_;
      auVar74._4_4_ = auVar24._4_4_ * fVar295;
      auVar74._0_4_ = auVar24._0_4_ * fVar281;
      auVar74._8_4_ = auVar24._8_4_ * fVar322;
      auVar74._12_4_ = auVar24._12_4_ * fVar258;
      auVar74._16_4_ = auVar24._16_4_ * fVar202;
      auVar74._20_4_ = auVar24._20_4_ * fVar306;
      auVar74._24_4_ = auVar24._24_4_ * fVar174;
      auVar74._28_4_ = 0;
      auVar44 = vsubps_avx(auVar73,auVar74);
      auVar75._4_4_ = auVar25._4_4_ * fVar378;
      auVar75._0_4_ = auVar25._0_4_ * fVar349;
      auVar75._8_4_ = auVar25._8_4_ * fVar382;
      auVar75._12_4_ = auVar25._12_4_ * fVar384;
      auVar75._16_4_ = auVar25._16_4_ * fVar386;
      auVar75._20_4_ = auVar25._20_4_ * fVar383;
      auVar75._24_4_ = auVar25._24_4_ * fVar385;
      auVar75._28_4_ = auVar26._28_4_;
      auVar76._4_4_ = auVar24._4_4_ * fVar206;
      auVar76._0_4_ = auVar24._0_4_ * fVar226;
      auVar76._8_4_ = auVar24._8_4_ * fVar224;
      auVar76._12_4_ = auVar24._12_4_ * fVar225;
      auVar76._16_4_ = auVar24._16_4_ * fVar308;
      auVar76._20_4_ = auVar24._20_4_ * fVar320;
      auVar76._24_4_ = auVar24._24_4_ * fVar321;
      auVar76._28_4_ = auVar24._28_4_;
      auVar24 = vsubps_avx(auVar76,auVar75);
      auVar221._0_4_ = auVar23._0_4_ * 0.0 + auVar24._0_4_ + auVar44._0_4_ * 0.0;
      auVar221._4_4_ = auVar23._4_4_ * 0.0 + auVar24._4_4_ + auVar44._4_4_ * 0.0;
      auVar221._8_4_ = auVar23._8_4_ * 0.0 + auVar24._8_4_ + auVar44._8_4_ * 0.0;
      auVar221._12_4_ = auVar23._12_4_ * 0.0 + auVar24._12_4_ + auVar44._12_4_ * 0.0;
      auVar221._16_4_ = auVar23._16_4_ * 0.0 + auVar24._16_4_ + auVar44._16_4_ * 0.0;
      auVar221._20_4_ = auVar23._20_4_ * 0.0 + auVar24._20_4_ + auVar44._20_4_ * 0.0;
      auVar221._24_4_ = auVar23._24_4_ * 0.0 + auVar24._24_4_ + auVar44._24_4_ * 0.0;
      auVar221._28_4_ = auVar24._28_4_ + auVar24._28_4_ + auVar44._28_4_;
      auVar24 = vmaxps_avx(auVar250,auVar221);
      auVar24 = vcmpps_avx(auVar24,ZEXT832(0) << 0x20,2);
      auVar212 = vpackssdw_avx(auVar24._0_16_,auVar24._16_16_);
      auVar269 = vpand_avx(auVar269,auVar212);
      auVar212 = vpmovsxwd_avx(auVar269);
      auVar228 = vpunpckhwd_avx(auVar269,auVar269);
      auVar159._16_16_ = auVar228;
      auVar159._0_16_ = auVar212;
      if ((((((((auVar159 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar159 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar159 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar159 >> 0x7f,0) == '\0') &&
            (auVar159 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB161(auVar228 >> 0x3f,0) == '\0') &&
          (auVar159 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar228[0xf]
         ) {
LAB_00add3dc:
        auVar187._8_8_ = local_460[1]._8_8_;
        auVar187._0_8_ = local_460[1]._0_8_;
        auVar187._16_8_ = local_460[1]._16_8_;
        auVar187._24_8_ = local_460[1]._24_8_;
        auVar318 = ZEXT3264(local_6c0);
        auVar335 = ZEXT3264(local_660);
      }
      else {
        _local_4e0 = auVar250;
        auVar77._4_4_ = fVar295 * fVar288;
        auVar77._0_4_ = fVar281 * fVar277;
        auVar77._8_4_ = fVar322 * fVar296;
        auVar77._12_4_ = fVar258 * fVar256;
        auVar77._16_4_ = fVar202 * fVar201;
        auVar77._20_4_ = fVar306 * fVar347;
        auVar77._24_4_ = fVar174 * fVar336;
        auVar77._28_4_ = auVar228._12_4_;
        auVar366._0_4_ = fVar226 * fVar323;
        auVar366._4_4_ = fVar206 * fVar227;
        auVar366._8_4_ = fVar224 * fVar263;
        auVar366._12_4_ = fVar225 * fVar282;
        auVar366._16_4_ = fVar308 * fVar289;
        auVar366._20_4_ = fVar320 * fVar291;
        auVar366._24_4_ = fVar321 * fVar293;
        auVar366._28_4_ = 0;
        auVar25 = vsubps_avx(auVar366,auVar77);
        auVar78._4_4_ = fVar378 * fVar227;
        auVar78._0_4_ = fVar349 * fVar323;
        auVar78._8_4_ = fVar382 * fVar263;
        auVar78._12_4_ = fVar384 * fVar282;
        auVar78._16_4_ = fVar386 * fVar289;
        auVar78._20_4_ = fVar383 * fVar291;
        auVar78._24_4_ = fVar385 * fVar293;
        auVar78._28_4_ = auVar30._28_4_;
        auVar79._4_4_ = fVar295 * fVar294;
        auVar79._0_4_ = fVar281 * fVar280;
        auVar79._8_4_ = fVar322 * fVar297;
        auVar79._12_4_ = fVar258 * fVar325;
        auVar79._16_4_ = fVar202 * fVar260;
        auVar79._20_4_ = fVar306 * fVar203;
        auVar79._24_4_ = fVar174 * fVar172;
        auVar79._28_4_ = auVar182._28_4_;
        auVar26 = vsubps_avx(auVar79,auVar78);
        auVar80._4_4_ = fVar206 * fVar294;
        auVar80._0_4_ = fVar226 * fVar280;
        auVar80._8_4_ = fVar224 * fVar297;
        auVar80._12_4_ = fVar225 * fVar325;
        auVar80._16_4_ = fVar308 * fVar260;
        auVar80._20_4_ = fVar320 * fVar203;
        auVar80._24_4_ = fVar321 * fVar172;
        auVar80._28_4_ = auVar27._28_4_;
        auVar81._4_4_ = fVar378 * fVar288;
        auVar81._0_4_ = fVar349 * fVar277;
        auVar81._8_4_ = fVar382 * fVar296;
        auVar81._12_4_ = fVar384 * fVar256;
        auVar81._16_4_ = fVar386 * fVar201;
        auVar81._20_4_ = fVar383 * fVar347;
        auVar81._24_4_ = fVar385 * fVar336;
        auVar81._28_4_ = auVar29._28_4_;
        auVar30 = vsubps_avx(auVar81,auVar80);
        auVar304._0_4_ = auVar25._0_4_ * 0.0 + auVar30._0_4_ + auVar26._0_4_ * 0.0;
        auVar304._4_4_ = auVar25._4_4_ * 0.0 + auVar30._4_4_ + auVar26._4_4_ * 0.0;
        auVar304._8_4_ = auVar25._8_4_ * 0.0 + auVar30._8_4_ + auVar26._8_4_ * 0.0;
        auVar304._12_4_ = auVar25._12_4_ * 0.0 + auVar30._12_4_ + auVar26._12_4_ * 0.0;
        auVar304._16_4_ = auVar25._16_4_ * 0.0 + auVar30._16_4_ + auVar26._16_4_ * 0.0;
        auVar304._20_4_ = auVar25._20_4_ * 0.0 + auVar30._20_4_ + auVar26._20_4_ * 0.0;
        auVar304._24_4_ = auVar25._24_4_ * 0.0 + auVar30._24_4_ + auVar26._24_4_ * 0.0;
        auVar304._28_4_ = auVar29._28_4_ + auVar30._28_4_ + auVar27._28_4_;
        auVar24 = vrcpps_avx(auVar304);
        fVar280 = auVar24._0_4_;
        fVar281 = auVar24._4_4_;
        auVar82._4_4_ = auVar304._4_4_ * fVar281;
        auVar82._0_4_ = auVar304._0_4_ * fVar280;
        fVar288 = auVar24._8_4_;
        auVar82._8_4_ = auVar304._8_4_ * fVar288;
        fVar294 = auVar24._12_4_;
        auVar82._12_4_ = auVar304._12_4_ * fVar294;
        fVar295 = auVar24._16_4_;
        auVar82._16_4_ = auVar304._16_4_ * fVar295;
        fVar296 = auVar24._20_4_;
        auVar82._20_4_ = auVar304._20_4_ * fVar296;
        fVar297 = auVar24._24_4_;
        auVar82._24_4_ = auVar304._24_4_ * fVar297;
        auVar82._28_4_ = auVar182._28_4_;
        auVar367._8_4_ = 0x3f800000;
        auVar367._0_8_ = 0x3f8000003f800000;
        auVar367._12_4_ = 0x3f800000;
        auVar367._16_4_ = 0x3f800000;
        auVar367._20_4_ = 0x3f800000;
        auVar367._24_4_ = 0x3f800000;
        auVar367._28_4_ = 0x3f800000;
        auVar24 = vsubps_avx(auVar367,auVar82);
        fVar280 = auVar24._0_4_ * fVar280 + fVar280;
        fVar281 = auVar24._4_4_ * fVar281 + fVar281;
        fVar288 = auVar24._8_4_ * fVar288 + fVar288;
        fVar294 = auVar24._12_4_ * fVar294 + fVar294;
        fVar295 = auVar24._16_4_ * fVar295 + fVar295;
        fVar296 = auVar24._20_4_ * fVar296 + fVar296;
        fVar297 = auVar24._24_4_ * fVar297 + fVar297;
        auVar83._4_4_ =
             (auVar25._4_4_ * fVar292 + auVar26._4_4_ * fVar290 + auVar30._4_4_ * fVar173) * fVar281
        ;
        auVar83._0_4_ =
             (auVar25._0_4_ * fVar279 + auVar26._0_4_ * fVar278 + auVar30._0_4_ * fVar171) * fVar280
        ;
        auVar83._8_4_ =
             (auVar25._8_4_ * fVar199 + auVar26._8_4_ * fVar254 + auVar30._8_4_ * fVar175) * fVar288
        ;
        auVar83._12_4_ =
             (auVar25._12_4_ * fVar324 + auVar26._12_4_ * fVar200 + auVar30._12_4_ * fVar176) *
             fVar294;
        auVar83._16_4_ =
             (auVar25._16_4_ * fVar327 + auVar26._16_4_ * fVar326 + auVar30._16_4_ * fVar177) *
             fVar295;
        auVar83._20_4_ =
             (auVar25._20_4_ * fVar262 + auVar26._20_4_ * fVar350 + auVar30._20_4_ * fVar204) *
             fVar296;
        auVar83._24_4_ =
             (auVar25._24_4_ * fVar170 + auVar26._24_4_ * fVar169 + auVar30._24_4_ * fVar298) *
             fVar297;
        auVar83._28_4_ = auVar250._28_4_ + auVar216._28_4_;
        auVar160._16_16_ = auVar33;
        auVar160._0_16_ = auVar33;
        auVar216 = vcmpps_avx(auVar160,auVar83,2);
        fVar277 = (local_7a0->super_RayK<1>).tfar;
        auVar186._4_4_ = fVar277;
        auVar186._0_4_ = fVar277;
        auVar186._8_4_ = fVar277;
        auVar186._12_4_ = fVar277;
        auVar186._16_4_ = fVar277;
        auVar186._20_4_ = fVar277;
        auVar186._24_4_ = fVar277;
        auVar186._28_4_ = fVar277;
        auVar24 = vcmpps_avx(auVar83,auVar186,2);
        auVar216 = vandps_avx(auVar24,auVar216);
        auVar212 = vpackssdw_avx(auVar216._0_16_,auVar216._16_16_);
        auVar269 = vpand_avx(auVar269,auVar212);
        auVar212 = vpmovsxwd_avx(auVar269);
        auVar228 = vpshufd_avx(auVar269,0xee);
        auVar228 = vpmovsxwd_avx(auVar228);
        auVar161._16_16_ = auVar228;
        auVar161._0_16_ = auVar212;
        if ((((((((auVar161 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar161 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar161 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar161 >> 0x7f,0) == '\0') &&
              (auVar161 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB161(auVar228 >> 0x3f,0) == '\0') &&
            (auVar161 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar228[0xf]) goto LAB_00add3dc;
        auVar216 = vcmpps_avx(ZEXT832(0) << 0x20,auVar304,4);
        auVar212 = vpackssdw_avx(auVar216._0_16_,auVar216._16_16_);
        auVar269 = vpand_avx(auVar269,auVar212);
        auVar212 = vpmovsxwd_avx(auVar269);
        auVar269 = vpunpckhwd_avx(auVar269,auVar269);
        auVar271._16_16_ = auVar269;
        auVar271._0_16_ = auVar212;
        auVar187._8_8_ = local_460[1]._8_8_;
        auVar187._0_8_ = local_460[1]._0_8_;
        auVar187._16_8_ = local_460[1]._16_8_;
        auVar187._24_8_ = local_460[1]._24_8_;
        auVar318 = ZEXT3264(local_6c0);
        auVar335 = ZEXT3264(local_660);
        if ((((((((auVar271 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar271 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar271 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar271 >> 0x7f,0) != '\0') ||
              (auVar271 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB161(auVar269 >> 0x3f,0) != '\0') ||
            (auVar271 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar269[0xf] < '\0') {
          auVar162._0_4_ = fVar280 * auVar250._0_4_;
          auVar162._4_4_ = fVar281 * auVar250._4_4_;
          auVar162._8_4_ = fVar288 * auVar250._8_4_;
          auVar162._12_4_ = fVar294 * auVar250._12_4_;
          auVar162._16_4_ = fVar295 * auVar250._16_4_;
          auVar162._20_4_ = fVar296 * auVar250._20_4_;
          auVar162._24_4_ = fVar297 * auVar250._24_4_;
          auVar162._28_4_ = 0;
          auVar84._4_4_ = auVar221._4_4_ * fVar281;
          auVar84._0_4_ = auVar221._0_4_ * fVar280;
          auVar84._8_4_ = auVar221._8_4_ * fVar288;
          auVar84._12_4_ = auVar221._12_4_ * fVar294;
          auVar84._16_4_ = auVar221._16_4_ * fVar295;
          auVar84._20_4_ = auVar221._20_4_ * fVar296;
          auVar84._24_4_ = auVar221._24_4_ * fVar297;
          auVar84._28_4_ = SUB84(local_460[1]._24_8_,4);
          auVar286._8_4_ = 0x3f800000;
          auVar286._0_8_ = 0x3f8000003f800000;
          auVar286._12_4_ = 0x3f800000;
          auVar286._16_4_ = 0x3f800000;
          auVar286._20_4_ = 0x3f800000;
          auVar286._24_4_ = 0x3f800000;
          auVar286._28_4_ = 0x3f800000;
          auVar216 = vsubps_avx(auVar286,auVar162);
          auVar216 = vblendvps_avx(auVar216,auVar162,auVar31);
          auVar318 = ZEXT3264(auVar216);
          auVar216 = vsubps_avx(auVar286,auVar84);
          _local_2e0 = vblendvps_avx(auVar216,auVar84,auVar31);
          auVar335 = ZEXT3264(auVar83);
          auVar187 = auVar271;
        }
      }
      auVar370 = ZEXT1664(auVar359);
      auVar237 = ZEXT3264(auVar219);
      auVar305 = ZEXT3264(_local_620);
      if ((((((((auVar187 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar187 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar187 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar187 >> 0x7f,0) == '\0') &&
            (auVar187 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar187 >> 0xbf,0) == '\0') &&
          (auVar187 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar187[0x1f]) {
        auVar273 = ZEXT3264(_local_600);
      }
      else {
        auVar216 = vsubps_avx(local_400,_local_780);
        fVar278 = (float)local_780._0_4_ + auVar318._0_4_ * auVar216._0_4_;
        fVar279 = (float)local_780._4_4_ + auVar318._4_4_ * auVar216._4_4_;
        fVar280 = (float)auStack_778._0_4_ + auVar318._8_4_ * auVar216._8_4_;
        fVar281 = (float)auStack_778._4_4_ + auVar318._12_4_ * auVar216._12_4_;
        fVar288 = register0x00001210 + auVar318._16_4_ * auVar216._16_4_;
        fVar290 = register0x00001214 + auVar318._20_4_ * auVar216._20_4_;
        fVar292 = register0x00001218 + auVar318._24_4_ * auVar216._24_4_;
        fVar294 = auVar216._28_4_ + 0.0;
        fVar277 = local_6f8->depth_scale;
        auVar85._4_4_ = (fVar279 + fVar279) * fVar277;
        auVar85._0_4_ = (fVar278 + fVar278) * fVar277;
        auVar85._8_4_ = (fVar280 + fVar280) * fVar277;
        auVar85._12_4_ = (fVar281 + fVar281) * fVar277;
        auVar85._16_4_ = (fVar288 + fVar288) * fVar277;
        auVar85._20_4_ = (fVar290 + fVar290) * fVar277;
        auVar85._24_4_ = (fVar292 + fVar292) * fVar277;
        auVar85._28_4_ = fVar294 + fVar294;
        local_200 = auVar335._0_32_;
        auVar216 = vcmpps_avx(local_200,auVar85,6);
        auVar24 = auVar187 & auVar216;
        auVar273 = ZEXT3264(_local_600);
        if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar24 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar24 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar24 >> 0x7f,0) != '\0') ||
              (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar24 >> 0xbf,0) != '\0') ||
            (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar24[0x1f] < '\0') {
          local_2e0._0_4_ = (float)local_2e0._0_4_ + (float)local_2e0._0_4_ + -1.0;
          local_2e0._4_4_ = (float)local_2e0._4_4_ + (float)local_2e0._4_4_ + -1.0;
          uStack_2d8._0_4_ = (float)uStack_2d8 + (float)uStack_2d8 + -1.0;
          uStack_2d8._4_4_ = uStack_2d8._4_4_ + uStack_2d8._4_4_ + -1.0;
          uStack_2d0._0_4_ = (float)uStack_2d0 + (float)uStack_2d0 + -1.0;
          uStack_2d0._4_4_ = uStack_2d0._4_4_ + uStack_2d0._4_4_ + -1.0;
          uStack_2c8._0_4_ = (float)uStack_2c8 + (float)uStack_2c8 + -1.0;
          uStack_2c8._4_4_ = uStack_2c8._4_4_ + uStack_2c8._4_4_ + -1.0;
          local_240 = auVar318._0_32_;
          auVar137 = _local_2e0;
          auVar24 = _local_2e0;
          local_220 = (float)local_2e0._0_4_;
          fStack_21c = (float)local_2e0._4_4_;
          fStack_218 = (float)uStack_2d8;
          fStack_214 = uStack_2d8._4_4_;
          fStack_210 = (float)uStack_2d0;
          fStack_20c = uStack_2d0._4_4_;
          fStack_208 = (float)uStack_2c8;
          fStack_204 = uStack_2c8._4_4_;
          local_1e0 = 0;
          local_1dc = uVar146;
          uStack_708 = auVar268._8_8_;
          local_1d0 = auVar268._0_8_;
          uStack_1c8 = uStack_708;
          uStack_718 = auVar309._8_8_;
          local_1c0 = auVar309._0_8_;
          uStack_1b8 = uStack_718;
          uStack_668 = auVar390._8_8_;
          local_1b0 = auVar390._0_8_;
          uStack_1a8 = uStack_668;
          uStack_678 = auVar208._8_8_;
          local_1a0 = auVar208._0_8_;
          uStack_198 = uStack_678;
          local_6f0.ray = (RTCRayN *)local_7a0;
          _local_720 = auVar34;
          _local_710 = auVar35;
          _local_680 = auVar36;
          _local_670 = auVar37;
          if ((pGVar20->mask & (local_7a0->super_RayK<1>).mask) != 0) {
            auVar216 = vandps_avx(auVar216,auVar187);
            local_460[0] = auVar216;
            auVar209._0_4_ = 1.0 / auVar359._0_4_;
            auVar209._4_12_ = SUB6012((undefined1  [60])0x0,0);
            auVar269 = vshufps_avx(auVar209,auVar209,0);
            local_160[0] = auVar269._0_4_ * (auVar318._0_4_ + 0.0);
            local_160[1] = auVar269._4_4_ * (auVar318._4_4_ + 1.0);
            local_160[2] = auVar269._8_4_ * (auVar318._8_4_ + 2.0);
            local_160[3] = auVar269._12_4_ * (auVar318._12_4_ + 3.0);
            fStack_150 = auVar269._0_4_ * (auVar318._16_4_ + 4.0);
            fStack_14c = auVar269._4_4_ * (auVar318._20_4_ + 5.0);
            fStack_148 = auVar269._8_4_ * (auVar318._24_4_ + 6.0);
            fStack_144 = auVar318._28_4_ + 7.0;
            uStack_2d0 = auVar137._16_8_;
            uStack_2c8 = auVar24._24_8_;
            local_140 = local_2e0;
            uStack_138 = uStack_2d8;
            uStack_130 = uStack_2d0;
            uStack_128 = uStack_2c8;
            local_120 = local_200;
            auVar188._8_4_ = 0x7f800000;
            auVar188._0_8_ = 0x7f8000007f800000;
            auVar188._12_4_ = 0x7f800000;
            auVar188._16_4_ = 0x7f800000;
            auVar188._20_4_ = 0x7f800000;
            auVar188._24_4_ = 0x7f800000;
            auVar188._28_4_ = 0x7f800000;
            auVar25 = vblendvps_avx(auVar188,local_200,auVar216);
            auVar26 = vshufps_avx(auVar25,auVar25,0xb1);
            auVar26 = vminps_avx(auVar25,auVar26);
            auVar27 = vshufpd_avx(auVar26,auVar26,5);
            auVar26 = vminps_avx(auVar26,auVar27);
            auVar27 = vperm2f128_avx(auVar26,auVar26,1);
            auVar26 = vminps_avx(auVar26,auVar27);
            auVar25 = vcmpps_avx(auVar25,auVar26,0);
            auVar26 = auVar216 & auVar25;
            local_78c = uVar146;
            if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar26 >> 0x7f,0) != '\0') ||
                  (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar26 >> 0xbf,0) != '\0') ||
                (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar26[0x1f] < '\0') {
              auVar216 = vandps_avx(auVar25,auVar216);
            }
            uVar138 = vmovmskps_avx(auVar216);
            uVar146 = 0;
            if (uVar138 != 0) {
              for (; (uVar138 >> uVar146 & 1) == 0; uVar146 = uVar146 + 1) {
              }
            }
            uVar143 = (ulong)uVar146;
            _local_2e0 = auVar24;
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (pGVar20->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
              local_660 = local_200;
              _local_780 = ZEXT432((uint)(local_7a0->super_RayK<1>).tfar);
              local_6c0 = auVar318._0_32_;
              _local_2a0 = auVar28;
              do {
                local_5c4 = local_160[uVar143];
                local_5c0 = *(undefined4 *)((long)&local_140 + uVar143 * 4);
                (((RayHit *)local_6f0.ray)->super_RayK<1>).tfar =
                     *(float *)(local_120 + uVar143 * 4);
                local_6f0.context = context->user;
                fVar252 = 1.0 - local_5c4;
                fVar245 = local_5c4 * fVar252 * 4.0;
                auVar269 = ZEXT416((uint)(local_5c4 * local_5c4 * 0.5));
                auVar269 = vshufps_avx(auVar269,auVar269,0);
                auVar212 = ZEXT416((uint)((fVar252 * fVar252 + fVar245) * 0.5));
                auVar212 = vshufps_avx(auVar212,auVar212,0);
                auVar228 = ZEXT416((uint)((-local_5c4 * local_5c4 - fVar245) * 0.5));
                auVar228 = vshufps_avx(auVar228,auVar228,0);
                auVar232 = ZEXT416((uint)(fVar252 * -fVar252 * 0.5));
                auVar232 = vshufps_avx(auVar232,auVar232,0);
                auVar215._0_4_ =
                     auVar232._0_4_ * (float)local_710._0_4_ +
                     auVar228._0_4_ * (float)local_720._0_4_ +
                     auVar269._0_4_ * (float)local_680._0_4_ +
                     auVar212._0_4_ * (float)local_670._0_4_;
                auVar215._4_4_ =
                     auVar232._4_4_ * (float)local_710._4_4_ +
                     auVar228._4_4_ * (float)local_720._4_4_ +
                     auVar269._4_4_ * (float)local_680._4_4_ +
                     auVar212._4_4_ * (float)local_670._4_4_;
                auVar215._8_4_ =
                     auVar232._8_4_ * (float)uStack_708 +
                     auVar228._8_4_ * (float)uStack_718 +
                     auVar269._8_4_ * (float)uStack_678 + auVar212._8_4_ * (float)uStack_668;
                auVar215._12_4_ =
                     auVar232._12_4_ * uStack_708._4_4_ +
                     auVar228._12_4_ * uStack_718._4_4_ +
                     auVar269._12_4_ * uStack_678._4_4_ + auVar212._12_4_ * uStack_668._4_4_;
                local_5d0 = vmovlps_avx(auVar215);
                local_5c8 = vextractps_avx(auVar215,2);
                local_5bc = (int)local_788;
                local_5b8 = (int)local_798;
                local_5b4 = (local_6f0.context)->instID[0];
                local_5b0 = (local_6f0.context)->instPrimID[0];
                local_7a4 = -1;
                local_6f0.valid = &local_7a4;
                local_6f0.geometryUserPtr = pGVar20->userPtr;
                local_6f0.hit = (RTCHitN *)&local_5d0;
                local_6f0.N = 1;
                pRVar144 = (RayHit *)local_6f0.ray;
                if (pGVar20->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00add624:
                  p_Var22 = context->args->filter;
                  if ((p_Var22 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar20->field_8).field_0x2 & 0x40) != 0)
                      ))) {
                    local_400._0_8_ = uVar143;
                    (*p_Var22)(&local_6f0);
                    auVar370 = ZEXT1664(local_540._0_16_);
                    auVar237 = ZEXT3264(_local_500);
                    auVar305 = ZEXT3264(_local_620);
                    auVar318 = ZEXT3264(local_6c0);
                    uVar143 = local_400._0_8_;
                    pRVar144 = local_7a0;
                    fVar179 = (float)local_640._0_4_;
                    fVar195 = (float)local_640._4_4_;
                    fVar197 = fStack_638;
                    fVar264 = fStack_634;
                    fVar238 = fStack_630;
                    fVar240 = fStack_62c;
                    fVar242 = fStack_628;
                    fVar229 = (float)local_740._0_4_;
                    fVar239 = (float)local_740._4_4_;
                    fVar241 = fStack_738;
                    fVar243 = fStack_734;
                    fVar265 = fStack_730;
                    fVar274 = fStack_72c;
                    fVar276 = fStack_728;
                    if (*local_6f0.valid == 0) goto LAB_00add71b;
                  }
                  (((Vec3f *)((long)local_6f0.ray + 0x30))->field_0).components[0] =
                       *(float *)local_6f0.hit;
                  (((Vec3f *)((long)local_6f0.ray + 0x30))->field_0).field_0.y =
                       *(float *)(local_6f0.hit + 4);
                  (((Vec3f *)((long)local_6f0.ray + 0x30))->field_0).field_0.z =
                       *(float *)(local_6f0.hit + 8);
                  *(float *)((long)local_6f0.ray + 0x3c) = *(float *)(local_6f0.hit + 0xc);
                  *(float *)((long)local_6f0.ray + 0x40) = *(float *)(local_6f0.hit + 0x10);
                  *(float *)((long)local_6f0.ray + 0x44) = *(float *)(local_6f0.hit + 0x14);
                  *(float *)((long)local_6f0.ray + 0x48) = *(float *)(local_6f0.hit + 0x18);
                  *(float *)((long)local_6f0.ray + 0x4c) = *(float *)(local_6f0.hit + 0x1c);
                  *(float *)((long)local_6f0.ray + 0x50) = *(float *)(local_6f0.hit + 0x20);
                  local_6f0.ray = (RTCRayN *)pRVar144;
                }
                else {
                  (*pGVar20->intersectionFilterN)(&local_6f0);
                  auVar370 = ZEXT1664(local_540._0_16_);
                  auVar237 = ZEXT3264(_local_500);
                  auVar305 = ZEXT3264(_local_620);
                  auVar318 = ZEXT3264(local_6c0);
                  pRVar144 = local_7a0;
                  fVar179 = (float)local_640._0_4_;
                  fVar195 = (float)local_640._4_4_;
                  fVar197 = fStack_638;
                  fVar264 = fStack_634;
                  fVar238 = fStack_630;
                  fVar240 = fStack_62c;
                  fVar242 = fStack_628;
                  fVar229 = (float)local_740._0_4_;
                  fVar239 = (float)local_740._4_4_;
                  fVar241 = fStack_738;
                  fVar243 = fStack_734;
                  fVar265 = fStack_730;
                  fVar274 = fStack_72c;
                  fVar276 = fStack_728;
                  if (*local_6f0.valid != 0) goto LAB_00add624;
LAB_00add71b:
                  (local_7a0->super_RayK<1>).tfar = (float)local_780._0_4_;
                  local_6f0.ray = (RTCRayN *)local_7a0;
                }
                auVar359._0_4_ = auVar370._0_4_;
                auVar219 = auVar237._0_32_;
                *(undefined4 *)(local_460[0] + uVar143 * 4) = 0;
                auVar25 = local_460[0];
                fVar245 = (((RayHit *)local_6f0.ray)->super_RayK<1>).tfar;
                auVar168._4_4_ = fVar245;
                auVar168._0_4_ = fVar245;
                auVar168._8_4_ = fVar245;
                auVar168._12_4_ = fVar245;
                auVar168._16_4_ = fVar245;
                auVar168._20_4_ = fVar245;
                auVar168._24_4_ = fVar245;
                auVar168._28_4_ = fVar245;
                auVar335 = ZEXT3264(local_660);
                auVar24 = vcmpps_avx(local_660,auVar168,2);
                auVar216 = vandps_avx(auVar24,local_460[0]);
                local_460[0] = auVar216;
                auVar25 = auVar25 & auVar24;
                if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar25 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar25 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar25 >> 0x7f,0) == '\0') &&
                      (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar25 >> 0xbf,0) == '\0') &&
                    (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar25[0x1f]) goto LAB_00adc3b8;
                _local_780 = *(undefined1 (*) [32])&(((RayHit *)local_6f0.ray)->super_RayK<1>).tfar;
                auVar193._8_4_ = 0x7f800000;
                auVar193._0_8_ = 0x7f8000007f800000;
                auVar193._12_4_ = 0x7f800000;
                auVar193._16_4_ = 0x7f800000;
                auVar193._20_4_ = 0x7f800000;
                auVar193._24_4_ = 0x7f800000;
                auVar193._28_4_ = 0x7f800000;
                auVar24 = vblendvps_avx(auVar193,local_660,auVar216);
                auVar25 = vshufps_avx(auVar24,auVar24,0xb1);
                auVar25 = vminps_avx(auVar24,auVar25);
                auVar26 = vshufpd_avx(auVar25,auVar25,5);
                auVar25 = vminps_avx(auVar25,auVar26);
                auVar26 = vperm2f128_avx(auVar25,auVar25,1);
                auVar25 = vminps_avx(auVar25,auVar26);
                auVar24 = vcmpps_avx(auVar24,auVar25,0);
                auVar25 = auVar216 & auVar24;
                if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar25 >> 0x7f,0) != '\0') ||
                      (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar25 >> 0xbf,0) != '\0') ||
                    (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar25[0x1f] < '\0') {
                  auVar216 = vandps_avx(auVar24,auVar216);
                }
                uVar139 = vmovmskps_avx(auVar216);
                uVar141 = 0;
                if (uVar139 != 0) {
                  for (; (uVar139 >> uVar141 & 1) == 0; uVar141 = uVar141 + 1) {
                  }
                }
                uVar143 = (ulong)uVar141;
              } while( true );
            }
            fVar245 = local_160[uVar143];
            fVar252 = *(float *)((long)&local_140 + uVar143 * 4);
            fVar255 = 1.0 - fVar245;
            fVar253 = fVar245 * fVar255 * 4.0;
            auVar269 = ZEXT416((uint)(fVar245 * fVar245 * 0.5));
            auVar269 = vshufps_avx(auVar269,auVar269,0);
            auVar212 = ZEXT416((uint)((fVar255 * fVar255 + fVar253) * 0.5));
            auVar212 = vshufps_avx(auVar212,auVar212,0);
            auVar228 = ZEXT416((uint)((-fVar245 * fVar245 - fVar253) * 0.5));
            auVar228 = vshufps_avx(auVar228,auVar228,0);
            auVar232 = ZEXT416((uint)(fVar255 * -fVar255 * 0.5));
            auVar232 = vshufps_avx(auVar232,auVar232,0);
            auVar210._0_4_ =
                 auVar232._0_4_ * fVar266 +
                 auVar228._0_4_ * fVar307 + auVar269._0_4_ * fVar205 + auVar212._0_4_ * fVar388;
            auVar210._4_4_ =
                 auVar232._4_4_ * fVar275 +
                 auVar228._4_4_ * fVar319 + auVar269._4_4_ * fVar223 + auVar212._4_4_ * fVar393;
            auVar210._8_4_ =
                 auVar232._8_4_ * auVar268._8_4_ +
                 auVar228._8_4_ * auVar309._8_4_ +
                 auVar269._8_4_ * auVar208._8_4_ + auVar212._8_4_ * auVar390._8_4_;
            auVar210._12_4_ =
                 auVar232._12_4_ * auVar268._12_4_ +
                 auVar228._12_4_ * auVar309._12_4_ +
                 auVar269._12_4_ * auVar208._12_4_ + auVar212._12_4_ * auVar390._12_4_;
            (local_7a0->super_RayK<1>).tfar = *(float *)(local_120 + uVar143 * 4);
            uVar9 = vmovlps_avx(auVar210);
            *(undefined8 *)&(local_7a0->Ng).field_0 = uVar9;
            fVar253 = (float)vextractps_avx(auVar210,2);
            (local_7a0->Ng).field_0.field_0.z = fVar253;
            local_7a0->u = fVar245;
            local_7a0->v = fVar252;
            local_7a0->primID = uVar139;
            local_7a0->geomID = uVar141;
            local_7a0->instID[0] = context->user->instID[0];
            local_7a0->instPrimID[0] = context->user->instPrimID[0];
LAB_00adc3b8:
            auVar273 = ZEXT3264(_local_600);
            prim = local_700;
            uVar146 = local_78c;
            auVar33 = _local_760;
          }
          _local_760 = auVar33;
          ray = (RayHit *)local_6f0.ray;
          fVar178 = (float)local_6a0._0_4_;
          fVar194 = (float)local_6a0._4_4_;
          fVar196 = fStack_698;
          fVar198 = fStack_694;
          fVar245 = fStack_690;
          fVar252 = fStack_68c;
          fVar253 = fStack_688;
          fVar255 = fStack_684;
          fVar351 = (float)local_480._0_4_;
          fVar357 = (float)local_480._4_4_;
          fVar358 = fStack_478;
          fVar151 = fStack_474;
          fVar257 = fStack_470;
          fVar259 = fStack_46c;
          fVar261 = fStack_468;
          fVar244 = fStack_464;
          auVar33 = _local_760;
        }
      }
      _local_760 = auVar33;
      auVar269 = local_5a0._0_16_;
    }
    if (8 < (int)uVar146) {
      _local_3a0 = vpshufd_avx(ZEXT416(uVar146),0);
      auVar269 = vshufps_avx(auVar269,auVar269,0);
      register0x00001210 = auVar269;
      _local_2a0 = auVar269;
      local_3e0 = local_760._0_4_;
      fStack_3dc = local_760._4_4_;
      fStack_3d8 = local_760._8_4_;
      fStack_3d4 = local_760._12_4_;
      auVar153._0_4_ = 1.0 / auVar359._0_4_;
      auVar153._4_12_ = SUB6012((undefined1  [60])0x0,0);
      auVar269 = vshufps_avx(auVar153,auVar153,0);
      register0x00001210 = auVar269;
      _local_2c0 = auVar269;
      lVar148 = 8;
      local_6c0 = auVar318._0_32_;
      local_660 = auVar335._0_32_;
      _local_500 = auVar219;
      fStack_3d0 = local_3e0;
      fStack_3cc = fStack_3dc;
      fStack_3c8 = fStack_3d8;
      fStack_3c4 = fStack_3d4;
LAB_00adc4a3:
      if (lVar148 < lVar142) {
        pauVar8 = (undefined1 (*) [28])(bspline_basis0 + lVar148 * 4 + lVar150);
        fVar292 = *(float *)*pauVar8;
        fVar294 = *(float *)(*pauVar8 + 4);
        fVar295 = *(float *)(*pauVar8 + 8);
        fVar296 = *(float *)(*pauVar8 + 0xc);
        fVar254 = *(float *)(*pauVar8 + 0x10);
        fVar199 = *(float *)(*pauVar8 + 0x14);
        fVar297 = *(float *)(*pauVar8 + 0x18);
        auVar135 = *pauVar8;
        pauVar8 = (undefined1 (*) [28])(lVar150 + 0x21fffac + lVar148 * 4);
        fVar322 = *(float *)*pauVar8;
        fVar256 = *(float *)(*pauVar8 + 4);
        fVar200 = *(float *)(*pauVar8 + 8);
        fVar324 = *(float *)(*pauVar8 + 0xc);
        fVar325 = *(float *)(*pauVar8 + 0x10);
        fVar258 = *(float *)(*pauVar8 + 0x14);
        fVar201 = *(float *)(*pauVar8 + 0x18);
        auVar134 = *pauVar8;
        pauVar8 = (undefined1 (*) [28])(lVar150 + 0x2200430 + lVar148 * 4);
        fVar326 = *(float *)*pauVar8;
        fVar327 = *(float *)(*pauVar8 + 4);
        fVar260 = *(float *)(*pauVar8 + 8);
        fVar202 = *(float *)(*pauVar8 + 0xc);
        fVar347 = *(float *)(*pauVar8 + 0x10);
        fVar350 = *(float *)(*pauVar8 + 0x14);
        fVar262 = *(float *)(*pauVar8 + 0x18);
        auVar133 = *pauVar8;
        pfVar1 = (float *)(lVar150 + 0x22008b4 + lVar148 * 4);
        fVar203 = *pfVar1;
        fVar306 = pfVar1[1];
        fVar336 = pfVar1[2];
        fVar169 = pfVar1[3];
        fVar170 = pfVar1[4];
        fVar172 = pfVar1[5];
        fVar174 = pfVar1[6];
        fStack_744 = fVar244 + fVar244 + fStack_344;
        local_5a0._0_4_ =
             fVar179 * fVar292 +
             fVar322 * (float)local_340._0_4_ + fVar178 * fVar326 + fVar203 * (float)local_360._0_4_
        ;
        local_5a0._4_4_ =
             fVar195 * fVar294 +
             fVar256 * (float)local_340._4_4_ + fVar194 * fVar327 + fVar306 * (float)local_360._4_4_
        ;
        local_5a0._8_4_ =
             fVar197 * fVar295 + fVar200 * fStack_338 + fVar196 * fVar260 + fVar336 * fStack_358;
        local_5a0._12_4_ =
             fVar264 * fVar296 + fVar324 * fStack_334 + fVar198 * fVar202 + fVar169 * fStack_354;
        local_5a0._16_4_ =
             fVar238 * fVar254 + fVar325 * fStack_330 + fVar245 * fVar347 + fVar170 * fStack_350;
        local_5a0._20_4_ =
             fVar240 * fVar199 + fVar258 * fStack_32c + fVar252 * fVar350 + fVar172 * fStack_34c;
        local_5a0._24_4_ =
             fVar242 * fVar297 + fVar201 * fStack_328 + fVar253 * fVar262 + fVar174 * fStack_348;
        local_5a0._28_4_ = fVar244 + fVar255 + fStack_744;
        fVar277 = auVar273._0_4_;
        fVar278 = auVar273._4_4_;
        fVar279 = auVar273._8_4_;
        fVar280 = auVar273._12_4_;
        fVar281 = auVar273._16_4_;
        fVar288 = auVar273._20_4_;
        fVar290 = auVar273._24_4_;
        auVar222._0_4_ =
             fVar292 * fVar277 + fVar322 * auVar305._0_4_ + fVar229 * fVar326 + fVar203 * fVar351;
        auVar222._4_4_ =
             fVar294 * fVar278 + fVar256 * auVar305._4_4_ + fVar239 * fVar327 + fVar306 * fVar357;
        auVar222._8_4_ =
             fVar295 * fVar279 + fVar200 * auVar305._8_4_ + fVar241 * fVar260 + fVar336 * fVar358;
        auVar222._12_4_ =
             fVar296 * fVar280 + fVar324 * auVar305._12_4_ + fVar243 * fVar202 + fVar169 * fVar151;
        auVar222._16_4_ =
             fVar254 * fVar281 + fVar325 * auVar305._16_4_ + fVar265 * fVar347 + fVar170 * fVar257;
        auVar222._20_4_ =
             fVar199 * fVar288 + fVar258 * auVar305._20_4_ + fVar274 * fVar350 + fVar172 * fVar259;
        auVar222._24_4_ =
             fVar297 * fVar290 + fVar201 * auVar305._24_4_ + fVar276 * fVar262 + fVar174 * fVar261;
        auVar222._28_4_ = fStack_744 + fVar244 + fVar244 + fStack_404;
        local_760._0_4_ =
             fVar292 * (float)local_e0._0_4_ +
             fVar322 * (float)local_100._0_4_ +
             (float)local_a0._0_4_ * fVar326 + (float)local_c0._0_4_ * fVar203;
        local_760._4_4_ =
             fVar294 * (float)local_e0._4_4_ +
             fVar256 * (float)local_100._4_4_ +
             (float)local_a0._4_4_ * fVar327 + (float)local_c0._4_4_ * fVar306;
        fStack_758 = fVar295 * fStack_d8 +
                     fVar200 * fStack_f8 + fStack_98 * fVar260 + fStack_b8 * fVar336;
        fStack_754 = fVar296 * fStack_d4 +
                     fVar324 * fStack_f4 + fStack_94 * fVar202 + fStack_b4 * fVar169;
        fStack_750 = fVar254 * fStack_d0 +
                     fVar325 * fStack_f0 + fStack_90 * fVar347 + fStack_b0 * fVar170;
        fStack_74c = fVar199 * fStack_cc +
                     fVar258 * fStack_ec + fStack_8c * fVar350 + fStack_ac * fVar172;
        fStack_748 = fVar297 * fStack_c8 +
                     fVar201 * fStack_e8 + fStack_88 * fVar262 + fStack_a8 * fVar174;
        fStack_744 = fStack_744 + fVar244 + fVar244 + fVar255;
        pfVar1 = (float *)(bspline_basis1 + lVar148 * 4 + lVar150);
        fVar292 = *pfVar1;
        fVar294 = pfVar1[1];
        fVar295 = pfVar1[2];
        fVar296 = pfVar1[3];
        fVar254 = pfVar1[4];
        fVar199 = pfVar1[5];
        fVar297 = pfVar1[6];
        pfVar2 = (float *)(lVar150 + 0x22023cc + lVar148 * 4);
        fVar322 = *pfVar2;
        fVar256 = pfVar2[1];
        fVar200 = pfVar2[2];
        fVar324 = pfVar2[3];
        fVar325 = pfVar2[4];
        fVar258 = pfVar2[5];
        fVar201 = pfVar2[6];
        pfVar2 = (float *)(lVar150 + 0x2202850 + lVar148 * 4);
        fVar326 = *pfVar2;
        fVar327 = pfVar2[1];
        fVar260 = pfVar2[2];
        fVar202 = pfVar2[3];
        fVar347 = pfVar2[4];
        fVar350 = pfVar2[5];
        fVar262 = pfVar2[6];
        pauVar8 = (undefined1 (*) [28])(lVar150 + 0x2202cd4 + lVar148 * 4);
        fVar255 = *(float *)*pauVar8;
        fVar238 = *(float *)(*pauVar8 + 4);
        fVar240 = *(float *)(*pauVar8 + 8);
        fVar242 = *(float *)(*pauVar8 + 0xc);
        fVar179 = *(float *)(*pauVar8 + 0x10);
        fVar195 = *(float *)(*pauVar8 + 0x14);
        fVar197 = *(float *)(*pauVar8 + 0x18);
        auVar136 = *pauVar8;
        fVar171 = auVar305._28_4_;
        fVar205 = fVar171 + *(float *)pauVar8[1];
        fVar264 = fVar171 + fVar171 + fStack_344;
        local_540._0_4_ =
             (float)local_640._0_4_ * fVar292 +
             (float)local_340._0_4_ * fVar322 + fVar178 * fVar326 + (float)local_360._0_4_ * fVar255
        ;
        local_540._4_4_ =
             (float)local_640._4_4_ * fVar294 +
             (float)local_340._4_4_ * fVar256 + fVar194 * fVar327 + (float)local_360._4_4_ * fVar238
        ;
        local_540._8_4_ =
             fStack_638 * fVar295 + fStack_338 * fVar200 + fVar196 * fVar260 + fStack_358 * fVar240;
        local_540._12_4_ =
             fStack_634 * fVar296 + fStack_334 * fVar324 + fVar198 * fVar202 + fStack_354 * fVar242;
        local_540._16_4_ =
             fStack_630 * fVar254 + fStack_330 * fVar325 + fVar245 * fVar347 + fStack_350 * fVar179;
        local_540._20_4_ =
             fStack_62c * fVar199 + fStack_32c * fVar258 + fVar252 * fVar350 + fStack_34c * fVar195;
        local_540._24_4_ =
             fStack_628 * fVar297 + fStack_328 * fVar201 + fVar253 * fVar262 + fStack_348 * fVar197;
        local_540._28_4_ = fVar205 + fVar264;
        local_400._0_4_ =
             fVar277 * fVar292 + fVar322 * auVar305._0_4_ + fVar351 * fVar255 + fVar229 * fVar326;
        local_400._4_4_ =
             fVar278 * fVar294 + fVar256 * auVar305._4_4_ + fVar357 * fVar238 + fVar239 * fVar327;
        local_400._8_4_ =
             fVar279 * fVar295 + fVar200 * auVar305._8_4_ + fVar358 * fVar240 + fVar241 * fVar260;
        local_400._12_4_ =
             fVar280 * fVar296 + fVar324 * auVar305._12_4_ + fVar151 * fVar242 + fVar243 * fVar202;
        local_400._16_4_ =
             fVar281 * fVar254 + fVar325 * auVar305._16_4_ + fVar257 * fVar179 + fVar265 * fVar347;
        local_400._20_4_ =
             fVar288 * fVar199 + fVar258 * auVar305._20_4_ + fVar259 * fVar195 + fVar274 * fVar350;
        local_400._24_4_ =
             fVar290 * fVar297 + fVar201 * auVar305._24_4_ + fVar261 * fVar197 + fVar276 * fVar262;
        local_400._28_4_ = fVar264 + fVar171 + fVar244 + fVar171;
        auVar381._0_4_ =
             fVar322 * (float)local_100._0_4_ +
             (float)local_a0._0_4_ * fVar326 + (float)local_c0._0_4_ * fVar255 +
             fVar292 * (float)local_e0._0_4_;
        auVar381._4_4_ =
             fVar256 * (float)local_100._4_4_ +
             (float)local_a0._4_4_ * fVar327 + (float)local_c0._4_4_ * fVar238 +
             fVar294 * (float)local_e0._4_4_;
        auVar381._8_4_ =
             fVar200 * fStack_f8 + fStack_98 * fVar260 + fStack_b8 * fVar240 + fVar295 * fStack_d8;
        auVar381._12_4_ =
             fVar324 * fStack_f4 + fStack_94 * fVar202 + fStack_b4 * fVar242 + fVar296 * fStack_d4;
        auVar381._16_4_ =
             fVar325 * fStack_f0 + fStack_90 * fVar347 + fStack_b0 * fVar179 + fVar254 * fStack_d0;
        auVar381._20_4_ =
             fVar258 * fStack_ec + fStack_8c * fVar350 + fStack_ac * fVar195 + fVar199 * fStack_cc;
        auVar381._24_4_ =
             fVar201 * fStack_e8 + fStack_88 * fVar262 + fStack_a8 * fVar197 + fVar297 * fStack_c8;
        auVar381._28_4_ = fVar171 + fVar205 + fVar264;
        auVar24 = vsubps_avx(local_540,local_5a0);
        auVar25 = vsubps_avx(local_400,auVar222);
        fVar245 = auVar24._0_4_;
        fVar253 = auVar24._4_4_;
        auVar86._4_4_ = auVar222._4_4_ * fVar253;
        auVar86._0_4_ = auVar222._0_4_ * fVar245;
        fVar257 = auVar24._8_4_;
        auVar86._8_4_ = auVar222._8_4_ * fVar257;
        fVar261 = auVar24._12_4_;
        auVar86._12_4_ = auVar222._12_4_ * fVar261;
        fVar238 = auVar24._16_4_;
        auVar86._16_4_ = auVar222._16_4_ * fVar238;
        fVar242 = auVar24._20_4_;
        auVar86._20_4_ = auVar222._20_4_ * fVar242;
        fVar274 = auVar24._24_4_;
        auVar86._24_4_ = auVar222._24_4_ * fVar274;
        auVar86._28_4_ = fVar264;
        fVar252 = auVar25._0_4_;
        fVar255 = auVar25._4_4_;
        auVar87._4_4_ = local_5a0._4_4_ * fVar255;
        auVar87._0_4_ = local_5a0._0_4_ * fVar252;
        fVar259 = auVar25._8_4_;
        auVar87._8_4_ = local_5a0._8_4_ * fVar259;
        fVar244 = auVar25._12_4_;
        auVar87._12_4_ = local_5a0._12_4_ * fVar244;
        fVar240 = auVar25._16_4_;
        auVar87._16_4_ = local_5a0._16_4_ * fVar240;
        fVar265 = auVar25._20_4_;
        auVar87._20_4_ = local_5a0._20_4_ * fVar265;
        fVar276 = auVar25._24_4_;
        auVar87._24_4_ = local_5a0._24_4_ * fVar276;
        auVar87._28_4_ = local_400._28_4_;
        auVar26 = vsubps_avx(auVar86,auVar87);
        auVar216 = vmaxps_avx(_local_760,auVar381);
        auVar88._4_4_ = auVar216._4_4_ * auVar216._4_4_ * (fVar253 * fVar253 + fVar255 * fVar255);
        auVar88._0_4_ = auVar216._0_4_ * auVar216._0_4_ * (fVar245 * fVar245 + fVar252 * fVar252);
        auVar88._8_4_ = auVar216._8_4_ * auVar216._8_4_ * (fVar257 * fVar257 + fVar259 * fVar259);
        auVar88._12_4_ = auVar216._12_4_ * auVar216._12_4_ * (fVar261 * fVar261 + fVar244 * fVar244)
        ;
        auVar88._16_4_ = auVar216._16_4_ * auVar216._16_4_ * (fVar238 * fVar238 + fVar240 * fVar240)
        ;
        auVar88._20_4_ = auVar216._20_4_ * auVar216._20_4_ * (fVar242 * fVar242 + fVar265 * fVar265)
        ;
        auVar88._24_4_ = auVar216._24_4_ * auVar216._24_4_ * (fVar274 * fVar274 + fVar276 * fVar276)
        ;
        auVar88._28_4_ = local_540._28_4_ + local_400._28_4_;
        auVar89._4_4_ = auVar26._4_4_ * auVar26._4_4_;
        auVar89._0_4_ = auVar26._0_4_ * auVar26._0_4_;
        auVar89._8_4_ = auVar26._8_4_ * auVar26._8_4_;
        auVar89._12_4_ = auVar26._12_4_ * auVar26._12_4_;
        auVar89._16_4_ = auVar26._16_4_ * auVar26._16_4_;
        auVar89._20_4_ = auVar26._20_4_ * auVar26._20_4_;
        auVar89._24_4_ = auVar26._24_4_ * auVar26._24_4_;
        auVar89._28_4_ = auVar26._28_4_;
        local_380 = vcmpps_avx(auVar89,auVar88,2);
        local_1e0 = (uint)lVar148;
        auVar212 = vpshufd_avx(ZEXT416(local_1e0),0);
        auVar269 = vpor_avx(auVar212,_DAT_01f4ad30);
        auVar212 = vpor_avx(auVar212,_DAT_01f7afa0);
        auVar269 = vpcmpgtd_avx(_local_3a0,auVar269);
        auVar212 = vpcmpgtd_avx(_local_3a0,auVar212);
        register0x000012d0 = auVar212;
        _local_3c0 = auVar269;
        auVar216 = _local_3c0 & local_380;
        fVar178 = (float)local_6a0._0_4_;
        fVar194 = (float)local_6a0._4_4_;
        fVar196 = fStack_698;
        fVar198 = fStack_694;
        fVar245 = fStack_690;
        fVar252 = fStack_68c;
        fVar253 = fStack_688;
        fVar255 = fStack_684;
        fVar179 = (float)local_640._0_4_;
        fVar195 = (float)local_640._4_4_;
        fVar197 = fStack_638;
        fVar264 = fStack_634;
        fVar238 = fStack_630;
        fVar240 = fStack_62c;
        fVar242 = fStack_628;
        fVar229 = (float)local_740._0_4_;
        fVar239 = (float)local_740._4_4_;
        fVar241 = fStack_738;
        fVar243 = fStack_734;
        fVar265 = fStack_730;
        fVar274 = fStack_72c;
        fVar276 = fStack_728;
        if ((((((((auVar216 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar216 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar216 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar216 >> 0x7f,0) != '\0') ||
              (auVar216 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar216 >> 0xbf,0) != '\0') ||
            (auVar216 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar216[0x1f] < '\0') {
          local_580._0_4_ = auVar136._0_4_;
          local_580._4_4_ = auVar136._4_4_;
          fStack_578 = auVar136._8_4_;
          fStack_574 = auVar136._12_4_;
          fStack_570 = auVar136._16_4_;
          fStack_56c = auVar136._20_4_;
          fStack_568 = auVar136._24_4_;
          local_580._0_4_ =
               fVar292 * (float)local_500._0_4_ +
               fVar322 * (float)local_260._0_4_ +
               (float)local_280._0_4_ * fVar326 + (float)local_520._0_4_ * (float)local_580._0_4_;
          local_580._4_4_ =
               fVar294 * (float)local_500._4_4_ +
               fVar256 * (float)local_260._4_4_ +
               (float)local_280._4_4_ * fVar327 + (float)local_520._4_4_ * (float)local_580._4_4_;
          fStack_578 = fVar295 * fStack_4f8 +
                       fVar200 * fStack_258 + fStack_278 * fVar260 + fStack_518 * fStack_578;
          fStack_574 = fVar296 * fStack_4f4 +
                       fVar324 * fStack_254 + fStack_274 * fVar202 + fStack_514 * fStack_574;
          fStack_570 = fVar254 * fStack_4f0 +
                       fVar325 * fStack_250 + fStack_270 * fVar347 + fStack_510 * fStack_570;
          fStack_56c = fVar199 * fStack_4ec +
                       fVar258 * fStack_24c + fStack_26c * fVar350 + fStack_50c * fStack_56c;
          fStack_568 = fVar297 * fStack_4e8 +
                       fVar201 * fStack_248 + fStack_268 * fVar262 + fStack_508 * fStack_568;
          fStack_564 = pfVar1[7] + local_380._28_4_ + pfVar2[7] + 0.0;
          local_4e0._0_4_ = auVar134._0_4_;
          local_4e0._4_4_ = auVar134._4_4_;
          fStack_4d8 = auVar134._8_4_;
          fStack_4d4 = auVar134._12_4_;
          fStack_4d0 = auVar134._16_4_;
          fStack_4cc = auVar134._20_4_;
          fStack_4c8 = auVar134._24_4_;
          fVar151 = (float)local_260._0_4_ * (float)local_4e0._0_4_;
          fVar205 = (float)local_260._4_4_ * (float)local_4e0._4_4_;
          fVar171 = fStack_258 * fStack_4d8;
          fVar173 = fStack_254 * fStack_4d4;
          fVar223 = fStack_250 * fStack_4d0;
          fVar175 = fStack_24c * fStack_4cc;
          fVar176 = fStack_248 * fStack_4c8;
          local_4a0._0_4_ = auVar133._0_4_;
          local_4a0._4_4_ = auVar133._4_4_;
          fStack_498 = auVar133._8_4_;
          fStack_494 = auVar133._12_4_;
          fStack_490 = auVar133._16_4_;
          fStack_48c = auVar133._20_4_;
          fStack_488 = auVar133._24_4_;
          pfVar1 = (float *)(lVar150 + 0x2201640 + lVar148 * 4);
          fVar257 = *pfVar1;
          fVar259 = pfVar1[1];
          fVar261 = pfVar1[2];
          fVar244 = pfVar1[3];
          fVar292 = pfVar1[4];
          fVar294 = pfVar1[5];
          fVar295 = pfVar1[6];
          pfVar3 = (float *)(lVar150 + 0x2201ac4 + lVar148 * 4);
          fVar296 = *pfVar3;
          fVar254 = pfVar3[1];
          fVar199 = pfVar3[2];
          fVar297 = pfVar3[3];
          fVar322 = pfVar3[4];
          fVar256 = pfVar3[5];
          fVar200 = pfVar3[6];
          _local_4e0 = auVar381;
          pfVar4 = (float *)(lVar150 + 0x22011bc + lVar148 * 4);
          fVar324 = *pfVar4;
          fVar325 = pfVar4[1];
          fVar258 = pfVar4[2];
          fVar201 = pfVar4[3];
          fVar326 = pfVar4[4];
          fVar327 = pfVar4[5];
          fVar260 = pfVar4[6];
          fVar177 = pfVar1[7] + pfVar3[7];
          fVar204 = pfVar3[7] + auVar381._28_4_ + 0.0;
          fVar298 = auVar381._28_4_ + auVar273._28_4_ + auVar381._28_4_ + 0.0;
          pfVar1 = (float *)(lVar150 + 0x2200d38 + lVar148 * 4);
          fVar202 = *pfVar1;
          fVar347 = pfVar1[1];
          fVar350 = pfVar1[2];
          fVar262 = pfVar1[3];
          fVar351 = pfVar1[4];
          fVar357 = pfVar1[5];
          fVar358 = pfVar1[6];
          local_4c0 = fVar202 * (float)local_640._0_4_ +
                      (float)local_340._0_4_ * fVar324 +
                      (float)local_6a0._0_4_ * fVar257 + (float)local_360._0_4_ * fVar296;
          fStack_4bc = fVar347 * (float)local_640._4_4_ +
                       (float)local_340._4_4_ * fVar325 +
                       (float)local_6a0._4_4_ * fVar259 + (float)local_360._4_4_ * fVar254;
          fStack_4b8 = fVar350 * fStack_638 +
                       fStack_338 * fVar258 + fStack_698 * fVar261 + fStack_358 * fVar199;
          fStack_4b4 = fVar262 * fStack_634 +
                       fStack_334 * fVar201 + fStack_694 * fVar244 + fStack_354 * fVar297;
          fStack_4b0 = fVar351 * fStack_630 +
                       fStack_330 * fVar326 + fStack_690 * fVar292 + fStack_350 * fVar322;
          fStack_4ac = fVar357 * fStack_62c +
                       fStack_32c * fVar327 + fStack_68c * fVar294 + fStack_34c * fVar256;
          fStack_4a8 = fVar358 * fStack_628 +
                       fStack_328 * fVar260 + fStack_688 * fVar295 + fStack_348 * fVar200;
          fStack_4a4 = fVar177 + fVar204;
          auVar189._0_4_ =
               fVar277 * fVar202 +
               (float)local_740._0_4_ * fVar257 + (float)local_480._0_4_ * fVar296 +
               fVar324 * (float)local_620._0_4_;
          auVar189._4_4_ =
               fVar278 * fVar347 +
               (float)local_740._4_4_ * fVar259 + (float)local_480._4_4_ * fVar254 +
               fVar325 * (float)local_620._4_4_;
          auVar189._8_4_ =
               fVar279 * fVar350 +
               fStack_738 * fVar261 + fStack_478 * fVar199 + fVar258 * fStack_618;
          auVar189._12_4_ =
               fVar280 * fVar262 +
               fStack_734 * fVar244 + fStack_474 * fVar297 + fVar201 * fStack_614;
          auVar189._16_4_ =
               fVar281 * fVar351 +
               fStack_730 * fVar292 + fStack_470 * fVar322 + fVar326 * fStack_610;
          auVar189._20_4_ =
               fVar288 * fVar357 +
               fStack_72c * fVar294 + fStack_46c * fVar256 + fVar327 * fStack_60c;
          auVar189._24_4_ =
               fVar290 * fVar358 +
               fStack_728 * fVar295 + fStack_468 * fVar200 + fVar260 * fStack_608;
          auVar189._28_4_ = fVar204 + fVar298;
          auVar376._0_4_ =
               fVar324 * (float)local_260._0_4_ +
               (float)local_280._0_4_ * fVar257 + (float)local_520._0_4_ * fVar296 +
               fVar202 * (float)local_500._0_4_;
          auVar376._4_4_ =
               fVar325 * (float)local_260._4_4_ +
               (float)local_280._4_4_ * fVar259 + (float)local_520._4_4_ * fVar254 +
               fVar347 * (float)local_500._4_4_;
          auVar376._8_4_ =
               fVar258 * fStack_258 + fStack_278 * fVar261 + fStack_518 * fVar199 +
               fVar350 * fStack_4f8;
          auVar376._12_4_ =
               fVar201 * fStack_254 + fStack_274 * fVar244 + fStack_514 * fVar297 +
               fVar262 * fStack_4f4;
          auVar376._16_4_ =
               fVar326 * fStack_250 + fStack_270 * fVar292 + fStack_510 * fVar322 +
               fVar351 * fStack_4f0;
          auVar376._20_4_ =
               fVar327 * fStack_24c + fStack_26c * fVar294 + fStack_50c * fVar256 +
               fVar357 * fStack_4ec;
          auVar376._24_4_ =
               fVar260 * fStack_248 + fStack_268 * fVar295 + fStack_508 * fVar200 +
               fVar358 * fStack_4e8;
          auVar376._28_4_ = pfVar4[7] + fVar177 + fVar298;
          pfVar1 = (float *)(lVar150 + 0x2203a60 + lVar148 * 4);
          fVar257 = *pfVar1;
          fVar259 = pfVar1[1];
          fVar261 = pfVar1[2];
          fVar244 = pfVar1[3];
          fVar277 = pfVar1[4];
          fVar278 = pfVar1[5];
          fVar279 = pfVar1[6];
          pfVar3 = (float *)(lVar150 + 0x2203ee4 + lVar148 * 4);
          fVar280 = *pfVar3;
          fVar281 = pfVar3[1];
          fVar288 = pfVar3[2];
          fVar290 = pfVar3[3];
          fVar292 = pfVar3[4];
          fVar294 = pfVar3[5];
          fVar295 = pfVar3[6];
          pfVar4 = (float *)(lVar150 + 0x22035dc + lVar148 * 4);
          fVar296 = *pfVar4;
          fVar254 = pfVar4[1];
          fVar199 = pfVar4[2];
          fVar297 = pfVar4[3];
          fVar322 = pfVar4[4];
          fVar256 = pfVar4[5];
          fVar200 = pfVar4[6];
          pfVar5 = (float *)(lVar150 + 0x2203158 + lVar148 * 4);
          fVar324 = *pfVar5;
          fVar325 = pfVar5[1];
          fVar258 = pfVar5[2];
          fVar201 = pfVar5[3];
          fVar326 = pfVar5[4];
          fVar327 = pfVar5[5];
          fVar260 = pfVar5[6];
          auVar333._0_4_ =
               fVar324 * (float)local_640._0_4_ +
               (float)local_340._0_4_ * fVar296 +
               (float)local_6a0._0_4_ * fVar257 + (float)local_360._0_4_ * fVar280;
          auVar333._4_4_ =
               fVar325 * (float)local_640._4_4_ +
               (float)local_340._4_4_ * fVar254 +
               (float)local_6a0._4_4_ * fVar259 + (float)local_360._4_4_ * fVar281;
          auVar333._8_4_ =
               fVar258 * fStack_638 +
               fStack_338 * fVar199 + fStack_698 * fVar261 + fStack_358 * fVar288;
          auVar333._12_4_ =
               fVar201 * fStack_634 +
               fStack_334 * fVar297 + fStack_694 * fVar244 + fStack_354 * fVar290;
          auVar333._16_4_ =
               fVar326 * fStack_630 +
               fStack_330 * fVar322 + fStack_690 * fVar277 + fStack_350 * fVar292;
          auVar333._20_4_ =
               fVar327 * fStack_62c +
               fStack_32c * fVar256 + fStack_68c * fVar278 + fStack_34c * fVar294;
          auVar333._24_4_ =
               fVar260 * fStack_628 +
               fStack_328 * fVar200 + fStack_688 * fVar279 + fStack_348 * fVar295;
          auVar333._28_4_ = fStack_324 + fStack_324 + fStack_344 + fStack_324;
          auVar368._0_4_ =
               fVar324 * (float)local_600._0_4_ +
               fVar296 * (float)local_620._0_4_ +
               (float)local_740._0_4_ * fVar257 + (float)local_480._0_4_ * fVar280;
          auVar368._4_4_ =
               fVar325 * (float)local_600._4_4_ +
               fVar254 * (float)local_620._4_4_ +
               (float)local_740._4_4_ * fVar259 + (float)local_480._4_4_ * fVar281;
          auVar368._8_4_ =
               fVar258 * fStack_5f8 +
               fVar199 * fStack_618 + fStack_738 * fVar261 + fStack_478 * fVar288;
          auVar368._12_4_ =
               fVar201 * fStack_5f4 +
               fVar297 * fStack_614 + fStack_734 * fVar244 + fStack_474 * fVar290;
          auVar368._16_4_ =
               fVar326 * fStack_5f0 +
               fVar322 * fStack_610 + fStack_730 * fVar277 + fStack_470 * fVar292;
          auVar368._20_4_ =
               fVar327 * fStack_5ec +
               fVar256 * fStack_60c + fStack_72c * fVar278 + fStack_46c * fVar294;
          auVar368._24_4_ =
               fVar260 * fStack_5e8 +
               fVar200 * fStack_608 + fStack_728 * fVar279 + fStack_468 * fVar295;
          auVar368._28_4_ = fStack_324 + fStack_324 + fStack_464 + fStack_324;
          auVar272._8_4_ = 0x7fffffff;
          auVar272._0_8_ = 0x7fffffff7fffffff;
          auVar272._12_4_ = 0x7fffffff;
          auVar272._16_4_ = 0x7fffffff;
          auVar272._20_4_ = 0x7fffffff;
          auVar272._24_4_ = 0x7fffffff;
          auVar272._28_4_ = 0x7fffffff;
          auVar130._4_4_ = fStack_4bc;
          auVar130._0_4_ = local_4c0;
          auVar130._8_4_ = fStack_4b8;
          auVar130._12_4_ = fStack_4b4;
          auVar130._16_4_ = fStack_4b0;
          auVar130._20_4_ = fStack_4ac;
          auVar130._24_4_ = fStack_4a8;
          auVar130._28_4_ = fStack_4a4;
          auVar216 = vandps_avx(auVar130,auVar272);
          auVar26 = vandps_avx(auVar189,auVar272);
          auVar26 = vmaxps_avx(auVar216,auVar26);
          auVar216 = vandps_avx(auVar376,auVar272);
          auVar26 = vmaxps_avx(auVar26,auVar216);
          auVar26 = vcmpps_avx(auVar26,_local_2a0,1);
          auVar27 = vblendvps_avx(auVar130,auVar24,auVar26);
          auVar164._0_4_ =
               fVar324 * (float)local_500._0_4_ +
               fVar296 * (float)local_260._0_4_ +
               fVar280 * (float)local_520._0_4_ + (float)local_280._0_4_ * fVar257;
          auVar164._4_4_ =
               fVar325 * (float)local_500._4_4_ +
               fVar254 * (float)local_260._4_4_ +
               fVar281 * (float)local_520._4_4_ + (float)local_280._4_4_ * fVar259;
          auVar164._8_4_ =
               fVar258 * fStack_4f8 +
               fVar199 * fStack_258 + fVar288 * fStack_518 + fStack_278 * fVar261;
          auVar164._12_4_ =
               fVar201 * fStack_4f4 +
               fVar297 * fStack_254 + fVar290 * fStack_514 + fStack_274 * fVar244;
          auVar164._16_4_ =
               fVar326 * fStack_4f0 +
               fVar322 * fStack_250 + fVar292 * fStack_510 + fStack_270 * fVar277;
          auVar164._20_4_ =
               fVar327 * fStack_4ec +
               fVar256 * fStack_24c + fVar294 * fStack_50c + fStack_26c * fVar278;
          auVar164._24_4_ =
               fVar260 * fStack_4e8 +
               fVar200 * fStack_248 + fVar295 * fStack_508 + fStack_268 * fVar279;
          auVar164._28_4_ = auVar216._28_4_ + pfVar4[7] + pfVar3[7] + pfVar1[7];
          auVar28 = vblendvps_avx(auVar189,auVar25,auVar26);
          auVar216 = vandps_avx(auVar333,auVar272);
          auVar26 = vandps_avx(auVar368,auVar272);
          auVar29 = vmaxps_avx(auVar216,auVar26);
          auVar216 = vandps_avx(auVar164,auVar272);
          auVar216 = vmaxps_avx(auVar29,auVar216);
          local_560._0_4_ = auVar135._0_4_;
          local_560._4_4_ = auVar135._4_4_;
          fStack_558 = auVar135._8_4_;
          fStack_554 = auVar135._12_4_;
          fStack_550 = auVar135._16_4_;
          fStack_54c = auVar135._20_4_;
          fStack_548 = auVar135._24_4_;
          auVar26 = vcmpps_avx(auVar216,_local_2a0,1);
          auVar216 = vblendvps_avx(auVar333,auVar24,auVar26);
          auVar165._0_4_ =
               (float)local_500._0_4_ * (float)local_560._0_4_ +
               fVar151 + (float)local_280._0_4_ * (float)local_4a0._0_4_ +
                         (float)local_520._0_4_ * fVar203;
          auVar165._4_4_ =
               (float)local_500._4_4_ * (float)local_560._4_4_ +
               fVar205 + (float)local_280._4_4_ * (float)local_4a0._4_4_ +
                         (float)local_520._4_4_ * fVar306;
          auVar165._8_4_ =
               fStack_4f8 * fStack_558 + fVar171 + fStack_278 * fStack_498 + fStack_518 * fVar336;
          auVar165._12_4_ =
               fStack_4f4 * fStack_554 + fVar173 + fStack_274 * fStack_494 + fStack_514 * fVar169;
          auVar165._16_4_ =
               fStack_4f0 * fStack_550 + fVar223 + fStack_270 * fStack_490 + fStack_510 * fVar170;
          auVar165._20_4_ =
               fStack_4ec * fStack_54c + fVar175 + fStack_26c * fStack_48c + fStack_50c * fVar172;
          auVar165._24_4_ =
               fStack_4e8 * fStack_548 + fVar176 + fStack_268 * fStack_488 + fStack_508 * fVar174;
          auVar165._28_4_ = auVar29._28_4_ + fStack_564 + pfVar2[7] + 0.0;
          auVar24 = vblendvps_avx(auVar368,auVar25,auVar26);
          fVar169 = auVar27._0_4_;
          fVar170 = auVar27._4_4_;
          fVar172 = auVar27._8_4_;
          fVar174 = auVar27._12_4_;
          fVar351 = auVar27._16_4_;
          fVar357 = auVar27._20_4_;
          fVar358 = auVar27._24_4_;
          fVar151 = auVar27._28_4_;
          fVar296 = auVar216._0_4_;
          fVar199 = auVar216._4_4_;
          fVar322 = auVar216._8_4_;
          fVar200 = auVar216._12_4_;
          fVar325 = auVar216._16_4_;
          fVar201 = auVar216._20_4_;
          fVar327 = auVar216._24_4_;
          fVar257 = auVar28._0_4_;
          fVar261 = auVar28._4_4_;
          fVar277 = auVar28._8_4_;
          fVar279 = auVar28._12_4_;
          fVar281 = auVar28._16_4_;
          fVar290 = auVar28._20_4_;
          fVar294 = auVar28._24_4_;
          auVar345._0_4_ = fVar257 * fVar257 + fVar169 * fVar169;
          auVar345._4_4_ = fVar261 * fVar261 + fVar170 * fVar170;
          auVar345._8_4_ = fVar277 * fVar277 + fVar172 * fVar172;
          auVar345._12_4_ = fVar279 * fVar279 + fVar174 * fVar174;
          auVar345._16_4_ = fVar281 * fVar281 + fVar351 * fVar351;
          auVar345._20_4_ = fVar290 * fVar290 + fVar357 * fVar357;
          auVar345._24_4_ = fVar294 * fVar294 + fVar358 * fVar358;
          auVar345._28_4_ = fStack_324 + auVar25._28_4_;
          auVar25 = vrsqrtps_avx(auVar345);
          fVar259 = auVar25._0_4_;
          fVar244 = auVar25._4_4_;
          auVar90._4_4_ = fVar244 * 1.5;
          auVar90._0_4_ = fVar259 * 1.5;
          fVar278 = auVar25._8_4_;
          auVar90._8_4_ = fVar278 * 1.5;
          fVar280 = auVar25._12_4_;
          auVar90._12_4_ = fVar280 * 1.5;
          fVar288 = auVar25._16_4_;
          auVar90._16_4_ = fVar288 * 1.5;
          fVar292 = auVar25._20_4_;
          auVar90._20_4_ = fVar292 * 1.5;
          fVar295 = auVar25._24_4_;
          auVar90._24_4_ = fVar295 * 1.5;
          auVar90._28_4_ = auVar368._28_4_;
          auVar91._4_4_ = fVar244 * fVar244 * fVar244 * auVar345._4_4_ * 0.5;
          auVar91._0_4_ = fVar259 * fVar259 * fVar259 * auVar345._0_4_ * 0.5;
          auVar91._8_4_ = fVar278 * fVar278 * fVar278 * auVar345._8_4_ * 0.5;
          auVar91._12_4_ = fVar280 * fVar280 * fVar280 * auVar345._12_4_ * 0.5;
          auVar91._16_4_ = fVar288 * fVar288 * fVar288 * auVar345._16_4_ * 0.5;
          auVar91._20_4_ = fVar292 * fVar292 * fVar292 * auVar345._20_4_ * 0.5;
          auVar91._24_4_ = fVar295 * fVar295 * fVar295 * auVar345._24_4_ * 0.5;
          auVar91._28_4_ = auVar345._28_4_;
          auVar26 = vsubps_avx(auVar90,auVar91);
          fVar202 = auVar26._0_4_;
          fVar347 = auVar26._4_4_;
          fVar350 = auVar26._8_4_;
          fVar262 = auVar26._12_4_;
          fVar203 = auVar26._16_4_;
          fVar306 = auVar26._20_4_;
          fVar336 = auVar26._24_4_;
          fVar259 = auVar24._0_4_;
          fVar244 = auVar24._4_4_;
          fVar278 = auVar24._8_4_;
          fVar280 = auVar24._12_4_;
          fVar288 = auVar24._16_4_;
          fVar292 = auVar24._20_4_;
          fVar295 = auVar24._24_4_;
          auVar316._0_4_ = fVar259 * fVar259 + fVar296 * fVar296;
          auVar316._4_4_ = fVar244 * fVar244 + fVar199 * fVar199;
          auVar316._8_4_ = fVar278 * fVar278 + fVar322 * fVar322;
          auVar316._12_4_ = fVar280 * fVar280 + fVar200 * fVar200;
          auVar316._16_4_ = fVar288 * fVar288 + fVar325 * fVar325;
          auVar316._20_4_ = fVar292 * fVar292 + fVar201 * fVar201;
          auVar316._24_4_ = fVar295 * fVar295 + fVar327 * fVar327;
          auVar316._28_4_ = auVar25._28_4_ + auVar216._28_4_;
          auVar216 = vrsqrtps_avx(auVar316);
          fVar254 = auVar216._0_4_;
          fVar297 = auVar216._4_4_;
          auVar92._4_4_ = fVar297 * 1.5;
          auVar92._0_4_ = fVar254 * 1.5;
          fVar256 = auVar216._8_4_;
          auVar92._8_4_ = fVar256 * 1.5;
          fVar324 = auVar216._12_4_;
          auVar92._12_4_ = fVar324 * 1.5;
          fVar258 = auVar216._16_4_;
          auVar92._16_4_ = fVar258 * 1.5;
          fVar326 = auVar216._20_4_;
          auVar92._20_4_ = fVar326 * 1.5;
          fVar260 = auVar216._24_4_;
          auVar92._24_4_ = fVar260 * 1.5;
          auVar92._28_4_ = auVar368._28_4_;
          auVar93._4_4_ = fVar297 * fVar297 * fVar297 * auVar316._4_4_ * 0.5;
          auVar93._0_4_ = fVar254 * fVar254 * fVar254 * auVar316._0_4_ * 0.5;
          auVar93._8_4_ = fVar256 * fVar256 * fVar256 * auVar316._8_4_ * 0.5;
          auVar93._12_4_ = fVar324 * fVar324 * fVar324 * auVar316._12_4_ * 0.5;
          auVar93._16_4_ = fVar258 * fVar258 * fVar258 * auVar316._16_4_ * 0.5;
          auVar93._20_4_ = fVar326 * fVar326 * fVar326 * auVar316._20_4_ * 0.5;
          auVar93._24_4_ = fVar260 * fVar260 * fVar260 * auVar316._24_4_ * 0.5;
          auVar93._28_4_ = auVar316._28_4_;
          auVar24 = vsubps_avx(auVar92,auVar93);
          fVar254 = auVar24._0_4_;
          fVar297 = auVar24._4_4_;
          fVar256 = auVar24._8_4_;
          fVar324 = auVar24._12_4_;
          fVar258 = auVar24._16_4_;
          fVar326 = auVar24._20_4_;
          fVar260 = auVar24._24_4_;
          fVar257 = (float)local_760._0_4_ * fVar202 * fVar257;
          fVar261 = (float)local_760._4_4_ * fVar347 * fVar261;
          auVar94._4_4_ = fVar261;
          auVar94._0_4_ = fVar257;
          fVar277 = fStack_758 * fVar350 * fVar277;
          auVar94._8_4_ = fVar277;
          fVar279 = fStack_754 * fVar262 * fVar279;
          auVar94._12_4_ = fVar279;
          fVar281 = fStack_750 * fVar203 * fVar281;
          auVar94._16_4_ = fVar281;
          fVar290 = fStack_74c * fVar306 * fVar290;
          auVar94._20_4_ = fVar290;
          fVar294 = fStack_748 * fVar336 * fVar294;
          auVar94._24_4_ = fVar294;
          auVar94._28_4_ = auVar216._28_4_;
          local_560._4_4_ = fVar261 + local_5a0._4_4_;
          local_560._0_4_ = fVar257 + local_5a0._0_4_;
          fStack_558 = fVar277 + local_5a0._8_4_;
          fStack_554 = fVar279 + local_5a0._12_4_;
          fStack_550 = fVar281 + local_5a0._16_4_;
          fStack_54c = fVar290 + local_5a0._20_4_;
          fStack_548 = fVar294 + local_5a0._24_4_;
          fStack_544 = auVar216._28_4_ + local_5a0._28_4_;
          fVar257 = (float)local_760._0_4_ * fVar202 * -fVar169;
          fVar261 = (float)local_760._4_4_ * fVar347 * -fVar170;
          auVar95._4_4_ = fVar261;
          auVar95._0_4_ = fVar257;
          fVar277 = fStack_758 * fVar350 * -fVar172;
          auVar95._8_4_ = fVar277;
          fVar279 = fStack_754 * fVar262 * -fVar174;
          auVar95._12_4_ = fVar279;
          fVar281 = fStack_750 * fVar203 * -fVar351;
          auVar95._16_4_ = fVar281;
          fVar290 = fStack_74c * fVar306 * -fVar357;
          auVar95._20_4_ = fVar290;
          fVar294 = fStack_748 * fVar336 * -fVar358;
          auVar95._24_4_ = fVar294;
          auVar95._28_4_ = -fVar151;
          local_4a0._4_4_ = auVar222._4_4_ + fVar261;
          local_4a0._0_4_ = auVar222._0_4_ + fVar257;
          fStack_498 = auVar222._8_4_ + fVar277;
          fStack_494 = auVar222._12_4_ + fVar279;
          fStack_490 = auVar222._16_4_ + fVar281;
          fStack_48c = auVar222._20_4_ + fVar290;
          fStack_488 = auVar222._24_4_ + fVar294;
          fStack_484 = auVar222._28_4_ + -fVar151;
          fVar257 = fVar202 * 0.0 * (float)local_760._0_4_;
          fVar261 = fVar347 * 0.0 * (float)local_760._4_4_;
          auVar96._4_4_ = fVar261;
          auVar96._0_4_ = fVar257;
          fVar277 = fVar350 * 0.0 * fStack_758;
          auVar96._8_4_ = fVar277;
          fVar279 = fVar262 * 0.0 * fStack_754;
          auVar96._12_4_ = fVar279;
          fVar281 = fVar203 * 0.0 * fStack_750;
          auVar96._16_4_ = fVar281;
          fVar290 = fVar306 * 0.0 * fStack_74c;
          auVar96._20_4_ = fVar290;
          fVar294 = fVar336 * 0.0 * fStack_748;
          auVar96._24_4_ = fVar294;
          auVar96._28_4_ = fVar151;
          auVar29 = vsubps_avx(local_5a0,auVar94);
          auVar392._0_4_ = fVar257 + auVar165._0_4_;
          auVar392._4_4_ = fVar261 + auVar165._4_4_;
          auVar392._8_4_ = fVar277 + auVar165._8_4_;
          auVar392._12_4_ = fVar279 + auVar165._12_4_;
          auVar392._16_4_ = fVar281 + auVar165._16_4_;
          auVar392._20_4_ = fVar290 + auVar165._20_4_;
          auVar392._24_4_ = fVar294 + auVar165._24_4_;
          auVar392._28_4_ = fVar151 + auVar165._28_4_;
          fVar257 = auVar381._0_4_ * fVar254 * fVar259;
          fVar259 = auVar381._4_4_ * fVar297 * fVar244;
          auVar97._4_4_ = fVar259;
          auVar97._0_4_ = fVar257;
          fVar261 = auVar381._8_4_ * fVar256 * fVar278;
          auVar97._8_4_ = fVar261;
          fVar244 = auVar381._12_4_ * fVar324 * fVar280;
          auVar97._12_4_ = fVar244;
          fVar277 = auVar381._16_4_ * fVar258 * fVar288;
          auVar97._16_4_ = fVar277;
          fVar278 = auVar381._20_4_ * fVar326 * fVar292;
          auVar97._20_4_ = fVar278;
          fVar279 = auVar381._24_4_ * fVar260 * fVar295;
          auVar97._24_4_ = fVar279;
          auVar97._28_4_ = fStack_744;
          auVar44 = vsubps_avx(auVar222,auVar95);
          auVar377._0_4_ = local_540._0_4_ + fVar257;
          auVar377._4_4_ = local_540._4_4_ + fVar259;
          auVar377._8_4_ = local_540._8_4_ + fVar261;
          auVar377._12_4_ = local_540._12_4_ + fVar244;
          auVar377._16_4_ = local_540._16_4_ + fVar277;
          auVar377._20_4_ = local_540._20_4_ + fVar278;
          auVar377._24_4_ = local_540._24_4_ + fVar279;
          auVar377._28_4_ = local_540._28_4_ + fStack_744;
          fVar257 = fVar254 * -fVar296 * auVar381._0_4_;
          fVar259 = fVar297 * -fVar199 * auVar381._4_4_;
          auVar98._4_4_ = fVar259;
          auVar98._0_4_ = fVar257;
          fVar261 = fVar256 * -fVar322 * auVar381._8_4_;
          auVar98._8_4_ = fVar261;
          fVar244 = fVar324 * -fVar200 * auVar381._12_4_;
          auVar98._12_4_ = fVar244;
          fVar277 = fVar258 * -fVar325 * auVar381._16_4_;
          auVar98._16_4_ = fVar277;
          fVar278 = fVar326 * -fVar201 * auVar381._20_4_;
          auVar98._20_4_ = fVar278;
          fVar279 = fVar260 * -fVar327 * auVar381._24_4_;
          auVar98._24_4_ = fVar279;
          auVar98._28_4_ = local_5a0._28_4_;
          auVar154 = vsubps_avx(auVar165,auVar96);
          auVar251._0_4_ = local_400._0_4_ + fVar257;
          auVar251._4_4_ = local_400._4_4_ + fVar259;
          auVar251._8_4_ = local_400._8_4_ + fVar261;
          auVar251._12_4_ = local_400._12_4_ + fVar244;
          auVar251._16_4_ = local_400._16_4_ + fVar277;
          auVar251._20_4_ = local_400._20_4_ + fVar278;
          auVar251._24_4_ = local_400._24_4_ + fVar279;
          auVar251._28_4_ = local_400._28_4_ + local_5a0._28_4_;
          fVar257 = fVar254 * 0.0 * auVar381._0_4_;
          fVar259 = fVar297 * 0.0 * auVar381._4_4_;
          auVar99._4_4_ = fVar259;
          auVar99._0_4_ = fVar257;
          fVar261 = fVar256 * 0.0 * auVar381._8_4_;
          auVar99._8_4_ = fVar261;
          fVar244 = fVar324 * 0.0 * auVar381._12_4_;
          auVar99._12_4_ = fVar244;
          fVar277 = fVar258 * 0.0 * auVar381._16_4_;
          auVar99._16_4_ = fVar277;
          fVar278 = fVar326 * 0.0 * auVar381._20_4_;
          auVar99._20_4_ = fVar278;
          fVar279 = fVar260 * 0.0 * auVar381._24_4_;
          auVar99._24_4_ = fVar279;
          auVar99._28_4_ = auVar165._28_4_;
          auVar216 = vsubps_avx(local_540,auVar97);
          auVar334._0_4_ = (float)local_580._0_4_ + fVar257;
          auVar334._4_4_ = (float)local_580._4_4_ + fVar259;
          auVar334._8_4_ = fStack_578 + fVar261;
          auVar334._12_4_ = fStack_574 + fVar244;
          auVar334._16_4_ = fStack_570 + fVar277;
          auVar334._20_4_ = fStack_56c + fVar278;
          auVar334._24_4_ = fStack_568 + fVar279;
          auVar334._28_4_ = fStack_564 + auVar165._28_4_;
          auVar25 = vsubps_avx(local_400,auVar98);
          auVar26 = vsubps_avx(_local_580,auVar99);
          auVar27 = vsubps_avx(auVar251,auVar44);
          auVar28 = vsubps_avx(auVar334,auVar154);
          auVar100._4_4_ = auVar154._4_4_ * auVar27._4_4_;
          auVar100._0_4_ = auVar154._0_4_ * auVar27._0_4_;
          auVar100._8_4_ = auVar154._8_4_ * auVar27._8_4_;
          auVar100._12_4_ = auVar154._12_4_ * auVar27._12_4_;
          auVar100._16_4_ = auVar154._16_4_ * auVar27._16_4_;
          auVar100._20_4_ = auVar154._20_4_ * auVar27._20_4_;
          auVar100._24_4_ = auVar154._24_4_ * auVar27._24_4_;
          auVar100._28_4_ = auVar368._28_4_;
          auVar101._4_4_ = auVar44._4_4_ * auVar28._4_4_;
          auVar101._0_4_ = auVar44._0_4_ * auVar28._0_4_;
          auVar101._8_4_ = auVar44._8_4_ * auVar28._8_4_;
          auVar101._12_4_ = auVar44._12_4_ * auVar28._12_4_;
          auVar101._16_4_ = auVar44._16_4_ * auVar28._16_4_;
          auVar101._20_4_ = auVar44._20_4_ * auVar28._20_4_;
          auVar101._24_4_ = auVar44._24_4_ * auVar28._24_4_;
          auVar101._28_4_ = fStack_564;
          auVar30 = vsubps_avx(auVar101,auVar100);
          auVar102._4_4_ = auVar29._4_4_ * auVar28._4_4_;
          auVar102._0_4_ = auVar29._0_4_ * auVar28._0_4_;
          auVar102._8_4_ = auVar29._8_4_ * auVar28._8_4_;
          auVar102._12_4_ = auVar29._12_4_ * auVar28._12_4_;
          auVar102._16_4_ = auVar29._16_4_ * auVar28._16_4_;
          auVar102._20_4_ = auVar29._20_4_ * auVar28._20_4_;
          auVar102._24_4_ = auVar29._24_4_ * auVar28._24_4_;
          auVar102._28_4_ = auVar28._28_4_;
          auVar28 = vsubps_avx(auVar377,auVar29);
          auVar103._4_4_ = auVar154._4_4_ * auVar28._4_4_;
          auVar103._0_4_ = auVar154._0_4_ * auVar28._0_4_;
          auVar103._8_4_ = auVar154._8_4_ * auVar28._8_4_;
          auVar103._12_4_ = auVar154._12_4_ * auVar28._12_4_;
          auVar103._16_4_ = auVar154._16_4_ * auVar28._16_4_;
          auVar103._20_4_ = auVar154._20_4_ * auVar28._20_4_;
          auVar103._24_4_ = auVar154._24_4_ * auVar28._24_4_;
          auVar103._28_4_ = auVar24._28_4_;
          auVar31 = vsubps_avx(auVar103,auVar102);
          auVar104._4_4_ = auVar44._4_4_ * auVar28._4_4_;
          auVar104._0_4_ = auVar44._0_4_ * auVar28._0_4_;
          auVar104._8_4_ = auVar44._8_4_ * auVar28._8_4_;
          auVar104._12_4_ = auVar44._12_4_ * auVar28._12_4_;
          auVar104._16_4_ = auVar44._16_4_ * auVar28._16_4_;
          auVar104._20_4_ = auVar44._20_4_ * auVar28._20_4_;
          auVar104._24_4_ = auVar44._24_4_ * auVar28._24_4_;
          auVar104._28_4_ = auVar24._28_4_;
          auVar105._4_4_ = auVar29._4_4_ * auVar27._4_4_;
          auVar105._0_4_ = auVar29._0_4_ * auVar27._0_4_;
          auVar105._8_4_ = auVar29._8_4_ * auVar27._8_4_;
          auVar105._12_4_ = auVar29._12_4_ * auVar27._12_4_;
          auVar105._16_4_ = auVar29._16_4_ * auVar27._16_4_;
          auVar105._20_4_ = auVar29._20_4_ * auVar27._20_4_;
          auVar105._24_4_ = auVar29._24_4_ * auVar27._24_4_;
          auVar105._28_4_ = auVar27._28_4_;
          auVar24 = vsubps_avx(auVar105,auVar104);
          auVar190._0_4_ = auVar30._0_4_ * 0.0 + auVar24._0_4_ + auVar31._0_4_ * 0.0;
          auVar190._4_4_ = auVar30._4_4_ * 0.0 + auVar24._4_4_ + auVar31._4_4_ * 0.0;
          auVar190._8_4_ = auVar30._8_4_ * 0.0 + auVar24._8_4_ + auVar31._8_4_ * 0.0;
          auVar190._12_4_ = auVar30._12_4_ * 0.0 + auVar24._12_4_ + auVar31._12_4_ * 0.0;
          auVar190._16_4_ = auVar30._16_4_ * 0.0 + auVar24._16_4_ + auVar31._16_4_ * 0.0;
          auVar190._20_4_ = auVar30._20_4_ * 0.0 + auVar24._20_4_ + auVar31._20_4_ * 0.0;
          auVar190._24_4_ = auVar30._24_4_ * 0.0 + auVar24._24_4_ + auVar31._24_4_ * 0.0;
          auVar190._28_4_ = auVar30._28_4_ + auVar24._28_4_ + auVar31._28_4_;
          auVar23 = vcmpps_avx(auVar190,ZEXT832(0) << 0x20,2);
          auVar216 = vblendvps_avx(auVar216,_local_560,auVar23);
          auVar24 = vblendvps_avx(auVar25,_local_4a0,auVar23);
          auVar25 = vblendvps_avx(auVar26,auVar392,auVar23);
          auVar26 = vblendvps_avx(auVar29,auVar377,auVar23);
          auVar27 = vblendvps_avx(auVar44,auVar251,auVar23);
          auVar28 = vblendvps_avx(auVar154,auVar334,auVar23);
          auVar29 = vblendvps_avx(auVar377,auVar29,auVar23);
          auVar30 = vblendvps_avx(auVar251,auVar44,auVar23);
          auVar31 = vblendvps_avx(auVar334,auVar154,auVar23);
          _local_780 = vandps_avx(local_380,_local_3c0);
          auVar29 = vsubps_avx(auVar29,auVar216);
          auVar155 = vsubps_avx(auVar30,auVar24);
          auVar31 = vsubps_avx(auVar31,auVar25);
          auVar182 = vsubps_avx(auVar24,auVar27);
          fVar257 = auVar155._0_4_;
          fVar177 = auVar25._0_4_;
          fVar280 = auVar155._4_4_;
          fVar204 = auVar25._4_4_;
          auVar106._4_4_ = fVar204 * fVar280;
          auVar106._0_4_ = fVar177 * fVar257;
          fVar296 = auVar155._8_4_;
          fVar298 = auVar25._8_4_;
          auVar106._8_4_ = fVar298 * fVar296;
          fVar324 = auVar155._12_4_;
          fVar226 = auVar25._12_4_;
          auVar106._12_4_ = fVar226 * fVar324;
          fVar202 = auVar155._16_4_;
          fVar266 = auVar25._16_4_;
          auVar106._16_4_ = fVar266 * fVar202;
          fVar169 = auVar155._20_4_;
          fVar275 = auVar25._20_4_;
          auVar106._20_4_ = fVar275 * fVar169;
          fVar151 = auVar155._24_4_;
          auVar359._0_4_ = auVar25._24_4_;
          auVar106._24_4_ = auVar359._0_4_ * fVar151;
          auVar106._28_4_ = auVar30._28_4_;
          fVar259 = auVar24._0_4_;
          fVar206 = auVar31._0_4_;
          fVar281 = auVar24._4_4_;
          fVar224 = auVar31._4_4_;
          auVar107._4_4_ = fVar224 * fVar281;
          auVar107._0_4_ = fVar206 * fVar259;
          fVar254 = auVar24._8_4_;
          fVar225 = auVar31._8_4_;
          auVar107._8_4_ = fVar225 * fVar254;
          fVar325 = auVar24._12_4_;
          fVar307 = auVar31._12_4_;
          auVar107._12_4_ = fVar307 * fVar325;
          fVar347 = auVar24._16_4_;
          fVar308 = auVar31._16_4_;
          auVar107._16_4_ = fVar308 * fVar347;
          fVar170 = auVar24._20_4_;
          fVar319 = auVar31._20_4_;
          auVar107._20_4_ = fVar319 * fVar170;
          fVar205 = auVar24._24_4_;
          fVar320 = auVar31._24_4_;
          uVar149 = auVar44._28_4_;
          auVar107._24_4_ = fVar320 * fVar205;
          auVar107._28_4_ = uVar149;
          auVar30 = vsubps_avx(auVar107,auVar106);
          fVar261 = auVar216._0_4_;
          fVar288 = auVar216._4_4_;
          auVar108._4_4_ = fVar224 * fVar288;
          auVar108._0_4_ = fVar206 * fVar261;
          fVar199 = auVar216._8_4_;
          auVar108._8_4_ = fVar225 * fVar199;
          fVar258 = auVar216._12_4_;
          auVar108._12_4_ = fVar307 * fVar258;
          fVar350 = auVar216._16_4_;
          auVar108._16_4_ = fVar308 * fVar350;
          fVar172 = auVar216._20_4_;
          auVar108._20_4_ = fVar319 * fVar172;
          fVar171 = auVar216._24_4_;
          auVar108._24_4_ = fVar320 * fVar171;
          auVar108._28_4_ = uVar149;
          fVar244 = auVar29._0_4_;
          fVar290 = auVar29._4_4_;
          auVar109._4_4_ = fVar204 * fVar290;
          auVar109._0_4_ = fVar177 * fVar244;
          fVar297 = auVar29._8_4_;
          auVar109._8_4_ = fVar298 * fVar297;
          fVar201 = auVar29._12_4_;
          auVar109._12_4_ = fVar226 * fVar201;
          fVar262 = auVar29._16_4_;
          auVar109._16_4_ = fVar266 * fVar262;
          fVar174 = auVar29._20_4_;
          auVar109._20_4_ = fVar275 * fVar174;
          fVar173 = auVar29._24_4_;
          auVar109._24_4_ = auVar359._0_4_ * fVar173;
          auVar109._28_4_ = auVar377._28_4_;
          auVar44 = vsubps_avx(auVar109,auVar108);
          auVar110._4_4_ = fVar281 * fVar290;
          auVar110._0_4_ = fVar259 * fVar244;
          auVar110._8_4_ = fVar254 * fVar297;
          auVar110._12_4_ = fVar325 * fVar201;
          auVar110._16_4_ = fVar347 * fVar262;
          auVar110._20_4_ = fVar170 * fVar174;
          auVar110._24_4_ = fVar205 * fVar173;
          auVar110._28_4_ = uVar149;
          auVar111._4_4_ = fVar288 * fVar280;
          auVar111._0_4_ = fVar261 * fVar257;
          auVar111._8_4_ = fVar199 * fVar296;
          auVar111._12_4_ = fVar258 * fVar324;
          auVar111._16_4_ = fVar350 * fVar202;
          auVar111._20_4_ = fVar172 * fVar169;
          auVar111._24_4_ = fVar171 * fVar151;
          auVar111._28_4_ = auVar154._28_4_;
          auVar154 = vsubps_avx(auVar111,auVar110);
          auVar183 = vsubps_avx(auVar25,auVar28);
          fVar278 = auVar154._28_4_ + auVar44._28_4_;
          auVar346._0_4_ = auVar154._0_4_ + auVar44._0_4_ * 0.0 + auVar30._0_4_ * 0.0;
          auVar346._4_4_ = auVar154._4_4_ + auVar44._4_4_ * 0.0 + auVar30._4_4_ * 0.0;
          auVar346._8_4_ = auVar154._8_4_ + auVar44._8_4_ * 0.0 + auVar30._8_4_ * 0.0;
          auVar346._12_4_ = auVar154._12_4_ + auVar44._12_4_ * 0.0 + auVar30._12_4_ * 0.0;
          auVar346._16_4_ = auVar154._16_4_ + auVar44._16_4_ * 0.0 + auVar30._16_4_ * 0.0;
          auVar346._20_4_ = auVar154._20_4_ + auVar44._20_4_ * 0.0 + auVar30._20_4_ * 0.0;
          auVar346._24_4_ = auVar154._24_4_ + auVar44._24_4_ * 0.0 + auVar30._24_4_ * 0.0;
          auVar346._28_4_ = fVar278 + auVar30._28_4_;
          fVar277 = auVar182._0_4_;
          fVar292 = auVar182._4_4_;
          auVar112._4_4_ = auVar28._4_4_ * fVar292;
          auVar112._0_4_ = auVar28._0_4_ * fVar277;
          fVar322 = auVar182._8_4_;
          auVar112._8_4_ = auVar28._8_4_ * fVar322;
          fVar326 = auVar182._12_4_;
          auVar112._12_4_ = auVar28._12_4_ * fVar326;
          fVar203 = auVar182._16_4_;
          auVar112._16_4_ = auVar28._16_4_ * fVar203;
          fVar351 = auVar182._20_4_;
          auVar112._20_4_ = auVar28._20_4_ * fVar351;
          fVar223 = auVar182._24_4_;
          auVar112._24_4_ = auVar28._24_4_ * fVar223;
          auVar112._28_4_ = fVar278;
          fVar278 = auVar183._0_4_;
          fVar294 = auVar183._4_4_;
          auVar113._4_4_ = auVar27._4_4_ * fVar294;
          auVar113._0_4_ = auVar27._0_4_ * fVar278;
          fVar256 = auVar183._8_4_;
          auVar113._8_4_ = auVar27._8_4_ * fVar256;
          fVar327 = auVar183._12_4_;
          auVar113._12_4_ = auVar27._12_4_ * fVar327;
          fVar306 = auVar183._16_4_;
          auVar113._16_4_ = auVar27._16_4_ * fVar306;
          fVar357 = auVar183._20_4_;
          auVar113._20_4_ = auVar27._20_4_ * fVar357;
          fVar175 = auVar183._24_4_;
          auVar113._24_4_ = auVar27._24_4_ * fVar175;
          auVar113._28_4_ = auVar154._28_4_;
          auVar25 = vsubps_avx(auVar113,auVar112);
          auVar216 = vsubps_avx(auVar216,auVar26);
          fVar279 = auVar216._0_4_;
          fVar295 = auVar216._4_4_;
          auVar114._4_4_ = auVar28._4_4_ * fVar295;
          auVar114._0_4_ = auVar28._0_4_ * fVar279;
          fVar200 = auVar216._8_4_;
          auVar114._8_4_ = auVar28._8_4_ * fVar200;
          fVar260 = auVar216._12_4_;
          auVar114._12_4_ = auVar28._12_4_ * fVar260;
          fVar336 = auVar216._16_4_;
          auVar114._16_4_ = auVar28._16_4_ * fVar336;
          fVar358 = auVar216._20_4_;
          auVar114._20_4_ = auVar28._20_4_ * fVar358;
          fVar176 = auVar216._24_4_;
          auVar114._24_4_ = auVar28._24_4_ * fVar176;
          auVar114._28_4_ = auVar28._28_4_;
          auVar115._4_4_ = fVar294 * auVar26._4_4_;
          auVar115._0_4_ = fVar278 * auVar26._0_4_;
          auVar115._8_4_ = fVar256 * auVar26._8_4_;
          auVar115._12_4_ = fVar327 * auVar26._12_4_;
          auVar115._16_4_ = fVar306 * auVar26._16_4_;
          auVar115._20_4_ = fVar357 * auVar26._20_4_;
          auVar115._24_4_ = fVar175 * auVar26._24_4_;
          auVar115._28_4_ = auVar30._28_4_;
          auVar216 = vsubps_avx(auVar114,auVar115);
          auVar116._4_4_ = auVar27._4_4_ * fVar295;
          auVar116._0_4_ = auVar27._0_4_ * fVar279;
          auVar116._8_4_ = auVar27._8_4_ * fVar200;
          auVar116._12_4_ = auVar27._12_4_ * fVar260;
          auVar116._16_4_ = auVar27._16_4_ * fVar336;
          auVar116._20_4_ = auVar27._20_4_ * fVar358;
          auVar116._24_4_ = auVar27._24_4_ * fVar176;
          auVar116._28_4_ = auVar27._28_4_;
          auVar117._4_4_ = fVar292 * auVar26._4_4_;
          auVar117._0_4_ = fVar277 * auVar26._0_4_;
          auVar117._8_4_ = fVar322 * auVar26._8_4_;
          auVar117._12_4_ = fVar326 * auVar26._12_4_;
          auVar117._16_4_ = fVar203 * auVar26._16_4_;
          auVar117._20_4_ = fVar351 * auVar26._20_4_;
          auVar117._24_4_ = fVar223 * auVar26._24_4_;
          auVar117._28_4_ = auVar26._28_4_;
          auVar26 = vsubps_avx(auVar117,auVar116);
          auVar166._0_4_ = auVar25._0_4_ * 0.0 + auVar26._0_4_ + auVar216._0_4_ * 0.0;
          auVar166._4_4_ = auVar25._4_4_ * 0.0 + auVar26._4_4_ + auVar216._4_4_ * 0.0;
          auVar166._8_4_ = auVar25._8_4_ * 0.0 + auVar26._8_4_ + auVar216._8_4_ * 0.0;
          auVar166._12_4_ = auVar25._12_4_ * 0.0 + auVar26._12_4_ + auVar216._12_4_ * 0.0;
          auVar166._16_4_ = auVar25._16_4_ * 0.0 + auVar26._16_4_ + auVar216._16_4_ * 0.0;
          auVar166._20_4_ = auVar25._20_4_ * 0.0 + auVar26._20_4_ + auVar216._20_4_ * 0.0;
          auVar166._24_4_ = auVar25._24_4_ * 0.0 + auVar26._24_4_ + auVar216._24_4_ * 0.0;
          auVar166._28_4_ = auVar216._28_4_ + auVar26._28_4_ + auVar216._28_4_;
          auVar216 = vmaxps_avx(auVar346,auVar166);
          auVar25 = vcmpps_avx(auVar216,ZEXT1232(ZEXT412(0)) << 0x20,2);
          auVar26 = _local_780 & auVar25;
          auVar216 = auVar346;
          if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar26 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar26 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar26 >> 0x7f,0) == '\0') &&
                (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar26 >> 0xbf,0) == '\0') &&
              (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar26[0x1f]) {
LAB_00add086:
            auVar348 = auVar216._4_12_;
            auVar237 = ZEXT3264(CONCAT824(local_460[1]._24_8_,
                                          CONCAT816(local_460[1]._16_8_,
                                                    CONCAT88(local_460[1]._8_8_,local_460[1]._0_8_))
                                         ));
          }
          else {
            auVar216 = vandps_avx(auVar25,_local_780);
            auVar348 = auVar216._4_12_;
            auVar118._4_4_ = fVar294 * fVar280;
            auVar118._0_4_ = fVar278 * fVar257;
            auVar118._8_4_ = fVar256 * fVar296;
            auVar118._12_4_ = fVar327 * fVar324;
            auVar118._16_4_ = fVar306 * fVar202;
            auVar118._20_4_ = fVar357 * fVar169;
            auVar118._24_4_ = fVar175 * fVar151;
            auVar118._28_4_ = local_780._28_4_;
            auVar119._4_4_ = fVar292 * fVar224;
            auVar119._0_4_ = fVar277 * fVar206;
            auVar119._8_4_ = fVar322 * fVar225;
            auVar119._12_4_ = fVar326 * fVar307;
            auVar119._16_4_ = fVar203 * fVar308;
            auVar119._20_4_ = fVar351 * fVar319;
            auVar119._24_4_ = fVar223 * fVar320;
            auVar119._28_4_ = auVar25._28_4_;
            auVar26 = vsubps_avx(auVar119,auVar118);
            auVar120._4_4_ = fVar295 * fVar224;
            auVar120._0_4_ = fVar279 * fVar206;
            auVar120._8_4_ = fVar200 * fVar225;
            auVar120._12_4_ = fVar260 * fVar307;
            auVar120._16_4_ = fVar336 * fVar308;
            auVar120._20_4_ = fVar358 * fVar319;
            auVar120._24_4_ = fVar176 * fVar320;
            auVar120._28_4_ = auVar31._28_4_;
            auVar121._4_4_ = fVar294 * fVar290;
            auVar121._0_4_ = fVar278 * fVar244;
            auVar121._8_4_ = fVar256 * fVar297;
            auVar121._12_4_ = fVar327 * fVar201;
            auVar121._16_4_ = fVar306 * fVar262;
            auVar121._20_4_ = fVar357 * fVar174;
            auVar121._24_4_ = fVar175 * fVar173;
            auVar121._28_4_ = auVar183._28_4_;
            auVar27 = vsubps_avx(auVar121,auVar120);
            auVar122._4_4_ = fVar292 * fVar290;
            auVar122._0_4_ = fVar277 * fVar244;
            auVar122._8_4_ = fVar322 * fVar297;
            auVar122._12_4_ = fVar326 * fVar201;
            auVar122._16_4_ = fVar203 * fVar262;
            auVar122._20_4_ = fVar351 * fVar174;
            auVar122._24_4_ = fVar223 * fVar173;
            auVar122._28_4_ = auVar29._28_4_;
            auVar123._4_4_ = fVar295 * fVar280;
            auVar123._0_4_ = fVar279 * fVar257;
            auVar123._8_4_ = fVar200 * fVar296;
            auVar123._12_4_ = fVar260 * fVar324;
            auVar123._16_4_ = fVar336 * fVar202;
            auVar123._20_4_ = fVar358 * fVar169;
            auVar123._24_4_ = fVar176 * fVar151;
            auVar123._28_4_ = auVar155._28_4_;
            auVar28 = vsubps_avx(auVar123,auVar122);
            auVar317._0_4_ = auVar26._0_4_ * 0.0 + auVar28._0_4_ + auVar27._0_4_ * 0.0;
            auVar317._4_4_ = auVar26._4_4_ * 0.0 + auVar28._4_4_ + auVar27._4_4_ * 0.0;
            auVar317._8_4_ = auVar26._8_4_ * 0.0 + auVar28._8_4_ + auVar27._8_4_ * 0.0;
            auVar317._12_4_ = auVar26._12_4_ * 0.0 + auVar28._12_4_ + auVar27._12_4_ * 0.0;
            auVar317._16_4_ = auVar26._16_4_ * 0.0 + auVar28._16_4_ + auVar27._16_4_ * 0.0;
            auVar317._20_4_ = auVar26._20_4_ * 0.0 + auVar28._20_4_ + auVar27._20_4_ * 0.0;
            auVar317._24_4_ = auVar26._24_4_ * 0.0 + auVar28._24_4_ + auVar27._24_4_ * 0.0;
            auVar317._28_4_ = auVar182._28_4_ + auVar28._28_4_ + auVar29._28_4_;
            auVar25 = vrcpps_avx(auVar317);
            fVar244 = auVar25._0_4_;
            fVar277 = auVar25._4_4_;
            auVar124._4_4_ = auVar317._4_4_ * fVar277;
            auVar124._0_4_ = auVar317._0_4_ * fVar244;
            fVar278 = auVar25._8_4_;
            auVar124._8_4_ = auVar317._8_4_ * fVar278;
            fVar279 = auVar25._12_4_;
            auVar124._12_4_ = auVar317._12_4_ * fVar279;
            fVar280 = auVar25._16_4_;
            auVar124._16_4_ = auVar317._16_4_ * fVar280;
            fVar290 = auVar25._20_4_;
            auVar124._20_4_ = auVar317._20_4_ * fVar290;
            fVar292 = auVar25._24_4_;
            auVar124._24_4_ = auVar317._24_4_ * fVar292;
            auVar124._28_4_ = auVar183._28_4_;
            auVar369._8_4_ = 0x3f800000;
            auVar369._0_8_ = 0x3f8000003f800000;
            auVar369._12_4_ = 0x3f800000;
            auVar369._16_4_ = 0x3f800000;
            auVar369._20_4_ = 0x3f800000;
            auVar369._24_4_ = 0x3f800000;
            auVar369._28_4_ = 0x3f800000;
            auVar25 = vsubps_avx(auVar369,auVar124);
            fVar244 = auVar25._0_4_ * fVar244 + fVar244;
            fVar277 = auVar25._4_4_ * fVar277 + fVar277;
            fVar278 = auVar25._8_4_ * fVar278 + fVar278;
            fVar279 = auVar25._12_4_ * fVar279 + fVar279;
            fVar280 = auVar25._16_4_ * fVar280 + fVar280;
            fVar290 = auVar25._20_4_ * fVar290 + fVar290;
            fVar292 = auVar25._24_4_ * fVar292 + fVar292;
            auVar125._4_4_ =
                 (fVar288 * auVar26._4_4_ + auVar27._4_4_ * fVar281 + fVar204 * auVar28._4_4_) *
                 fVar277;
            auVar125._0_4_ =
                 (fVar261 * auVar26._0_4_ + auVar27._0_4_ * fVar259 + fVar177 * auVar28._0_4_) *
                 fVar244;
            auVar125._8_4_ =
                 (fVar199 * auVar26._8_4_ + auVar27._8_4_ * fVar254 + fVar298 * auVar28._8_4_) *
                 fVar278;
            auVar125._12_4_ =
                 (fVar258 * auVar26._12_4_ + auVar27._12_4_ * fVar325 + fVar226 * auVar28._12_4_) *
                 fVar279;
            auVar125._16_4_ =
                 (fVar350 * auVar26._16_4_ + auVar27._16_4_ * fVar347 + fVar266 * auVar28._16_4_) *
                 fVar280;
            auVar125._20_4_ =
                 (fVar172 * auVar26._20_4_ + auVar27._20_4_ * fVar170 + fVar275 * auVar28._20_4_) *
                 fVar290;
            auVar125._24_4_ =
                 (fVar171 * auVar26._24_4_ +
                 auVar27._24_4_ * fVar205 + auVar359._0_4_ * auVar28._24_4_) * fVar292;
            auVar125._28_4_ = auVar24._28_4_ + auVar28._28_4_;
            fVar257 = (ray->super_RayK<1>).tfar;
            auVar236._4_4_ = fVar257;
            auVar236._0_4_ = fVar257;
            auVar236._8_4_ = fVar257;
            auVar236._12_4_ = fVar257;
            auVar236._16_4_ = fVar257;
            auVar236._20_4_ = fVar257;
            auVar236._24_4_ = fVar257;
            auVar236._28_4_ = fVar257;
            auVar132._4_4_ = fStack_3dc;
            auVar132._0_4_ = local_3e0;
            auVar132._8_4_ = fStack_3d8;
            auVar132._12_4_ = fStack_3d4;
            auVar132._16_4_ = fStack_3d0;
            auVar132._20_4_ = fStack_3cc;
            auVar132._24_4_ = fStack_3c8;
            auVar132._28_4_ = fStack_3c4;
            auVar25 = vcmpps_avx(auVar132,auVar125,2);
            auVar24 = vcmpps_avx(auVar125,auVar236,2);
            auVar24 = vandps_avx(auVar25,auVar24);
            auVar26 = auVar216 & auVar24;
            if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar26 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar26 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar26 >> 0x7f,0) == '\0') &&
                  (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar26 >> 0xbf,0) == '\0') &&
                (auVar26 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar26[0x1f]) goto LAB_00add086;
            auVar216 = vandps_avx(auVar216,auVar24);
            auVar24 = vcmpps_avx(auVar317,ZEXT1232(ZEXT412(0)) << 0x20,4);
            auVar26 = auVar216 & auVar24;
            auVar237 = ZEXT3264(CONCAT824(local_460[1]._24_8_,
                                          CONCAT816(local_460[1]._16_8_,
                                                    CONCAT88(local_460[1]._8_8_,local_460[1]._0_8_))
                                         ));
            if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar26 >> 0x7f,0) != '\0') ||
                  (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar26 >> 0xbf,0) != '\0') ||
                (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar26[0x1f] < '\0') {
              auVar216 = vandps_avx(auVar24,auVar216);
              auVar237 = ZEXT3264(auVar216);
              auVar126._4_4_ = auVar346._4_4_ * fVar277;
              auVar126._0_4_ = auVar346._0_4_ * fVar244;
              auVar126._8_4_ = auVar346._8_4_ * fVar278;
              auVar126._12_4_ = auVar346._12_4_ * fVar279;
              auVar126._16_4_ = auVar346._16_4_ * fVar280;
              auVar126._20_4_ = auVar346._20_4_ * fVar290;
              auVar126._24_4_ = auVar346._24_4_ * fVar292;
              auVar126._28_4_ = auVar25._28_4_;
              auVar127._4_4_ = auVar166._4_4_ * fVar277;
              auVar127._0_4_ = auVar166._0_4_ * fVar244;
              auVar127._8_4_ = auVar166._8_4_ * fVar278;
              auVar127._12_4_ = auVar166._12_4_ * fVar279;
              auVar127._16_4_ = auVar166._16_4_ * fVar280;
              auVar127._20_4_ = auVar166._20_4_ * fVar290;
              auVar127._24_4_ = auVar166._24_4_ * fVar292;
              auVar127._28_4_ = auVar166._28_4_;
              auVar287._8_4_ = 0x3f800000;
              auVar287._0_8_ = 0x3f8000003f800000;
              auVar287._12_4_ = 0x3f800000;
              auVar287._16_4_ = 0x3f800000;
              auVar287._20_4_ = 0x3f800000;
              auVar287._24_4_ = 0x3f800000;
              auVar287._28_4_ = 0x3f800000;
              auVar216 = vsubps_avx(auVar287,auVar126);
              _local_420 = vblendvps_avx(auVar216,auVar126,auVar23);
              auVar216 = vsubps_avx(auVar287,auVar127);
              _local_320 = vblendvps_avx(auVar216,auVar127,auVar23);
              local_300 = auVar125;
            }
          }
          auVar335 = ZEXT3264(local_660);
          auVar318 = ZEXT3264(local_6c0);
          auVar216 = auVar237._0_32_;
          auVar305 = ZEXT3264(_local_620);
          if ((((((((auVar216 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar216 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar216 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar216 >> 0x7f,0) == '\0') &&
                (auVar237 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
               SUB321(auVar216 >> 0xbf,0) == '\0') &&
              (auVar237 & (undefined1  [64])0x100000000) == (undefined1  [64])0x0) &&
              -1 < auVar237[0x1f]) {
LAB_00adcdb0:
            auVar273 = ZEXT3264(_local_600);
            goto LAB_00adcdb9;
          }
          auVar24 = vsubps_avx(auVar381,_local_760);
          local_760._0_4_ = (float)local_760._0_4_ + auVar24._0_4_ * (float)local_420._0_4_;
          local_760._4_4_ = (float)local_760._4_4_ + auVar24._4_4_ * (float)local_420._4_4_;
          fStack_758 = fStack_758 + auVar24._8_4_ * fStack_418;
          fStack_754 = fStack_754 + auVar24._12_4_ * fStack_414;
          fStack_750 = fStack_750 + auVar24._16_4_ * fStack_410;
          fStack_74c = fStack_74c + auVar24._20_4_ * fStack_40c;
          fStack_748 = fStack_748 + auVar24._24_4_ * fStack_408;
          fStack_744 = fStack_744 + auVar24._28_4_;
          fVar257 = local_6f8->depth_scale;
          auVar128._4_4_ = ((float)local_760._4_4_ + (float)local_760._4_4_) * fVar257;
          auVar128._0_4_ = ((float)local_760._0_4_ + (float)local_760._0_4_) * fVar257;
          auVar128._8_4_ = (fStack_758 + fStack_758) * fVar257;
          auVar128._12_4_ = (fStack_754 + fStack_754) * fVar257;
          auVar128._16_4_ = (fStack_750 + fStack_750) * fVar257;
          auVar128._20_4_ = (fStack_74c + fStack_74c) * fVar257;
          auVar128._24_4_ = (fStack_748 + fStack_748) * fVar257;
          auVar128._28_4_ = fStack_744 + fStack_744;
          auVar24 = vcmpps_avx(local_300,auVar128,6);
          auVar25 = auVar216 & auVar24;
          if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar25 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar25 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar25 >> 0x7f,0) == '\0') &&
                (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar25 >> 0xbf,0) == '\0') &&
              (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar25[0x1f]) goto LAB_00adcdb0;
          local_320._0_4_ = (float)local_320._0_4_ + (float)local_320._0_4_ + -1.0;
          local_320._4_4_ = (float)local_320._4_4_ + (float)local_320._4_4_ + -1.0;
          uStack_318._0_4_ = (float)uStack_318 + (float)uStack_318 + -1.0;
          uStack_318._4_4_ = uStack_318._4_4_ + uStack_318._4_4_ + -1.0;
          uStack_310._0_4_ = (float)uStack_310 + (float)uStack_310 + -1.0;
          uStack_310._4_4_ = uStack_310._4_4_ + uStack_310._4_4_ + -1.0;
          uStack_308._0_4_ = (float)uStack_308 + (float)uStack_308 + -1.0;
          uStack_308._4_4_ = uStack_308._4_4_ + uStack_308._4_4_ + -1.0;
          local_240 = _local_420;
          auVar137 = _local_320;
          auVar25 = _local_320;
          local_220 = (float)local_320._0_4_;
          fStack_21c = (float)local_320._4_4_;
          fStack_218 = (float)uStack_318;
          fStack_214 = uStack_318._4_4_;
          fStack_210 = (float)uStack_310;
          fStack_20c = uStack_310._4_4_;
          fStack_208 = (float)uStack_308;
          fStack_204 = uStack_308._4_4_;
          local_200 = local_300;
          local_1dc = uVar146;
          local_1d0 = local_710;
          uStack_1c8 = uStack_708;
          local_1c0 = local_720;
          uStack_1b8 = uStack_718;
          local_1b0 = local_670;
          uStack_1a8 = uStack_668;
          local_1a0 = local_680;
          uStack_198 = uStack_678;
          auVar147 = (undefined1  [8])(context->scene->geometries).items[local_798].ptr;
          if ((((Geometry *)auVar147)->mask & (ray->super_RayK<1>).mask) != 0) {
            auVar216 = vandps_avx(auVar24,auVar216);
            local_460[0] = auVar216;
            auVar211._0_4_ = (float)(int)local_1e0;
            auVar211._4_12_ = auVar348;
            auVar269 = vshufps_avx(auVar211,auVar211,0);
            local_160[0] = (auVar269._0_4_ + (float)local_420._0_4_ + 0.0) * (float)local_2c0._0_4_;
            local_160[1] = (auVar269._4_4_ + (float)local_420._4_4_ + 1.0) * (float)local_2c0._4_4_;
            local_160[2] = (auVar269._8_4_ + fStack_418 + 2.0) * fStack_2b8;
            local_160[3] = (auVar269._12_4_ + fStack_414 + 3.0) * fStack_2b4;
            fStack_150 = (auVar269._0_4_ + fStack_410 + 4.0) * fStack_2b0;
            fStack_14c = (auVar269._4_4_ + fStack_40c + 5.0) * fStack_2ac;
            fStack_148 = (auVar269._8_4_ + fStack_408 + 6.0) * fStack_2a8;
            fStack_144 = auVar269._12_4_ + fStack_404 + 7.0;
            uStack_310 = auVar137._16_8_;
            uStack_308 = auVar25._24_8_;
            local_140 = local_320;
            uStack_138 = uStack_318;
            uStack_130 = uStack_310;
            uStack_128 = uStack_308;
            local_120 = local_300;
            auVar191._8_4_ = 0x7f800000;
            auVar191._0_8_ = 0x7f8000007f800000;
            auVar191._12_4_ = 0x7f800000;
            auVar191._16_4_ = 0x7f800000;
            auVar191._20_4_ = 0x7f800000;
            auVar191._24_4_ = 0x7f800000;
            auVar191._28_4_ = 0x7f800000;
            auVar24 = vblendvps_avx(auVar191,local_300,auVar216);
            auVar26 = vshufps_avx(auVar24,auVar24,0xb1);
            auVar26 = vminps_avx(auVar24,auVar26);
            auVar27 = vshufpd_avx(auVar26,auVar26,5);
            auVar26 = vminps_avx(auVar26,auVar27);
            auVar27 = vperm2f128_avx(auVar26,auVar26,1);
            auVar26 = vminps_avx(auVar26,auVar27);
            auVar24 = vcmpps_avx(auVar24,auVar26,0);
            auVar26 = auVar216 & auVar24;
            if ((((((((auVar26 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar26 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar26 >> 0x7f,0) != '\0') ||
                  (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar26 >> 0xbf,0) != '\0') ||
                (auVar26 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar26[0x1f] < '\0') {
              auVar216 = vandps_avx(auVar24,auVar216);
            }
            uVar139 = vmovmskps_avx(auVar216);
            uVar141 = 0;
            if (uVar139 != 0) {
              for (; (uVar139 >> uVar141 & 1) == 0; uVar141 = uVar141 + 1) {
              }
            }
            uVar143 = (ulong)uVar141;
            _local_320 = auVar25;
            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
               (((Geometry *)auVar147)->intersectionFilterN != (RTCFilterFunctionN)0x0)) {
              local_5a0._0_8_ = lVar142;
              _local_760 = ZEXT432((uint)(ray->super_RayK<1>).tfar);
              local_780 = auVar147;
              do {
                local_5c4 = local_160[uVar143];
                local_5c0 = *(undefined4 *)((long)&local_140 + uVar143 * 4);
                (ray->super_RayK<1>).tfar = *(float *)(local_120 + uVar143 * 4);
                local_6f0.context = context->user;
                fVar252 = 1.0 - local_5c4;
                fVar245 = local_5c4 * fVar252 * 4.0;
                auVar269 = ZEXT416((uint)(local_5c4 * local_5c4 * 0.5));
                auVar269 = vshufps_avx(auVar269,auVar269,0);
                auVar212 = ZEXT416((uint)((fVar252 * fVar252 + fVar245) * 0.5));
                auVar212 = vshufps_avx(auVar212,auVar212,0);
                auVar228 = ZEXT416((uint)((-local_5c4 * local_5c4 - fVar245) * 0.5));
                auVar228 = vshufps_avx(auVar228,auVar228,0);
                auVar232 = ZEXT416((uint)(fVar252 * -fVar252 * 0.5));
                auVar232 = vshufps_avx(auVar232,auVar232,0);
                auVar214._0_4_ =
                     auVar232._0_4_ * (float)local_710._0_4_ +
                     auVar228._0_4_ * (float)local_720._0_4_ +
                     auVar269._0_4_ * (float)local_680._0_4_ +
                     auVar212._0_4_ * (float)local_670._0_4_;
                auVar214._4_4_ =
                     auVar232._4_4_ * (float)local_710._4_4_ +
                     auVar228._4_4_ * (float)local_720._4_4_ +
                     auVar269._4_4_ * (float)local_680._4_4_ +
                     auVar212._4_4_ * (float)local_670._4_4_;
                auVar214._8_4_ =
                     auVar232._8_4_ * (float)uStack_708 +
                     auVar228._8_4_ * (float)uStack_718 +
                     auVar269._8_4_ * (float)uStack_678 + auVar212._8_4_ * (float)uStack_668;
                auVar214._12_4_ =
                     auVar232._12_4_ * uStack_708._4_4_ +
                     auVar228._12_4_ * uStack_718._4_4_ +
                     auVar269._12_4_ * uStack_678._4_4_ + auVar212._12_4_ * uStack_668._4_4_;
                local_5d0 = vmovlps_avx(auVar214);
                local_5c8 = vextractps_avx(auVar214,2);
                local_5bc = (int)local_788;
                local_5b8 = (int)local_798;
                local_5b4 = (local_6f0.context)->instID[0];
                local_5b0 = (local_6f0.context)->instPrimID[0];
                local_7a4 = -1;
                local_6f0.valid = &local_7a4;
                local_6f0.geometryUserPtr = ((Geometry *)auVar147)->userPtr;
                local_6f0.ray = (RTCRayN *)ray;
                local_6f0.hit = (RTCHitN *)&local_5d0;
                local_6f0.N = 1;
                if (((Geometry *)auVar147)->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_00add258:
                  p_Var22 = context->args->filter;
                  if ((p_Var22 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT ||
                      (((((Geometry *)auVar147)->field_8).field_0x2 & 0x40) != 0)))) {
                    (*p_Var22)(&local_6f0);
                    ray = local_7a0;
                    auVar147 = local_780;
                    if (*local_6f0.valid == 0) goto LAB_00add2f5;
                  }
                  (((Vec3f *)((long)local_6f0.ray + 0x30))->field_0).components[0] =
                       *(float *)local_6f0.hit;
                  (((Vec3f *)((long)local_6f0.ray + 0x30))->field_0).field_0.y =
                       *(float *)(local_6f0.hit + 4);
                  (((Vec3f *)((long)local_6f0.ray + 0x30))->field_0).field_0.z =
                       *(float *)(local_6f0.hit + 8);
                  *(float *)((long)local_6f0.ray + 0x3c) = *(float *)(local_6f0.hit + 0xc);
                  *(float *)((long)local_6f0.ray + 0x40) = *(float *)(local_6f0.hit + 0x10);
                  *(float *)((long)local_6f0.ray + 0x44) = *(float *)(local_6f0.hit + 0x14);
                  *(float *)((long)local_6f0.ray + 0x48) = *(float *)(local_6f0.hit + 0x18);
                  *(float *)((long)local_6f0.ray + 0x4c) = *(float *)(local_6f0.hit + 0x1c);
                  *(float *)((long)local_6f0.ray + 0x50) = *(float *)(local_6f0.hit + 0x20);
                }
                else {
                  (*((Geometry *)auVar147)->intersectionFilterN)(&local_6f0);
                  ray = local_7a0;
                  auVar147 = local_780;
                  if (*local_6f0.valid != 0) goto LAB_00add258;
LAB_00add2f5:
                  (local_7a0->super_RayK<1>).tfar = (float)local_760._0_4_;
                  ray = local_7a0;
                  auVar147 = local_780;
                }
                *(undefined4 *)(local_460[0] + uVar143 * 4) = 0;
                auVar25 = local_460[0];
                fVar245 = (ray->super_RayK<1>).tfar;
                auVar167._4_4_ = fVar245;
                auVar167._0_4_ = fVar245;
                auVar167._8_4_ = fVar245;
                auVar167._12_4_ = fVar245;
                auVar167._16_4_ = fVar245;
                auVar167._20_4_ = fVar245;
                auVar167._24_4_ = fVar245;
                auVar167._28_4_ = fVar245;
                auVar24 = vcmpps_avx(local_300,auVar167,2);
                auVar216 = vandps_avx(auVar24,local_460[0]);
                local_460[0] = auVar216;
                auVar25 = auVar25 & auVar24;
                if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar25 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar25 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar25 >> 0x7f,0) == '\0') &&
                      (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar25 >> 0xbf,0) == '\0') &&
                    (auVar25 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar25[0x1f]) goto LAB_00add38f;
                auVar192._8_4_ = 0x7f800000;
                auVar192._0_8_ = 0x7f8000007f800000;
                auVar192._12_4_ = 0x7f800000;
                auVar192._16_4_ = 0x7f800000;
                auVar192._20_4_ = 0x7f800000;
                auVar192._24_4_ = 0x7f800000;
                auVar192._28_4_ = 0x7f800000;
                auVar24 = vblendvps_avx(auVar192,local_300,auVar216);
                auVar25 = vshufps_avx(auVar24,auVar24,0xb1);
                auVar25 = vminps_avx(auVar24,auVar25);
                auVar26 = vshufpd_avx(auVar25,auVar25,5);
                auVar25 = vminps_avx(auVar25,auVar26);
                auVar26 = vperm2f128_avx(auVar25,auVar25,1);
                auVar25 = vminps_avx(auVar25,auVar26);
                auVar24 = vcmpps_avx(auVar24,auVar25,0);
                auVar25 = auVar216 & auVar24;
                if ((((((((auVar25 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar25 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar25 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar25 >> 0x7f,0) != '\0') ||
                      (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar25 >> 0xbf,0) != '\0') ||
                    (auVar25 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar25[0x1f] < '\0') {
                  auVar216 = vandps_avx(auVar24,auVar216);
                }
                _local_760 = *(undefined1 (*) [32])&(ray->super_RayK<1>).tfar;
                uVar139 = vmovmskps_avx(auVar216);
                uVar141 = 0;
                if (uVar139 != 0) {
                  for (; (uVar139 >> uVar141 & 1) == 0; uVar141 = uVar141 + 1) {
                  }
                }
                uVar143 = (ulong)uVar141;
              } while( true );
            }
            fVar245 = local_160[uVar143];
            fVar252 = *(float *)((long)&local_140 + uVar143 * 4);
            fVar255 = 1.0 - fVar245;
            fVar253 = fVar245 * fVar255 * 4.0;
            auVar269 = ZEXT416((uint)(fVar245 * fVar245 * 0.5));
            auVar269 = vshufps_avx(auVar269,auVar269,0);
            auVar212 = ZEXT416((uint)((fVar255 * fVar255 + fVar253) * 0.5));
            auVar212 = vshufps_avx(auVar212,auVar212,0);
            auVar228 = ZEXT416((uint)((-fVar245 * fVar245 - fVar253) * 0.5));
            auVar228 = vshufps_avx(auVar228,auVar228,0);
            auVar232 = ZEXT416((uint)(fVar255 * -fVar255 * 0.5));
            auVar232 = vshufps_avx(auVar232,auVar232,0);
            auVar213._0_4_ =
                 auVar232._0_4_ * (float)local_710._0_4_ +
                 auVar228._0_4_ * (float)local_720._0_4_ +
                 auVar269._0_4_ * (float)local_680._0_4_ + auVar212._0_4_ * (float)local_670._0_4_;
            auVar213._4_4_ =
                 auVar232._4_4_ * (float)local_710._4_4_ +
                 auVar228._4_4_ * (float)local_720._4_4_ +
                 auVar269._4_4_ * (float)local_680._4_4_ + auVar212._4_4_ * (float)local_670._4_4_;
            auVar213._8_4_ =
                 auVar232._8_4_ * (float)uStack_708 +
                 auVar228._8_4_ * (float)uStack_718 +
                 auVar269._8_4_ * (float)uStack_678 + auVar212._8_4_ * (float)uStack_668;
            auVar213._12_4_ =
                 auVar232._12_4_ * uStack_708._4_4_ +
                 auVar228._12_4_ * uStack_718._4_4_ +
                 auVar269._12_4_ * uStack_678._4_4_ + auVar212._12_4_ * uStack_668._4_4_;
            (ray->super_RayK<1>).tfar = *(float *)(local_120 + uVar143 * 4);
            uVar9 = vmovlps_avx(auVar213);
            *(undefined8 *)&(ray->Ng).field_0 = uVar9;
            fVar253 = (float)vextractps_avx(auVar213,2);
            (ray->Ng).field_0.field_0.z = fVar253;
            ray->u = fVar245;
            ray->v = fVar252;
            ray->primID = (uint)local_788;
            ray->geomID = (uint)local_798;
            ray->instID[0] = context->user->instID[0];
            ray->instPrimID[0] = context->user->instPrimID[0];
            goto LAB_00add05b;
          }
          goto LAB_00add075;
        }
        auVar318 = ZEXT3264(local_6c0);
        auVar335 = ZEXT3264(local_660);
        auVar305 = ZEXT3264(_local_620);
        auVar273 = ZEXT3264(auVar273._0_32_);
        goto LAB_00adcdb9;
      }
    }
    fVar245 = (ray->super_RayK<1>).tfar;
    auVar163._4_4_ = fVar245;
    auVar163._0_4_ = fVar245;
    auVar163._8_4_ = fVar245;
    auVar163._12_4_ = fVar245;
    auVar163._16_4_ = fVar245;
    auVar163._20_4_ = fVar245;
    auVar163._24_4_ = fVar245;
    auVar163._28_4_ = fVar245;
    auVar216 = vcmpps_avx(local_80,auVar163,2);
    uVar141 = vmovmskps_avx(auVar216);
    uVar140 = (ulong)((uint)uVar140 & (uint)uVar140 + 0xff & uVar141);
  } while( true );
LAB_00add38f:
  auVar318 = ZEXT3264(local_6c0);
  auVar335 = ZEXT3264(local_660);
  auVar305 = ZEXT3264(_local_620);
  lVar142 = local_5a0._0_8_;
  fVar179 = (float)local_640._0_4_;
  fVar195 = (float)local_640._4_4_;
  fVar197 = fStack_638;
  fVar264 = fStack_634;
  fVar238 = fStack_630;
  fVar240 = fStack_62c;
  fVar242 = fStack_628;
  fVar229 = (float)local_740._0_4_;
  fVar239 = (float)local_740._4_4_;
  fVar241 = fStack_738;
  fVar243 = fStack_734;
  fVar265 = fStack_730;
  fVar274 = fStack_72c;
  fVar276 = fStack_728;
LAB_00add05b:
  prim = local_700;
LAB_00add075:
  auVar273 = ZEXT3264(_local_600);
  fVar178 = (float)local_6a0._0_4_;
  fVar194 = (float)local_6a0._4_4_;
  fVar196 = fStack_698;
  fVar198 = fStack_694;
  fVar245 = fStack_690;
  fVar252 = fStack_68c;
  fVar253 = fStack_688;
  fVar255 = fStack_684;
LAB_00adcdb9:
  lVar148 = lVar148 + 8;
  fVar351 = (float)local_480._0_4_;
  fVar357 = (float)local_480._4_4_;
  fVar358 = fStack_478;
  fVar151 = fStack_474;
  fVar257 = fStack_470;
  fVar259 = fStack_46c;
  fVar261 = fStack_468;
  fVar244 = fStack_464;
  goto LAB_00adc4a3;
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time());

          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }